

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_edge_state.cpp
# Opt level: O3

void EBMOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,
               Array4<const_amrex::EBCellFlag> *flag,bool is_velocity)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  BCRec *bcrec;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  pair<bool,_bool> pVar72;
  pair<bool,_bool> pVar73;
  int kk_1;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  long lVar84;
  long lVar85;
  BCRec **ppBVar86;
  Dim3 *pDVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  uint uVar100;
  int iVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  bool bVar114;
  uint uVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  char cVar122;
  int jj;
  int iVar123;
  int iVar124;
  long lVar125;
  long lVar126;
  int kk;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  ulong uVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  char cVar139;
  long lVar140;
  int iVar141;
  uint uVar142;
  uint uVar143;
  long lVar144;
  long lVar145;
  long lVar146;
  int iVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  int iVar152;
  long lVar153;
  int kk_23;
  long lVar154;
  long lVar155;
  int iVar156;
  long lVar157;
  long lVar158;
  int iVar159;
  long lVar160;
  int iVar161;
  int iVar162;
  long lVar163;
  int kk_12;
  int iVar164;
  int iVar165;
  long lVar166;
  long lVar167;
  bool bVar168;
  ulong uVar169;
  Real delta_z_1;
  double dVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  ulong uVar170;
  double dVar171;
  double dVar172;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  double dVar180;
  undefined1 auVar181 [16];
  double dVar182;
  double dVar183;
  double dVar184;
  ulong uVar185;
  double dVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  double dVar194;
  double dVar195;
  double dVar196;
  undefined1 auVar197 [16];
  double dVar198;
  double dVar199;
  undefined4 uVar200;
  undefined4 uVar201;
  double dVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  double dVar206;
  undefined1 auVar207 [16];
  double dVar209;
  undefined1 auVar208 [16];
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  double dVar223;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  double dVar215;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  Real delta_y;
  Real delta_z;
  Real delta_x_1;
  int domain_ilo;
  Real yf;
  Real zf;
  Real delta_y_2;
  Real xf;
  Real delta_y_1;
  Real delta_x;
  Real A [27] [3];
  Real du [27];
  long local_9e8;
  long local_9b8;
  int local_990;
  int local_98c;
  int local_988;
  uint local_984;
  int local_974;
  int local_954;
  long local_950;
  uint local_944;
  int local_940;
  long local_918;
  long local_900;
  double *local_8f8;
  uint local_8e8;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  int local_8cc;
  long local_8a8;
  int local_888;
  int local_880;
  int local_87c;
  double *local_808;
  ulong local_800;
  ulong local_7f8;
  ulong local_7f0;
  double *local_790;
  long local_718;
  long local_700;
  long local_698;
  long local_690;
  long local_688;
  long local_648;
  long local_640;
  long local_588;
  double *local_580;
  double *local_578;
  EBCellFlag *local_4c8;
  double *local_4c0;
  long local_4b0;
  long local_4a8;
  long local_3d8;
  anon_class_624_13_64a6b87d local_398;
  double adStack_108 [27];
  
  iVar6 = (bx->smallend).vect[0];
  iVar7 = (bx->smallend).vect[1];
  iVar8 = (bx->smallend).vect[2];
  iVar9 = (bx->bigend).vect[0];
  iVar10 = (bx->bigend).vect[1];
  uVar143 = (bx->btype).itype;
  iVar141 = iVar10 + (uint)((uVar143 & 2) == 0);
  iVar128 = (bx->bigend).vect[2];
  iVar96 = iVar128 + (uint)((uVar143 & 4) == 0);
  bcrec = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar123 = (~uVar143 & 1) + iVar9;
  iVar127 = (domain->smallend).vect[0];
  iVar156 = (domain->smallend).vect[2];
  iVar161 = (domain->bigend).vect[0];
  iVar165 = (domain->bigend).vect[2];
  pVar72 = anon_unknown.dwarf_6cd93f::has_extdir_or_ho(bcrec,ncomp,0);
  pVar73 = anon_unknown.dwarf_6cd93f::has_extdir_or_ho(bcrec,ncomp,2);
  iVar74 = iVar6 + -1;
  if ((iVar127 < iVar74 || (~pVar72.first & 1U) != 0) &&
     (((ushort)pVar72 >> 8 & 1) == 0 || iVar123 < iVar161)) {
    pVar72 = anon_unknown.dwarf_6cd93f::has_extdir_or_ho(bcrec,ncomp,1);
    if (((domain->smallend).vect[1] < iVar7 + -1 || (~pVar72.first & 1U) != 0) &&
       (((((ushort)pVar72 >> 8 & 1) == 0 || iVar141 < (domain->bigend).vect[1] &&
         (iVar156 < iVar8 + -1 || (~pVar73.first & 1U) != 0)) &&
        (((ushort)pVar73 >> 8 & 1) == 0 || iVar96 < iVar165)))) {
      local_8a8 = ccc->jstride;
      lVar104 = ccc->kstride;
      lVar126 = ccc->nstride;
      local_954 = (ccc->begin).x;
      local_974 = (ccc->begin).y;
      local_940 = (ccc->begin).z;
      local_578 = fcx->p;
      local_640 = fcx->jstride;
      local_688 = fcx->kstride;
      local_918 = fcx->nstride;
      local_990 = (fcx->begin).x;
      local_87c = (fcx->begin).y;
      local_8dc = (fcx->begin).z;
      local_580 = fcy->p;
      local_700 = fcy->jstride;
      local_690 = fcy->kstride;
      local_900 = fcy->nstride;
      local_988 = (fcy->begin).x;
      local_8d4 = (fcy->begin).y;
      local_888 = (fcy->begin).z;
      local_4c0 = fcz->p;
      local_4a8 = fcz->jstride;
      local_718 = fcz->kstride;
      local_950 = fcz->nstride;
      local_98c = (fcz->begin).x;
      local_880 = (fcz->begin).y;
      local_8e0 = (fcz->begin).z;
      local_4c8 = flag->p;
      local_648 = flag->jstride;
      local_698 = flag->kstride;
      local_8cc = (flag->begin).x;
      local_8d8 = (flag->begin).y;
      local_8e4 = (flag->begin).z;
      local_808 = vfrac->p;
      local_4b0 = vfrac->jstride;
      local_588 = vfrac->kstride;
      local_984 = (vfrac->begin).x;
      uVar143 = (vfrac->begin).y;
      local_944 = (vfrac->begin).z;
      uVar132 = (ulong)(uint)ncomp;
      if (0 < ncomp) {
        pdVar14 = ccc->p;
        lVar84 = (long)local_954;
        pdVar15 = umac->p;
        lVar16 = umac->jstride;
        lVar17 = umac->kstride;
        iVar156 = (umac->begin).x;
        iVar165 = (umac->begin).y;
        iVar11 = (umac->begin).z;
        pdVar18 = xedge->p;
        lVar19 = xedge->jstride;
        lVar20 = xedge->kstride;
        lVar21 = xedge->nstride;
        iVar147 = (xedge->begin).x;
        iVar162 = (xedge->begin).y;
        iVar75 = (xedge->begin).z;
        iVar161 = iVar161 + 1;
        uVar12 = (q->begin).x;
        pdVar22 = q->p;
        lVar85 = q->jstride;
        lVar103 = q->kstride;
        lVar88 = q->nstride;
        iVar78 = (q->begin).y;
        iVar79 = (q->begin).z;
        lVar4 = lVar104 * 8;
        lVar5 = local_8a8 * 8;
        local_7f0 = 0;
        do {
          if (iVar8 <= iVar128) {
            lVar102 = lVar88 * local_7f0;
            iVar80 = iVar8;
            do {
              if (iVar7 <= iVar10) {
                lVar105 = (iVar80 - local_8e4) * local_698;
                lVar133 = (iVar80 - local_8dc) * local_688;
                lVar134 = (iVar80 - local_940) * lVar104;
                iVar131 = iVar80 - iVar79;
                lVar94 = iVar131 * lVar103;
                lVar109 = local_588 * (int)(iVar80 - local_944);
                lVar106 = (int)((iVar80 + -1) - local_944) * local_588;
                lVar91 = (int)((iVar80 + 1) - local_944) * local_588;
                lVar136 = ((iVar80 + -1) - iVar79) * lVar103;
                lVar107 = ((iVar80 + 1) - iVar79) * lVar103;
                lVar137 = (iVar80 - local_888) * local_690;
                lVar92 = ((iVar80 - local_8e0) + 1) * local_718;
                lVar89 = (iVar80 - local_8e0) * local_718;
                lVar108 = (int)(~local_944 + iVar80) * local_588;
                lVar116 = (int)((iVar80 - local_944) + 1) * local_588;
                lVar135 = (long)iVar80;
                lVar90 = (lVar135 - iVar11) * lVar17;
                lVar93 = (~(long)local_940 + lVar135) * lVar4;
                iVar97 = iVar7;
                do {
                  if (iVar6 <= iVar123) {
                    lVar110 = (iVar97 - local_8d8) * local_648;
                    lVar111 = (iVar97 - local_87c) * local_640;
                    lVar117 = (iVar97 - local_974) * local_8a8;
                    iVar77 = iVar97 - iVar78;
                    lVar118 = iVar77 * lVar85;
                    lVar144 = local_4b0 * (int)(iVar97 - uVar143);
                    lVar146 = (int)((iVar97 + -1) - uVar143) * local_4b0;
                    lVar167 = (int)((iVar97 + 1) - uVar143) * local_4b0;
                    lVar150 = ((iVar97 + -1) - iVar78) * lVar85;
                    lVar153 = ((iVar97 + 1) - iVar78) * lVar85;
                    lVar112 = ((iVar97 - local_8d4) + 1) * local_700;
                    lVar154 = (iVar97 - local_8d4) * local_700;
                    lVar95 = (iVar97 - local_880) * local_4a8;
                    lVar151 = (int)(~uVar143 + iVar97) * local_4b0;
                    lVar138 = (int)((iVar97 - uVar143) + 1) * local_4b0;
                    lVar140 = (long)iVar97;
                    lVar163 = (lVar140 - iVar165) * lVar16;
                    lVar113 = (~(long)local_974 + lVar140) * lVar5;
                    iVar98 = (iVar6 - uVar12) + -2;
                    iVar76 = iVar74 - local_954;
                    iVar81 = iVar74 - uVar12;
                    iVar152 = iVar74;
                    iVar82 = iVar6;
                    do {
                      uVar13 = local_4c8[lVar105 + lVar110 + (iVar82 - local_8cc)].flag;
                      dVar173 = 0.0;
                      if ((uVar13 >> 0x11 & 1) != 0) {
                        lVar155 = (long)iVar152;
                        lVar119 = (long)pdVar14 + lVar155 * 8 + lVar113 + lVar93 + lVar84 * -8 + -8;
                        lVar120 = (long)pdVar14 +
                                  lVar155 * 8 + lVar113 + lVar93 + lVar126 * 8 + lVar84 * -8 + -8;
                        lVar155 = (long)pdVar14 +
                                  lVar155 * 8 + lVar113 + lVar93 + lVar126 * 0x10 + lVar84 * -8 + -8
                        ;
                        pdVar2 = local_578 + lVar133 + lVar111 + (iVar82 - local_990);
                        dVar173 = *pdVar2;
                        dVar171 = pdVar2[local_918];
                        pdVar3 = pdVar14 + lVar134 + lVar117 + (iVar82 - local_954);
                        dVar202 = *pdVar3;
                        dVar186 = pdVar3[lVar126];
                        dVar182 = pdVar3[lVar126 * 2];
                        lVar158 = (long)(int)(iVar82 - uVar12);
                        iVar101 = iVar82 + -1;
                        lVar145 = (long)(int)(iVar101 - uVar12);
                        dVar196 = (pdVar22 + lVar118 + lVar158 + lVar94)[lVar102];
                        dVar216 = pdVar22[lVar118 + lVar145 + lVar94 + lVar102];
                        lVar166 = -1;
                        cVar139 = '\x05';
                        lVar121 = 0;
                        do {
                          iVar99 = (int)lVar166;
                          lVar148 = -1;
                          cVar122 = cVar139;
                          do {
                            iVar83 = (int)lVar148;
                            iVar124 = (int)lVar121;
                            ppBVar86 = &local_398.d_bcrec_ptr + (long)iVar124 * 3;
                            lVar121 = 0;
                            do {
                              iVar130 = (int)lVar121 + -1;
                              if (((iVar83 == 0 && iVar99 == 0) && iVar130 == 0) ||
                                 ((1 << (cVar122 + (char)lVar121 & 0x1fU) & uVar13) == 0)) {
                                *ppBVar86 = (BCRec *)0x0;
                                ((Array4<const_double> *)(ppBVar86 + 1))->p = (double *)0x0;
                                ppBVar86[2] = (BCRec *)0x0;
                              }
                              else {
                                pdVar3 = pdVar14 + ((iVar80 - local_940) + iVar99) * lVar104 +
                                                   ((iVar97 - local_974) + iVar83) * local_8a8 +
                                                   (long)(iVar76 + (int)lVar121);
                                dVar172 = pdVar3[lVar126];
                                *ppBVar86 = (BCRec *)((*pdVar3 + (double)iVar130) - dVar202);
                                ((Array4<const_double> *)(ppBVar86 + 1))->p =
                                     (double *)((dVar172 + (double)iVar83) - dVar186);
                                ppBVar86[2] = (BCRec *)((pdVar3[lVar126 * 2] + (double)iVar99) -
                                                       dVar182);
                              }
                              lVar121 = lVar121 + 1;
                              ppBVar86 = ppBVar86 + 3;
                            } while (lVar121 != 3);
                            lVar148 = lVar148 + 1;
                            cVar122 = cVar122 + '\x03';
                            lVar121 = (long)iVar124 + 3;
                          } while (lVar148 != 2);
                          lVar166 = lVar166 + 1;
                          cVar139 = cVar139 + '\t';
                          lVar121 = (long)iVar124 + 3;
                        } while (lVar166 != 2);
                        dVar172 = dVar173 - dVar186;
                        lVar166 = -1;
                        cVar139 = '\x05';
                        lVar121 = 0;
                        do {
                          lVar148 = -1;
                          cVar122 = cVar139;
                          do {
                            iVar99 = (int)lVar121;
                            lVar121 = 0;
                            do {
                              dVar183 = 0.0;
                              if (((int)lVar121 != 1 || ((int)lVar148 != 0 || (int)lVar166 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar121 & 0x1fU) & uVar13) != 0)) {
                                dVar183 = pdVar22[lVar102 + (iVar131 + (int)lVar166) * lVar103 +
                                                            (iVar77 + (int)lVar148) * lVar85 +
                                                            (long)(iVar81 + (int)lVar121)] - dVar196
                                ;
                              }
                              adStack_108[iVar99 + lVar121] = dVar183;
                              lVar121 = lVar121 + 1;
                            } while (lVar121 != 3);
                            lVar148 = lVar148 + 1;
                            cVar122 = cVar122 + '\x03';
                            lVar121 = (long)iVar99 + 3;
                          } while (lVar148 != 2);
                          lVar166 = lVar166 + 1;
                          cVar139 = cVar139 + '\t';
                          lVar121 = (long)iVar99 + 3;
                        } while (lVar166 != 2);
                        dVar183 = dVar216;
                        if (dVar216 <= dVar196) {
                          dVar183 = dVar196;
                        }
                        dVar209 = 0.0;
                        dVar210 = 0.0;
                        dVar206 = 0.0;
                        pDVar87 = (Dim3 *)&local_398.q.jstride;
                        lVar166 = 0;
                        dVar223 = 0.0;
                        dVar180 = 0.0;
                        dVar211 = 0.0;
                        dVar214 = 0.0;
                        dVar195 = 0.0;
                        dVar198 = 0.0;
                        do {
                          dVar212 = *(double *)((long)(pDVar87 + -2) + 8);
                          dVar194 = *(double *)((long)(pDVar87 + -1) + 4);
                          dVar184 = *(double *)pDVar87;
                          dVar199 = adStack_108[lVar166];
                          dVar195 = dVar195 + dVar194 * *(double *)((long)(pDVar87 + -1) + 4);
                          dVar198 = dVar198 + dVar212 * *(double *)pDVar87;
                          dVar206 = dVar206 + dVar184 * dVar184;
                          dVar211 = dVar211 + dVar199 * dVar212;
                          dVar214 = dVar214 + dVar212 * dVar212;
                          dVar209 = dVar209 + dVar199 * dVar194;
                          dVar210 = dVar210 + dVar194 * dVar212;
                          dVar223 = dVar223 + dVar184 * *(double *)((long)(pDVar87 + -1) + 4);
                          dVar180 = dVar180 + dVar199 * *(double *)pDVar87;
                          lVar166 = lVar166 + 1;
                          pDVar87 = pDVar87 + 2;
                        } while (lVar166 != 0x1b);
                        dVar184 = dVar210 * dVar206 - dVar198 * dVar223;
                        dVar194 = dVar210 * dVar180 - dVar198 * dVar209;
                        dVar212 = dVar210 * dVar223 + dVar198 * -dVar195;
                        dVar199 = dVar206 * dVar195 - dVar223 * dVar223;
                        dVar206 = dVar206 * dVar209 - dVar223 * dVar180;
                        auVar178._0_8_ =
                             dVar198 * (dVar209 * dVar223 - dVar180 * dVar195) +
                             (dVar211 * dVar199 - dVar206 * dVar210);
                        auVar178._8_8_ = dVar198 * dVar194 + (dVar214 * dVar206 - dVar184 * dVar211)
                        ;
                        dVar184 = dVar212 * dVar198 + (dVar199 * dVar214 - dVar184 * dVar210);
                        auVar181._8_8_ = dVar184;
                        auVar181._0_8_ = dVar184;
                        auVar178 = divpd(auVar178,auVar181);
                        dVar184 = (dVar212 * dVar211 +
                                  ((dVar180 * dVar195 + -dVar209 * dVar223) * dVar214 -
                                  dVar194 * dVar210)) / dVar184;
                        iVar99 = iVar82 - local_984;
                        lVar166 = (long)iVar99;
                        dVar195 = local_808[lVar144 + lVar109 + lVar166];
                        dVar198 = auVar178._0_8_;
                        dVar206 = auVar178._8_8_;
                        if ((dVar195 == 1.0) && (!NAN(dVar195))) {
                          if ((local_808[lVar144 + lVar109 + (int)(iVar101 - local_984)] == 1.0) &&
                             (!NAN(local_808[lVar144 + lVar109 + (int)(iVar101 - local_984)]))) {
                            if ((local_808[lVar144 + lVar109 + (int)((iVar82 + 1) - local_984)] ==
                                 1.0) && (!NAN(local_808[lVar144 + lVar109 + (int)((iVar82 + 1) -
                                                                                  local_984)]))) {
                              dVar214 = pdVar22[lVar118 + lVar94 + lVar102 + (int)((iVar82 + 1) -
                                                                                  uVar12)] - dVar196
                              ;
                              dVar211 = (dVar196 - dVar216) + (dVar196 - dVar216);
                              dVar214 = dVar214 + dVar214;
                              dVar209 = (pdVar22[lVar118 + lVar94 + lVar102 + (int)((iVar82 + 1) -
                                                                                   uVar12)] -
                                        dVar216) * 0.5;
                              dVar198 = ABS(dVar211);
                              uVar169 = -(ulong)(0.0 < dVar209);
                              dVar209 = ABS(dVar209);
                              dVar210 = ABS(dVar214);
                              if (dVar198 <= dVar209) {
                                dVar209 = dVar198;
                              }
                              if (dVar209 <= dVar210) {
                                dVar210 = dVar209;
                              }
                              uVar185 = -(ulong)(0.0 < dVar211 * dVar214) & (ulong)dVar210;
                              dVar198 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                                uVar169 & uVar185);
                            }
                          }
                          if ((((local_808[lVar109 + lVar146 + lVar166] == 1.0) &&
                               (!NAN(local_808[lVar109 + lVar146 + lVar166]))) &&
                              (local_808[lVar109 + lVar167 + lVar166] == 1.0)) &&
                             (!NAN(local_808[lVar109 + lVar167 + lVar166]))) {
                            dVar211 = dVar196 - pdVar22[lVar102 + lVar94 + lVar150 + lVar158];
                            dVar214 = pdVar22[lVar102 + lVar94 + lVar153 + lVar158] - dVar196;
                            dVar211 = dVar211 + dVar211;
                            dVar214 = dVar214 + dVar214;
                            dVar210 = (pdVar22[lVar102 + lVar94 + lVar153 + lVar158] -
                                      pdVar22[lVar102 + lVar94 + lVar150 + lVar158]) * 0.5;
                            dVar206 = ABS(dVar211);
                            uVar169 = -(ulong)(0.0 < dVar210);
                            dVar210 = ABS(dVar210);
                            dVar209 = ABS(dVar214);
                            if (dVar206 <= dVar210) {
                              dVar210 = dVar206;
                            }
                            if (dVar210 <= dVar209) {
                              dVar209 = dVar210;
                            }
                            uVar185 = -(ulong)(0.0 < dVar211 * dVar214) & (ulong)dVar209;
                            dVar206 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                          if (((local_808[lVar144 + lVar166 + lVar106] == 1.0) &&
                              (!NAN(local_808[lVar144 + lVar166 + lVar106]))) &&
                             ((local_808[lVar144 + lVar166 + lVar91] == 1.0 &&
                              (!NAN(local_808[lVar144 + lVar166 + lVar91]))))) {
                            dVar214 = dVar196 - pdVar22[lVar118 + lVar158 + lVar136 + lVar102];
                            dVar223 = pdVar22[lVar118 + lVar158 + lVar107 + lVar102] - dVar196;
                            dVar214 = dVar214 + dVar214;
                            dVar223 = dVar223 + dVar223;
                            dVar210 = (pdVar22[lVar118 + lVar158 + lVar107 + lVar102] -
                                      pdVar22[lVar118 + lVar158 + lVar136 + lVar102]) * 0.5;
                            dVar211 = ABS(dVar214);
                            uVar169 = -(ulong)(0.0 < dVar210);
                            dVar210 = ABS(dVar210);
                            dVar209 = ABS(dVar223);
                            if (dVar211 <= dVar210) {
                              dVar210 = dVar211;
                            }
                            if (dVar210 <= dVar209) {
                              dVar209 = dVar210;
                            }
                            uVar185 = -(ulong)(0.0 < dVar214 * dVar223) & (ulong)dVar209;
                            dVar184 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                        }
                        dVar210 = dVar171 - dVar182;
                        dVar209 = dVar216;
                        if (dVar196 <= dVar216) {
                          dVar209 = dVar196;
                        }
                        iVar124 = 0;
                        iVar130 = 0;
                        iVar159 = 0;
                        iVar83 = 0;
                        uVar142 = 0xffffffff;
                        do {
                          uVar100 = uVar142 + 1;
                          uVar115 = 0xffffffff;
                          iVar129 = iVar124;
                          do {
                            uVar1 = uVar115 + 1;
                            iVar164 = 5;
                            do {
                              if (((uVar13 >> (iVar129 + iVar164 & 0x1fU) & 1) != 0) &&
                                 ((iVar164 != 6 || uVar115 != 0) || uVar142 != 0)) {
                                iVar130 = iVar130 + (uint)((iVar164 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar115 == 0 && uVar142 == 0));
                                iVar159 = iVar159 + (uint)((iVar164 == 6 && uVar142 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar83 = iVar83 + (uint)((iVar164 == 6 && uVar115 == 0) &&
                                                        (uVar100 & 0xfffffffd) == 0);
                              }
                              iVar164 = iVar164 + 1;
                            } while (iVar164 != 8);
                            iVar129 = iVar129 + 3;
                            uVar115 = uVar1;
                          } while (uVar1 != 2);
                          iVar124 = iVar124 + 9;
                          uVar142 = uVar100;
                        } while (uVar100 != 2);
                        dVar211 = 2.0;
                        if ((uVar13 >> 0x15 & 1) != 0) {
                          lVar121 = -1;
                          cVar139 = '\b';
                          dVar214 = dVar196;
                          dVar211 = dVar196;
                          do {
                            iVar124 = 0;
                            bVar168 = true;
                            do {
                              bVar114 = bVar168;
                              lVar148 = 0;
                              do {
                                if (((int)lVar148 != 1 || (iVar124 != 0 || (int)lVar121 != 0)) &&
                                   ((1 << ((char)iVar124 * '\x03' + cVar139 + (char)lVar148 & 0x1fU)
                                    & uVar13) != 0)) {
                                  dVar223 = pdVar22[lVar102 + (iVar131 + (int)lVar121) * lVar103 +
                                                              (iVar77 + iVar124) * lVar85 +
                                                              (long)(iVar81 + (int)lVar148)];
                                  dVar180 = dVar223;
                                  if (dVar223 <= dVar211) {
                                    dVar180 = dVar211;
                                  }
                                  dVar211 = dVar180;
                                  if (dVar223 < dVar214) {
                                    dVar214 = dVar223;
                                  }
                                }
                                lVar148 = lVar148 + 1;
                              } while (lVar148 != 3);
                              iVar124 = 1;
                              bVar168 = false;
                            } while (bVar114);
                            lVar121 = lVar121 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar121 != 2);
                          dVar223 = (((local_580 + lVar137 + lVar112 + (iVar82 - local_988))
                                      [local_900] - dVar182) * dVar184 +
                                    (0.5 - dVar186) * dVar206 +
                                    (local_580[lVar137 + lVar112 + (iVar82 - local_988)] - dVar202)
                                    * dVar198 + dVar196) - dVar196;
                          if (dVar223 <= 1e-13) {
                            dVar211 = 1.0;
                            if ((dVar223 < -1e-13) &&
                               (dVar211 = (dVar214 - dVar196) / dVar223, 1.0 <= dVar211)) {
                              dVar211 = 1.0;
                            }
                          }
                          else {
                            dVar211 = (dVar211 - dVar196) / dVar223;
                            if (1.0 <= dVar211) {
                              dVar211 = 1.0;
                            }
                          }
                          if (2.0 <= dVar211) {
                            dVar211 = 2.0;
                          }
                        }
                        dVar214 = dVar211;
                        if ((short)uVar13 < 0) {
                          lVar121 = -1;
                          cVar139 = '\x05';
                          uVar200 = SUB84(dVar196,0);
                          uVar201 = (undefined4)((ulong)dVar196 >> 0x20);
                          dVar214 = dVar196;
                          do {
                            lVar148 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar157 = 0;
                              do {
                                if (((int)lVar157 != 1 || ((int)lVar148 != 0 || (int)lVar121 != 0))
                                   && ((1 << (cVar122 + (char)lVar157 & 0x1fU) & uVar13) != 0)) {
                                  dVar223 = pdVar22[lVar102 + (iVar131 + (int)lVar121) * lVar103 +
                                                              (iVar77 + (int)lVar148) * lVar85 +
                                                              (long)(iVar81 + (int)lVar157)];
                                  dVar180 = dVar223;
                                  if (dVar223 <= dVar214) {
                                    dVar180 = dVar214;
                                  }
                                  dVar214 = dVar180;
                                  if (dVar223 <= (double)CONCAT44(uVar201,uVar200) &&
                                      (double)CONCAT44(uVar201,uVar200) != dVar223) {
                                    uVar200 = SUB84(dVar223,0);
                                    uVar201 = (undefined4)((ulong)dVar223 >> 0x20);
                                  }
                                }
                                lVar157 = lVar157 + 1;
                              } while (lVar157 != 3);
                              cVar122 = cVar122 + '\x03';
                              bVar168 = lVar148 != 0;
                              lVar148 = lVar148 + 1;
                            } while (bVar168);
                            lVar121 = lVar121 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar121 != 2);
                          dVar223 = (((local_580 + lVar137 + lVar154 + (iVar82 - local_988))
                                      [local_900] - dVar182) * dVar184 +
                                    -(dVar186 + 0.5) * dVar206 +
                                    (local_580[lVar137 + lVar154 + (iVar82 - local_988)] - dVar202)
                                    * dVar198 + dVar196) - dVar196;
                          if (dVar223 <= 1e-13) {
                            dVar214 = 1.0;
                            if ((dVar223 < -1e-13) &&
                               (dVar214 = ((double)CONCAT44(uVar201,uVar200) - dVar196) / dVar223,
                               1.0 <= dVar214)) {
                              dVar214 = 1.0;
                            }
                          }
                          else {
                            dVar214 = (dVar214 - dVar196) / dVar223;
                            if (1.0 <= dVar214) {
                              dVar214 = 1.0;
                            }
                          }
                          if (dVar211 <= dVar214) {
                            dVar214 = dVar211;
                          }
                        }
                        dVar211 = dVar214;
                        if ((uVar13 >> 0x13 & 1) != 0) {
                          lVar121 = -1;
                          dVar211 = dVar196;
                          dVar223 = dVar196;
                          do {
                            lVar148 = -1;
                            do {
                              iVar124 = 0;
                              bVar168 = true;
                              do {
                                bVar114 = bVar168;
                                if ((((int)lVar148 != 0 || (int)lVar121 != 0) || iVar124 != 0) &&
                                   ((1 << ((char)lVar148 * '\x03' + (char)lVar121 * '\t' + '\x12' +
                                           (char)iVar124 & 0x1fU) & uVar13) != 0)) {
                                  dVar180 = pdVar22[lVar102 + (iVar131 + (int)lVar121) * lVar103 +
                                                              (iVar77 + (int)lVar148) * lVar85 +
                                                              (long)(int)(iVar124 +
                                                                         (iVar82 - uVar12))];
                                  dVar199 = dVar180;
                                  if (dVar180 <= dVar211) {
                                    dVar199 = dVar211;
                                  }
                                  dVar211 = dVar199;
                                  if (dVar180 < dVar223) {
                                    dVar223 = dVar180;
                                  }
                                }
                                iVar124 = 1;
                                bVar168 = false;
                              } while (bVar114);
                              lVar148 = lVar148 + 1;
                            } while (lVar148 != 2);
                            lVar121 = lVar121 + 1;
                          } while (lVar121 != 2);
                          dVar180 = (((local_578 + lVar133 + lVar111 + ((iVar82 - local_990) + 1))
                                      [local_918] - dVar182) * dVar184 +
                                    (local_578[lVar133 + lVar111 + ((iVar82 - local_990) + 1)] -
                                    dVar186) * dVar206 + (0.5 - dVar202) * dVar198 + dVar196) -
                                    dVar196;
                          if (dVar180 <= 1e-13) {
                            dVar211 = 1.0;
                            if ((dVar180 < -1e-13) &&
                               (dVar211 = (dVar223 - dVar196) / dVar180, 1.0 <= dVar211)) {
                              dVar211 = 1.0;
                            }
                          }
                          else {
                            dVar211 = (dVar211 - dVar196) / dVar180;
                            if (1.0 <= dVar211) {
                              dVar211 = 1.0;
                            }
                          }
                          if (dVar214 <= dVar211) {
                            dVar211 = dVar214;
                          }
                        }
                        lVar121 = -1;
                        cVar139 = '\x05';
                        dVar214 = dVar196;
                        dVar223 = dVar196;
                        do {
                          lVar148 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar157 = 0;
                            dVar180 = dVar214;
                            do {
                              dVar214 = dVar180;
                              if (((int)lVar157 != 1 || ((int)lVar148 != 0 || (int)lVar121 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar157 & 0x1fU) & uVar13) != 0)) {
                                dVar199 = pdVar22[lVar102 + (iVar131 + (int)lVar121) * lVar103 +
                                                            (iVar77 + (int)lVar148) * lVar85 +
                                                            (long)(iVar81 + (int)lVar157)];
                                dVar214 = dVar199;
                                if (dVar199 <= dVar180) {
                                  dVar214 = dVar180;
                                }
                                if (dVar199 < dVar223) {
                                  dVar223 = dVar199;
                                }
                              }
                              lVar157 = lVar157 + 1;
                              dVar180 = dVar214;
                            } while (lVar157 != 2);
                            lVar148 = lVar148 + 1;
                            cVar122 = cVar122 + '\x03';
                          } while (lVar148 != 2);
                          lVar121 = lVar121 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar121 != 2);
                        dVar180 = (dVar210 * dVar184 +
                                  dVar172 * dVar206 + (dVar196 - dVar198 * (dVar202 + 0.5))) -
                                  dVar196;
                        if (dVar180 <= 1e-13) {
                          dVar214 = 1.0;
                          if ((dVar180 < -1e-13) &&
                             (dVar214 = (dVar223 - dVar196) / dVar180, 1.0 <= dVar214)) {
                            dVar214 = 1.0;
                          }
                        }
                        else {
                          dVar214 = (dVar214 - dVar196) / dVar180;
                          if (1.0 <= dVar214) {
                            dVar214 = 1.0;
                          }
                        }
                        if (dVar211 <= dVar214) {
                          dVar214 = dVar211;
                        }
                        dVar211 = dVar214;
                        if ((uVar13 >> 0x1b & 1) != 0) {
                          iVar124 = 0;
                          bVar168 = true;
                          dVar223 = dVar196;
                          dVar211 = dVar196;
                          do {
                            bVar114 = bVar168;
                            iVar129 = iVar124 * 9 + 0xe;
                            lVar121 = -1;
                            do {
                              lVar148 = 0;
                              dVar180 = dVar211;
                              do {
                                dVar211 = dVar180;
                                if (((int)lVar148 != 1 || ((int)lVar121 != 0 || iVar124 != 0)) &&
                                   ((1 << ((char)iVar129 + (char)lVar148 & 0x1fU) & uVar13) != 0)) {
                                  dVar199 = pdVar22[lVar102 + (iVar131 + iVar124) * lVar103 +
                                                              (iVar77 + (int)lVar121) * lVar85 +
                                                              (long)(iVar81 + (int)lVar148)];
                                  dVar211 = dVar199;
                                  if (dVar199 <= dVar180) {
                                    dVar211 = dVar180;
                                  }
                                  if (dVar199 < dVar223) {
                                    dVar223 = dVar199;
                                  }
                                }
                                lVar148 = lVar148 + 1;
                                dVar180 = dVar211;
                              } while (lVar148 != 3);
                              lVar121 = lVar121 + 1;
                              iVar129 = iVar129 + 3;
                            } while (lVar121 != 2);
                            iVar124 = 1;
                            bVar168 = false;
                          } while (bVar114);
                          dVar180 = ((0.5 - dVar182) * dVar184 +
                                    ((local_4c0 + lVar92 + lVar95 + (iVar82 - local_98c))[local_950]
                                    - dVar186) * dVar206 +
                                    (local_4c0[lVar92 + lVar95 + (iVar82 - local_98c)] - dVar202) *
                                    dVar198 + dVar196) - dVar196;
                          if (dVar180 <= 1e-13) {
                            dVar211 = 1.0;
                            if ((dVar180 < -1e-13) &&
                               (dVar211 = (dVar223 - dVar196) / dVar180, 1.0 <= dVar211)) {
                              dVar211 = 1.0;
                            }
                          }
                          else {
                            dVar211 = (dVar211 - dVar196) / dVar180;
                            if (1.0 <= dVar211) {
                              dVar211 = 1.0;
                            }
                          }
                          if (dVar214 <= dVar211) {
                            dVar211 = dVar214;
                          }
                        }
                        dVar214 = dVar211;
                        if ((uVar13 >> 9 & 1) != 0) {
                          cVar139 = '\x05';
                          lVar121 = -1;
                          dVar223 = dVar196;
                          dVar214 = dVar196;
                          do {
                            lVar148 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar157 = 0;
                              dVar180 = dVar214;
                              do {
                                dVar214 = dVar180;
                                if (((int)lVar157 != 1 || ((int)lVar148 != 0 || (int)lVar121 != 0))
                                   && ((1 << (cVar122 + (char)lVar157 & 0x1fU) & uVar13) != 0)) {
                                  dVar199 = pdVar22[lVar102 + (iVar131 + (int)lVar121) * lVar103 +
                                                              (iVar77 + (int)lVar148) * lVar85 +
                                                              (long)(iVar81 + (int)lVar157)];
                                  dVar214 = dVar199;
                                  if (dVar199 <= dVar180) {
                                    dVar214 = dVar180;
                                  }
                                  if (dVar199 < dVar223) {
                                    dVar223 = dVar199;
                                  }
                                }
                                lVar157 = lVar157 + 1;
                                dVar180 = dVar214;
                              } while (lVar157 != 3);
                              lVar148 = lVar148 + 1;
                              cVar122 = cVar122 + '\x03';
                            } while (lVar148 != 2);
                            cVar139 = cVar139 + '\t';
                            bVar168 = lVar121 != 0;
                            lVar121 = lVar121 + 1;
                          } while (bVar168);
                          dVar186 = ((((local_4c0 + lVar89 + lVar95 + (iVar82 - local_98c))
                                       [local_950] - dVar186) * dVar206 +
                                     (local_4c0[lVar89 + lVar95 + (iVar82 - local_98c)] - dVar202) *
                                     dVar198 + dVar196) - (dVar182 + 0.5) * dVar184) - dVar196;
                          if (dVar186 <= 1e-13) {
                            dVar214 = 1.0;
                            if ((dVar186 < -1e-13) &&
                               (dVar214 = (dVar223 - dVar196) / dVar186, 1.0 <= dVar214)) {
                              dVar214 = 1.0;
                            }
                          }
                          else {
                            dVar214 = (dVar214 - dVar196) / dVar186;
                            if (1.0 <= dVar214) {
                              dVar214 = 1.0;
                            }
                          }
                          if (dVar211 <= dVar214) {
                            dVar214 = dVar211;
                          }
                        }
                        dVar186 = 0.0;
                        if (1 < iVar130) {
                          dVar186 = dVar214;
                        }
                        dVar182 = 0.0;
                        if (1 < iVar159) {
                          dVar182 = dVar214;
                        }
                        dVar211 = 0.0;
                        if (1 < iVar83) {
                          dVar211 = dVar214;
                        }
                        if ((dVar195 == 1.0) && (!NAN(dVar195))) {
                          if ((local_808[lVar144 + lVar109 + (int)(iVar101 - local_984)] == 1.0) &&
                             ((local_808[lVar144 + lVar109 + (iVar99 + 1)] == 1.0 &&
                              (!NAN(local_808[lVar144 + lVar109 + (iVar99 + 1)]))))) {
                            dVar186 = 1.0;
                          }
                          if (((local_808[lVar109 + lVar151 + lVar166] == 1.0) &&
                              (local_808[lVar109 + lVar138 + lVar166] == 1.0)) &&
                             (!NAN(local_808[lVar109 + lVar138 + lVar166]))) {
                            dVar182 = 1.0;
                          }
                          if (((local_808[lVar144 + lVar108 + lVar166] == 1.0) &&
                              (local_808[lVar144 + lVar116 + lVar166] == 1.0)) &&
                             (!NAN(local_808[lVar144 + lVar116 + lVar166]))) {
                            dVar211 = 1.0;
                          }
                        }
                        dVar186 = dVar210 * dVar184 * dVar211 +
                                  dVar172 * dVar206 * dVar182 +
                                  (dVar196 - (dVar202 + 0.5) * dVar186 * dVar198);
                        dVar202 = dVar183;
                        if (dVar186 <= dVar183) {
                          dVar202 = dVar186;
                        }
                        lVar121 = (long)(iVar101 - local_954);
                        dVar186 = pdVar14[lVar134 + lVar117 + lVar121];
                        dVar182 = pdVar14[lVar134 + lVar117 + lVar121 + lVar126];
                        dVar172 = pdVar14[lVar134 + lVar117 + lVar121 + lVar126 * 2];
                        uVar13 = local_4c8[lVar105 + lVar110 + (iVar101 - local_8cc)].flag;
                        lVar121 = -1;
                        cVar139 = '\x05';
                        lVar148 = 0;
                        do {
                          lVar125 = -1;
                          lVar157 = lVar119;
                          lVar149 = lVar120;
                          lVar160 = lVar155;
                          cVar122 = cVar139;
                          do {
                            iVar83 = (int)lVar148;
                            ppBVar86 = &local_398.d_bcrec_ptr + (long)iVar83 * 3;
                            lVar148 = 0;
                            do {
                              iVar124 = (int)lVar148 + -1;
                              if ((((int)lVar125 == 0 && (int)lVar121 == 0) && iVar124 == 0) ||
                                 ((1 << (cVar122 + (char)lVar148 & 0x1fU) & uVar13) == 0)) {
                                *ppBVar86 = (BCRec *)0x0;
                                ((Array4<const_double> *)(ppBVar86 + 1))->p = (double *)0x0;
                                ppBVar86[2] = (BCRec *)0x0;
                              }
                              else {
                                dVar198 = *(double *)(lVar149 + lVar148 * 8);
                                *ppBVar86 = (BCRec *)((*(double *)(lVar157 + lVar148 * 8) +
                                                      (double)iVar124) - dVar186);
                                ((Array4<const_double> *)(ppBVar86 + 1))->p =
                                     (double *)((dVar198 + (double)(int)lVar125) - dVar182);
                                ppBVar86[2] = (BCRec *)((*(double *)(lVar160 + lVar148 * 8) +
                                                        (double)(int)lVar121) - dVar172);
                              }
                              lVar148 = lVar148 + 1;
                              ppBVar86 = ppBVar86 + 3;
                            } while (lVar148 != 3);
                            lVar125 = lVar125 + 1;
                            lVar157 = lVar157 + local_8a8 * 8;
                            lVar149 = lVar149 + lVar5;
                            lVar160 = lVar160 + lVar5;
                            cVar122 = cVar122 + '\x03';
                            lVar148 = (long)iVar83 + 3;
                          } while (lVar125 != 2);
                          lVar121 = lVar121 + 1;
                          lVar119 = lVar119 + lVar104 * 8;
                          lVar120 = lVar120 + lVar4;
                          lVar155 = lVar155 + lVar4;
                          cVar139 = cVar139 + '\t';
                          lVar148 = (long)iVar83 + 3;
                        } while (lVar121 != 2);
                        lVar119 = -1;
                        cVar139 = '\x05';
                        lVar120 = 0;
                        do {
                          lVar155 = -1;
                          cVar122 = cVar139;
                          do {
                            iVar83 = (int)lVar120;
                            lVar120 = 0;
                            do {
                              dVar198 = 0.0;
                              if (((int)lVar120 != 1 || ((int)lVar155 != 0 || (int)lVar119 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar120 & 0x1fU) & uVar13) != 0)) {
                                dVar198 = pdVar22[lVar102 + (iVar131 + (int)lVar119) * lVar103 +
                                                            (iVar77 + (int)lVar155) * lVar85 +
                                                            (long)(iVar98 + (int)lVar120)] - dVar216
                                ;
                              }
                              adStack_108[iVar83 + lVar120] = dVar198;
                              lVar120 = lVar120 + 1;
                            } while (lVar120 != 3);
                            lVar155 = lVar155 + 1;
                            cVar122 = cVar122 + '\x03';
                            lVar120 = (long)iVar83 + 3;
                          } while (lVar155 != 2);
                          lVar119 = lVar119 + 1;
                          cVar139 = cVar139 + '\t';
                          lVar120 = (long)iVar83 + 3;
                        } while (lVar119 != 2);
                        dVar198 = dVar209;
                        if (dVar209 <= dVar202) {
                          dVar198 = dVar202;
                        }
                        dVar210 = 0.0;
                        dVar211 = 0.0;
                        dVar214 = 0.0;
                        pDVar87 = (Dim3 *)&local_398.q.jstride;
                        lVar119 = 0;
                        dVar184 = 0.0;
                        dVar199 = 0.0;
                        dVar223 = 0.0;
                        dVar180 = 0.0;
                        dVar202 = 0.0;
                        dVar206 = 0.0;
                        do {
                          dVar215 = *(double *)((long)(pDVar87 + -2) + 8);
                          dVar213 = *(double *)((long)(pDVar87 + -1) + 4);
                          dVar212 = *(double *)pDVar87;
                          dVar194 = adStack_108[lVar119];
                          dVar202 = dVar202 + dVar213 * *(double *)((long)(pDVar87 + -1) + 4);
                          dVar206 = dVar206 + dVar215 * *(double *)pDVar87;
                          dVar214 = dVar214 + dVar212 * dVar212;
                          dVar223 = dVar223 + dVar194 * dVar215;
                          dVar180 = dVar180 + dVar215 * dVar215;
                          dVar210 = dVar210 + dVar194 * dVar213;
                          dVar211 = dVar211 + dVar213 * dVar215;
                          dVar184 = dVar184 + dVar212 * *(double *)((long)(pDVar87 + -1) + 4);
                          dVar199 = dVar199 + dVar194 * *(double *)pDVar87;
                          lVar119 = lVar119 + 1;
                          pDVar87 = pDVar87 + 2;
                        } while (lVar119 != 0x1b);
                        dVar215 = dVar211 * dVar214 - dVar206 * dVar184;
                        dVar212 = dVar211 * dVar199 - dVar206 * dVar210;
                        dVar194 = dVar211 * dVar184 + dVar206 * -dVar202;
                        dVar213 = dVar214 * dVar202 - dVar184 * dVar184;
                        dVar214 = dVar214 * dVar210 - dVar184 * dVar199;
                        auVar203._0_8_ =
                             dVar206 * (dVar210 * dVar184 - dVar199 * dVar202) +
                             (dVar223 * dVar213 - dVar214 * dVar211);
                        auVar203._8_8_ = dVar206 * dVar212 + (dVar180 * dVar214 - dVar215 * dVar223)
                        ;
                        dVar206 = dVar194 * dVar206 + (dVar213 * dVar180 - dVar215 * dVar211);
                        auVar174._8_8_ = dVar206;
                        auVar174._0_8_ = dVar206;
                        auVar178 = divpd(auVar203,auVar174);
                        dVar206 = (dVar194 * dVar223 +
                                  ((dVar199 * dVar202 + -dVar210 * dVar184) * dVar180 -
                                  dVar212 * dVar211)) / dVar206;
                        lVar119 = (long)(int)(iVar101 - local_984);
                        dVar202 = local_808[lVar144 + lVar109 + lVar119];
                        dVar210 = auVar178._0_8_;
                        dVar211 = auVar178._8_8_;
                        if ((dVar202 == 1.0) && (!NAN(dVar202))) {
                          if ((local_808[lVar144 + lVar109 + (int)((iVar82 + -2) - local_984)] ==
                               1.0) && ((dVar195 == 1.0 && (!NAN(dVar195))))) {
                            dVar214 = dVar216 - pdVar22[lVar118 + lVar94 + lVar102 + (int)((iVar82 +
                                                                                           -2) - 
                                                  uVar12)];
                            dVar214 = dVar214 + dVar214;
                            dVar223 = (dVar196 - dVar216) + (dVar196 - dVar216);
                            dVar195 = (dVar196 -
                                      pdVar22[lVar118 + lVar94 + lVar102 + (int)((iVar82 + -2) -
                                                                                uVar12)]) * 0.5;
                            dVar210 = ABS(dVar214);
                            uVar169 = -(ulong)(0.0 < dVar195);
                            dVar195 = ABS(dVar195);
                            dVar196 = ABS(dVar223);
                            if (dVar210 <= dVar195) {
                              dVar195 = dVar210;
                            }
                            if (dVar195 <= dVar196) {
                              dVar196 = dVar195;
                            }
                            uVar185 = -(ulong)(0.0 < dVar214 * dVar223) & (ulong)dVar196;
                            dVar210 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                          if (((local_808[lVar109 + lVar146 + lVar119] == 1.0) &&
                              (local_808[lVar109 + lVar167 + lVar119] == 1.0)) &&
                             (!NAN(local_808[lVar109 + lVar167 + lVar119]))) {
                            dVar196 = dVar216 - pdVar22[lVar102 + lVar94 + lVar150 + lVar145];
                            dVar195 = pdVar22[lVar102 + lVar94 + lVar153 + lVar145] - dVar216;
                            dVar196 = dVar196 + dVar196;
                            dVar195 = dVar195 + dVar195;
                            dVar214 = (pdVar22[lVar102 + lVar94 + lVar153 + lVar145] -
                                      pdVar22[lVar102 + lVar94 + lVar150 + lVar145]) * 0.5;
                            dVar223 = ABS(dVar196);
                            uVar169 = -(ulong)(0.0 < dVar214);
                            dVar214 = ABS(dVar214);
                            dVar211 = ABS(dVar195);
                            if (dVar223 <= dVar214) {
                              dVar214 = dVar223;
                            }
                            if (dVar214 <= dVar211) {
                              dVar211 = dVar214;
                            }
                            uVar185 = -(ulong)(0.0 < dVar196 * dVar195) & (ulong)dVar211;
                            dVar211 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                          if (((local_808[lVar144 + lVar119 + lVar106] == 1.0) &&
                              (local_808[lVar144 + lVar119 + lVar91] == 1.0)) &&
                             (!NAN(local_808[lVar144 + lVar119 + lVar91]))) {
                            dVar196 = dVar216 - pdVar22[lVar118 + lVar145 + lVar136 + lVar102];
                            dVar195 = pdVar22[lVar118 + lVar145 + lVar107 + lVar102] - dVar216;
                            dVar196 = dVar196 + dVar196;
                            dVar195 = dVar195 + dVar195;
                            dVar206 = (pdVar22[lVar118 + lVar145 + lVar107 + lVar102] -
                                      pdVar22[lVar118 + lVar145 + lVar136 + lVar102]) * 0.5;
                            dVar223 = ABS(dVar196);
                            uVar169 = -(ulong)(0.0 < dVar206);
                            dVar206 = ABS(dVar206);
                            dVar214 = ABS(dVar195);
                            if (dVar223 <= dVar206) {
                              dVar206 = dVar223;
                            }
                            if (dVar206 <= dVar214) {
                              dVar214 = dVar206;
                            }
                            uVar185 = -(ulong)(0.0 < dVar196 * dVar195) & (ulong)dVar214;
                            dVar206 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                        }
                        iVar124 = 0;
                        iVar83 = 0;
                        iVar159 = 0;
                        iVar130 = 0;
                        uVar142 = 0xffffffff;
                        do {
                          uVar100 = uVar142 + 1;
                          uVar115 = 0xffffffff;
                          iVar129 = iVar124;
                          do {
                            uVar1 = uVar115 + 1;
                            iVar164 = 5;
                            do {
                              if (((uVar13 >> (iVar129 + iVar164 & 0x1fU) & 1) != 0) &&
                                 ((iVar164 != 6 || uVar115 != 0) || uVar142 != 0)) {
                                iVar83 = iVar83 + (uint)((iVar164 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar115 == 0 && uVar142 == 0));
                                iVar159 = iVar159 + (uint)((iVar164 == 6 && uVar142 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar130 = iVar130 + (uint)((iVar164 == 6 && uVar115 == 0) &&
                                                          (uVar100 & 0xfffffffd) == 0);
                              }
                              iVar164 = iVar164 + 1;
                            } while (iVar164 != 8);
                            iVar129 = iVar129 + 3;
                            uVar115 = uVar1;
                          } while (uVar1 != 2);
                          iVar124 = iVar124 + 9;
                          uVar142 = uVar100;
                        } while (uVar100 != 2);
                        dVar196 = 2.0;
                        if ((uVar13 >> 0x15 & 1) != 0) {
                          lVar120 = -1;
                          cVar139 = '\b';
                          auVar207._8_8_ = 0;
                          auVar207._0_8_ = dVar216;
                          dVar195 = dVar216;
                          do {
                            iVar124 = 0;
                            bVar168 = true;
                            do {
                              bVar114 = bVar168;
                              lVar155 = 0;
                              do {
                                if (((int)lVar155 != 1 || (iVar124 != 0 || (int)lVar120 != 0)) &&
                                   ((1 << ((char)iVar124 * '\x03' + cVar139 + (char)lVar155 & 0x1fU)
                                    & uVar13) != 0)) {
                                  dVar196 = pdVar22[lVar102 + (iVar131 + (int)lVar120) * lVar103 +
                                                              (iVar77 + iVar124) * lVar85 +
                                                              (long)(iVar98 + (int)lVar155)];
                                  dVar214 = dVar196;
                                  if (dVar196 <= auVar207._0_8_) {
                                    dVar214 = auVar207._0_8_;
                                  }
                                  auVar207._8_8_ = 0;
                                  auVar207._0_8_ = dVar214;
                                  if (dVar196 < dVar195) {
                                    dVar195 = dVar196;
                                  }
                                }
                                lVar155 = lVar155 + 1;
                              } while (lVar155 != 3);
                              iVar124 = 1;
                              bVar168 = false;
                            } while (bVar114);
                            lVar120 = lVar120 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar120 != 2);
                          dVar214 = (((local_580 + lVar137 + lVar112 + (iVar101 - local_988))
                                      [local_900] - dVar172) * dVar206 +
                                    (0.5 - dVar182) * dVar211 +
                                    (local_580[lVar137 + lVar112 + (iVar101 - local_988)] - dVar186)
                                    * dVar210 + dVar216) - dVar216;
                          if (dVar214 <= 1e-13) {
                            dVar196 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar196 = (dVar195 - dVar216) / dVar214, 1.0 <= dVar196)) {
                              dVar196 = 1.0;
                            }
                          }
                          else {
                            dVar196 = (auVar207._0_8_ - dVar216) / dVar214;
                            if (1.0 <= dVar196) {
                              dVar196 = 1.0;
                            }
                          }
                          if (2.0 <= dVar196) {
                            dVar196 = 2.0;
                          }
                        }
                        dVar195 = dVar196;
                        if ((short)uVar13 < 0) {
                          lVar120 = -1;
                          cVar139 = '\x05';
                          auVar187._8_8_ = 0;
                          auVar187._0_8_ = (ulong)dVar216;
                          dVar214 = dVar216;
                          do {
                            lVar155 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar121 = 0;
                              do {
                                if (((int)lVar121 != 1 || ((int)lVar155 != 0 || (int)lVar120 != 0))
                                   && ((1 << (cVar122 + (char)lVar121 & 0x1fU) & uVar13) != 0)) {
                                  dVar195 = pdVar22[lVar102 + (iVar131 + (int)lVar120) * lVar103 +
                                                              (iVar77 + (int)lVar155) * lVar85 +
                                                              (long)(iVar98 + (int)lVar121)];
                                  uVar200 = SUB84(dVar195,0);
                                  uVar201 = (undefined4)((ulong)dVar195 >> 0x20);
                                  if (dVar195 <= auVar187._0_8_) {
                                    uVar200 = auVar187._0_4_;
                                    uVar201 = auVar187._4_4_;
                                  }
                                  auVar187._4_4_ = uVar201;
                                  auVar187._0_4_ = uVar200;
                                  auVar187._8_8_ = 0;
                                  if (dVar195 < dVar214) {
                                    dVar214 = dVar195;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 3);
                              cVar122 = cVar122 + '\x03';
                              bVar168 = lVar155 != 0;
                              lVar155 = lVar155 + 1;
                            } while (bVar168);
                            lVar120 = lVar120 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar120 != 2);
                          dVar223 = (((local_580 + lVar137 + lVar154 + (iVar101 - local_988))
                                      [local_900] - dVar172) * dVar206 +
                                    -(dVar182 + 0.5) * dVar211 +
                                    (local_580[lVar137 + lVar154 + (iVar101 - local_988)] - dVar186)
                                    * dVar210 + dVar216) - dVar216;
                          if (dVar223 <= 1e-13) {
                            dVar195 = 1.0;
                            if ((dVar223 < -1e-13) &&
                               (dVar195 = (dVar214 - dVar216) / dVar223, 1.0 <= dVar195)) {
                              dVar195 = 1.0;
                            }
                          }
                          else {
                            dVar195 = (auVar187._0_8_ - dVar216) / dVar223;
                            if (1.0 <= dVar195) {
                              dVar195 = 1.0;
                            }
                          }
                          if (dVar196 <= dVar195) {
                            dVar195 = dVar196;
                          }
                        }
                        dVar196 = dVar195;
                        if ((uVar13 >> 0x13 & 1) != 0) {
                          dVar216 = pdVar22[lVar118 + lVar145 + lVar94 + lVar102];
                          lVar120 = -1;
                          auVar217._8_8_ = 0;
                          auVar217._0_8_ = (ulong)dVar216;
                          dVar214 = dVar216;
                          do {
                            lVar155 = -1;
                            do {
                              iVar124 = 0;
                              bVar168 = true;
                              do {
                                bVar114 = bVar168;
                                if ((((int)lVar155 != 0 || (int)lVar120 != 0) || iVar124 != 0) &&
                                   ((1 << ((char)lVar155 * '\x03' + (char)lVar120 * '\t' + '\x12' +
                                           (char)iVar124 & 0x1fU) & uVar13) != 0)) {
                                  dVar196 = pdVar22[lVar102 + (iVar131 + (int)lVar120) * lVar103 +
                                                              (iVar77 + (int)lVar155) * lVar85 +
                                                              (long)(int)(iVar124 +
                                                                         (iVar101 - uVar12))];
                                  uVar200 = SUB84(dVar196,0);
                                  uVar201 = (undefined4)((ulong)dVar196 >> 0x20);
                                  if (dVar196 <= auVar217._0_8_) {
                                    uVar200 = auVar217._0_4_;
                                    uVar201 = auVar217._4_4_;
                                  }
                                  if (dVar196 < dVar214) {
                                    dVar214 = dVar196;
                                  }
                                  auVar217._4_4_ = uVar201;
                                  auVar217._0_4_ = uVar200;
                                  auVar217._8_8_ = 0;
                                }
                                iVar124 = 1;
                                bVar168 = false;
                              } while (bVar114);
                              lVar155 = lVar155 + 1;
                            } while (lVar155 != 2);
                            lVar120 = lVar120 + 1;
                          } while (lVar120 != 2);
                          dVar223 = ((pdVar2[local_918] - dVar172) * dVar206 +
                                    (*pdVar2 - dVar182) * dVar211 +
                                    (0.5 - dVar186) * dVar210 + dVar216) - dVar216;
                          if (dVar223 <= 1e-13) {
                            dVar196 = 1.0;
                            if ((dVar223 < -1e-13) &&
                               (dVar196 = (dVar214 - dVar216) / dVar223, 1.0 <= dVar196)) {
                              dVar196 = 1.0;
                            }
                          }
                          else {
                            dVar196 = (auVar217._0_8_ - dVar216) / dVar223;
                            if (1.0 <= dVar196) {
                              dVar196 = 1.0;
                            }
                          }
                          if (dVar195 <= dVar196) {
                            dVar196 = dVar195;
                          }
                        }
                        dVar216 = dVar196;
                        if ((uVar13 >> 0x11 & 1) != 0) {
                          dVar195 = pdVar22[lVar118 + lVar145 + lVar94 + lVar102];
                          lVar120 = -1;
                          cVar139 = '\x05';
                          dVar216 = dVar195;
                          dVar214 = dVar195;
                          do {
                            lVar155 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar121 = 0;
                              do {
                                if (((int)lVar121 != 1 || ((int)lVar155 != 0 || (int)lVar120 != 0))
                                   && ((1 << (cVar122 + (char)lVar121 & 0x1fU) & uVar13) != 0)) {
                                  dVar223 = pdVar22[lVar102 + (iVar131 + (int)lVar120) * lVar103 +
                                                              (iVar77 + (int)lVar155) * lVar85 +
                                                              (long)(iVar98 + (int)lVar121)];
                                  uVar200 = SUB84(dVar223,0);
                                  uVar201 = (undefined4)((ulong)dVar223 >> 0x20);
                                  if (dVar223 <= dVar216) {
                                    uVar200 = SUB84(dVar216,0);
                                    uVar201 = (undefined4)((ulong)dVar216 >> 0x20);
                                  }
                                  if (dVar223 < dVar214) {
                                    dVar214 = dVar223;
                                  }
                                  dVar216 = (double)CONCAT44(uVar201,uVar200);
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 2);
                              lVar155 = lVar155 + 1;
                              cVar122 = cVar122 + '\x03';
                            } while (lVar155 != 2);
                            lVar120 = lVar120 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar120 != 2);
                          dVar223 = (((local_578 + lVar133 + lVar111 + (iVar101 - local_990))
                                      [local_918] - dVar172) * dVar206 +
                                    (local_578[lVar133 + lVar111 + (iVar101 - local_990)] - dVar182)
                                    * dVar211 + (dVar195 - (dVar186 + 0.5) * dVar210)) - dVar195;
                          if (dVar223 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar223 < -1e-13) &&
                               (dVar216 = (dVar214 - dVar195) / dVar223, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar195) / dVar223;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar196 <= dVar216) {
                            dVar216 = dVar196;
                          }
                        }
                        dVar196 = dVar216;
                        if ((uVar13 >> 0x1b & 1) != 0) {
                          dVar195 = pdVar22[lVar118 + lVar145 + lVar94 + lVar102];
                          iVar124 = 0;
                          dVar196 = dVar195;
                          dVar214 = dVar195;
                          bVar168 = true;
                          do {
                            bVar114 = bVar168;
                            iVar129 = iVar124 * 9 + 0xe;
                            lVar120 = -1;
                            do {
                              lVar155 = 0;
                              do {
                                if (((int)lVar155 != 1 || ((int)lVar120 != 0 || iVar124 != 0)) &&
                                   ((1 << ((char)iVar129 + (char)lVar155 & 0x1fU) & uVar13) != 0)) {
                                  dVar223 = pdVar22[lVar102 + (iVar131 + iVar124) * lVar103 +
                                                              (iVar77 + (int)lVar120) * lVar85 +
                                                              (long)(iVar98 + (int)lVar155)];
                                  uVar200 = SUB84(dVar223,0);
                                  uVar201 = (undefined4)((ulong)dVar223 >> 0x20);
                                  if (dVar223 <= dVar196) {
                                    uVar200 = SUB84(dVar196,0);
                                    uVar201 = (undefined4)((ulong)dVar196 >> 0x20);
                                  }
                                  if (dVar223 < dVar214) {
                                    dVar214 = dVar223;
                                  }
                                  dVar196 = (double)CONCAT44(uVar201,uVar200);
                                }
                                lVar155 = lVar155 + 1;
                              } while (lVar155 != 3);
                              lVar120 = lVar120 + 1;
                              iVar129 = iVar129 + 3;
                            } while (lVar120 != 2);
                            iVar124 = 1;
                            bVar168 = false;
                          } while (bVar114);
                          dVar223 = ((0.5 - dVar172) * dVar206 +
                                    ((local_4c0 + lVar92 + lVar95 + (iVar101 - local_98c))
                                     [local_950] - dVar182) * dVar211 +
                                    (local_4c0[lVar92 + lVar95 + (iVar101 - local_98c)] - dVar186) *
                                    dVar210 + dVar195) - dVar195;
                          if (dVar223 <= 1e-13) {
                            dVar196 = 1.0;
                            if ((dVar223 < -1e-13) &&
                               (dVar196 = (dVar214 - dVar195) / dVar223, 1.0 <= dVar196)) {
                              dVar196 = 1.0;
                            }
                          }
                          else {
                            dVar196 = (dVar196 - dVar195) / dVar223;
                            if (1.0 <= dVar196) {
                              dVar196 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar196) {
                            dVar196 = dVar216;
                          }
                        }
                        dVar216 = dVar196;
                        if ((uVar13 >> 9 & 1) != 0) {
                          dVar195 = pdVar22[lVar118 + lVar145 + lVar94 + lVar102];
                          cVar139 = '\x05';
                          lVar120 = -1;
                          dVar216 = dVar195;
                          dVar214 = dVar195;
                          do {
                            lVar155 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar121 = 0;
                              do {
                                if (((int)lVar121 != 1 || ((int)lVar155 != 0 || (int)lVar120 != 0))
                                   && ((1 << (cVar122 + (char)lVar121 & 0x1fU) & uVar13) != 0)) {
                                  dVar223 = pdVar22[lVar102 + (iVar131 + (int)lVar120) * lVar103 +
                                                              (iVar77 + (int)lVar155) * lVar85 +
                                                              (long)(iVar98 + (int)lVar121)];
                                  dVar180 = dVar223;
                                  if (dVar223 <= dVar216) {
                                    dVar180 = dVar216;
                                  }
                                  dVar216 = dVar180;
                                  if (dVar223 < dVar214) {
                                    dVar214 = dVar223;
                                  }
                                }
                                lVar121 = lVar121 + 1;
                              } while (lVar121 != 3);
                              lVar155 = lVar155 + 1;
                              cVar122 = cVar122 + '\x03';
                            } while (lVar155 != 2);
                            cVar139 = cVar139 + '\t';
                            bVar168 = lVar120 != 0;
                            lVar120 = lVar120 + 1;
                          } while (bVar168);
                          dVar223 = ((((local_4c0 + lVar89 + lVar95 + (iVar101 - local_98c))
                                       [local_950] - dVar182) * dVar211 +
                                     (local_4c0[lVar89 + lVar95 + (iVar101 - local_98c)] - dVar186)
                                     * dVar210 + dVar195) - (dVar172 + 0.5) * dVar206) - dVar195;
                          if (dVar223 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar223 < -1e-13) &&
                               (dVar216 = (dVar214 - dVar195) / dVar223, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar195) / dVar223;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar196 <= dVar216) {
                            dVar216 = dVar196;
                          }
                        }
                        dVar196 = 0.0;
                        if (1 < iVar83) {
                          dVar196 = dVar216;
                        }
                        uVar200 = 0;
                        uVar201 = 0;
                        if (1 < iVar159) {
                          uVar200 = SUB84(dVar216,0);
                          uVar201 = (undefined4)((ulong)dVar216 >> 0x20);
                        }
                        dVar195 = 0.0;
                        if (1 < iVar130) {
                          dVar195 = dVar216;
                        }
                        if ((dVar202 == 1.0) && (!NAN(dVar202))) {
                          if ((local_808[lVar144 + lVar109 + (iVar99 + -2)] == 1.0) &&
                             (((!NAN(local_808[lVar144 + lVar109 + (iVar99 + -2)]) &&
                               (local_808[lVar144 + lVar109 + lVar166] == 1.0)) &&
                              (!NAN(local_808[lVar144 + lVar109 + lVar166]))))) {
                            dVar196 = 1.0;
                          }
                          if ((local_808[lVar109 + lVar151 + lVar119] == 1.0) &&
                             (!NAN(local_808[lVar109 + lVar151 + lVar119]))) {
                            if ((local_808[lVar109 + lVar138 + lVar119] == 1.0) &&
                               (!NAN(local_808[lVar109 + lVar138 + lVar119]))) {
                              uVar200 = 0;
                              uVar201 = 0x3ff00000;
                            }
                          }
                          if (((local_808[lVar144 + lVar108 + lVar119] == 1.0) &&
                              (!NAN(local_808[lVar144 + lVar108 + lVar119]))) &&
                             ((local_808[lVar144 + lVar116 + lVar119] == 1.0 &&
                              (!NAN(local_808[lVar144 + lVar116 + lVar119]))))) {
                            dVar195 = 1.0;
                          }
                        }
                        dVar173 = (0.5 - dVar186) * dVar210 * dVar196 +
                                  pdVar22[lVar118 + lVar145 + lVar94 + lVar102] +
                                  (dVar173 - dVar182) * dVar211 * (double)CONCAT44(uVar201,uVar200)
                                  + (dVar171 - dVar172) * dVar206 * dVar195;
                        if (dVar173 <= dVar183) {
                          dVar183 = dVar173;
                        }
                        if (dVar209 <= dVar183) {
                          dVar209 = dVar183;
                        }
                        iVar101 = d_bcrec_ptr[local_7f0].bc[3];
                        if (iVar127 == iVar82) {
                          switch(d_bcrec_ptr[local_7f0].bc[0]) {
                          case 1:
switchD_00481107_caseD_1:
                            dVar209 = dVar198;
                            break;
                          case 2:
                          case 4:
                            if ((local_7f0 != 0 || !is_velocity) ||
                                pdVar15[lVar90 + lVar163 + (iVar127 - iVar156)] < 0.0)
                            goto switchD_00481107_caseD_1;
                            dVar209 = 0.0;
                            if (dVar198 <= 0.0) {
                              dVar209 = dVar198;
                            }
switchD_00481176_caseD_1:
                            dVar198 = dVar209;
                            break;
                          case 3:
                            dVar209 = pdVar22[lVar118 + lVar94 + (int)(~uVar12 + iVar127)];
                            if (is_velocity) goto switchD_00481176_caseD_1;
                            break;
                          case -1:
switchD_00481107_caseD_ffffffff:
                            dVar198 = 0.0;
                            dVar209 = 0.0;
                          }
                        }
                        else if (iVar161 == iVar82) {
                          switch(iVar101) {
                          case 1:
                          case 2:
                          case 4:
                            goto switchD_00481176_caseD_1;
                          case 3:
                            dVar198 = pdVar22[lVar118 + lVar158 + lVar94];
                            if (is_velocity) goto switchD_00481107_caseD_1;
                            break;
                          case -1:
                            goto switchD_00481107_caseD_ffffffff;
                          }
                        }
                        dVar171 = dVar209;
                        if ((iVar161 == iVar82) &&
                           ((((iVar101 == 4 || (iVar101 == 2)) &&
                             (dVar198 = dVar209,
                             (local_7f0 == 0 && is_velocity) &&
                             pdVar15[lVar90 + lVar163 + (iVar161 - iVar156)] <= 0.0)) &&
                            (dVar198 = 0.0, dVar171 = 0.0, 0.0 <= dVar209)))) {
                          dVar198 = dVar209;
                          dVar171 = dVar209;
                        }
                        dVar173 = dVar171;
                        if ((pdVar15[lVar90 + lVar163 + (iVar82 - iVar156)] <= 1e-08) &&
                           (dVar173 = dVar198,
                           -1e-08 <= pdVar15[lVar90 + lVar163 + (iVar82 - iVar156)])) {
                          dVar173 = (dVar198 + dVar171) * 0.5;
                        }
                      }
                      pdVar18[lVar21 * local_7f0 +
                              (lVar135 - iVar75) * lVar20 +
                              (lVar140 - iVar162) * lVar19 + ((long)iVar82 - (long)iVar147)] =
                           dVar173;
                      iVar76 = iVar76 + 1;
                      iVar81 = iVar81 + 1;
                      iVar152 = iVar152 + 1;
                      iVar98 = iVar98 + 1;
                      bVar168 = iVar82 != iVar123;
                      iVar82 = iVar82 + 1;
                    } while (bVar168);
                  }
                  bVar168 = iVar97 != iVar10;
                  iVar97 = iVar97 + 1;
                } while (bVar168);
              }
              bVar168 = iVar80 != iVar128;
              iVar80 = iVar80 + 1;
            } while (bVar168);
          }
          local_7f0 = local_7f0 + 1;
        } while (local_7f0 != uVar132);
        local_8a8 = ccc->jstride;
        lVar104 = ccc->kstride;
        lVar126 = ccc->nstride;
        local_954 = (ccc->begin).x;
        local_974 = (ccc->begin).y;
        local_940 = (ccc->begin).z;
        local_578 = fcx->p;
        local_640 = fcx->jstride;
        local_688 = fcx->kstride;
        local_918 = fcx->nstride;
        local_990 = (fcx->begin).x;
        local_87c = (fcx->begin).y;
        local_8dc = (fcx->begin).z;
        local_580 = fcy->p;
        local_700 = fcy->jstride;
        local_690 = fcy->kstride;
        local_900 = fcy->nstride;
        local_988 = (fcy->begin).x;
        local_8d4 = (fcy->begin).y;
        local_888 = (fcy->begin).z;
        local_4c0 = fcz->p;
        local_4a8 = fcz->jstride;
        local_718 = fcz->kstride;
        local_950 = fcz->nstride;
        local_98c = (fcz->begin).x;
        local_880 = (fcz->begin).y;
        local_8e0 = (fcz->begin).z;
        local_4c8 = flag->p;
        local_648 = flag->jstride;
        local_698 = flag->kstride;
        local_8cc = (flag->begin).x;
        local_8d8 = (flag->begin).y;
        local_8e4 = (flag->begin).z;
        local_808 = vfrac->p;
        local_4b0 = vfrac->jstride;
        local_588 = vfrac->kstride;
        local_984 = (vfrac->begin).x;
        uVar143 = (vfrac->begin).y;
        local_944 = (vfrac->begin).z;
      }
      local_790 = q->p;
      local_9e8 = q->jstride;
      local_9b8 = q->kstride;
      local_3d8 = q->nstride;
      iVar127 = (q->begin).x;
      uVar12 = (q->begin).y;
      local_8e8 = (q->begin).z;
      local_8f8 = ccc->p;
      if (0 < ncomp) {
        pdVar14 = vmac->p;
        lVar16 = vmac->jstride;
        lVar17 = vmac->kstride;
        iVar156 = (vmac->begin).x;
        iVar161 = (vmac->begin).y;
        iVar165 = (vmac->begin).z;
        pdVar15 = yedge->p;
        lVar19 = yedge->jstride;
        lVar85 = (long)local_954;
        lVar20 = yedge->kstride;
        lVar21 = yedge->nstride;
        iVar123 = (yedge->begin).x;
        iVar11 = (yedge->begin).y;
        iVar147 = (yedge->begin).z;
        iVar75 = (domain->bigend).vect[1] + 1;
        iVar162 = (domain->smallend).vect[1];
        lVar4 = lVar104 * 8;
        lVar5 = local_8a8 * 8;
        local_7f8 = 0;
        do {
          if (iVar8 <= iVar128) {
            lVar103 = local_3d8 * local_7f8;
            iVar78 = iVar8;
            do {
              if (iVar7 <= iVar141) {
                lVar88 = (iVar78 - local_8e4) * local_698;
                lVar84 = (iVar78 - local_888) * local_690;
                lVar102 = (iVar78 - local_940) * lVar104;
                iVar80 = iVar78 - local_8e8;
                lVar92 = iVar80 * local_9b8;
                lVar91 = local_588 * (int)(iVar78 - local_944);
                lVar136 = (int)((iVar78 + -1) - local_944) * local_588;
                lVar137 = (int)((iVar78 + 1) - local_944) * local_588;
                lVar107 = (int)((iVar78 + -1) - local_8e8) * local_9b8;
                lVar108 = (int)((iVar78 + 1) - local_8e8) * local_9b8;
                lVar116 = (iVar78 - local_8dc) * local_688;
                lVar89 = ((iVar78 - local_8e0) + 1) * local_718;
                lVar133 = (iVar78 - local_8e0) * local_718;
                lVar134 = (int)(~local_944 + iVar78) * local_588;
                lVar105 = (int)((iVar78 - local_944) + 1) * local_588;
                lVar106 = (long)iVar78;
                lVar135 = (lVar106 - iVar165) * lVar17;
                lVar90 = (~(long)local_940 + lVar106) * lVar4;
                iVar79 = iVar7;
                do {
                  if (iVar6 <= iVar9) {
                    iVar76 = iVar79 - uVar12;
                    lVar93 = iVar76 * local_9e8;
                    iVar82 = iVar79 + -1;
                    iVar81 = iVar82 - uVar12;
                    lVar94 = iVar81 * local_9e8;
                    iVar98 = iVar79 - uVar143;
                    lVar117 = local_4b0 * iVar98;
                    lVar118 = (int)(iVar82 - uVar143) * local_4b0;
                    lVar138 = (iVar79 - local_87c) * local_640;
                    lVar140 = (iVar79 - local_880) * local_4a8;
                    lVar144 = (iVar82 - local_974) * local_8a8;
                    lVar109 = (iVar82 - local_87c) * local_640;
                    lVar110 = (iVar82 - local_880) * local_4a8;
                    lVar111 = ((long)iVar79 - (long)iVar161) * lVar16;
                    lVar150 = ((long)iVar82 + ~(long)local_974) * lVar5;
                    iVar97 = iVar74 - local_954;
                    iVar131 = iVar74 - iVar127;
                    iVar152 = iVar6;
                    do {
                      lVar153 = (long)iVar152;
                      uVar13 = local_4c8[lVar88 + (iVar79 - local_8d8) * local_648 +
                                                  (long)(iVar152 - local_8cc)].flag;
                      dVar173 = 0.0;
                      if ((short)uVar13 < 0) {
                        lVar154 = (long)local_8f8 +
                                  lVar153 * 8 + lVar150 + lVar90 + lVar85 * -8 + -8;
                        lVar95 = (long)local_8f8 +
                                 lVar153 * 8 + lVar150 + lVar90 + lVar126 * 8 + lVar85 * -8 + -8;
                        lVar151 = (long)local_8f8 +
                                  lVar153 * 8 + lVar150 + lVar90 + lVar126 * 0x10 + lVar85 * -8 + -8
                        ;
                        lVar163 = (long)(iVar152 - local_988);
                        dVar173 = local_580[lVar84 + local_700 * (iVar79 - local_8d4) + lVar163];
                        dVar171 = (local_580 + lVar84 + local_700 * (iVar79 - local_8d4) + lVar163)
                                  [local_900];
                        lVar146 = (long)(iVar152 - local_954);
                        pdVar18 = local_8f8 + lVar102 + (iVar79 - local_974) * local_8a8 + lVar146;
                        dVar202 = *pdVar18;
                        dVar186 = pdVar18[lVar126];
                        dVar182 = pdVar18[lVar126 * 2];
                        iVar77 = iVar152 - iVar127;
                        lVar167 = (long)iVar77;
                        dVar196 = local_790[lVar93 + lVar167 + lVar92 + lVar103];
                        dVar216 = local_790[lVar94 + lVar167 + lVar92 + lVar103];
                        lVar113 = -1;
                        cVar139 = '\x05';
                        lVar112 = 0;
                        do {
                          iVar101 = (int)lVar113;
                          lVar119 = -1;
                          cVar122 = cVar139;
                          do {
                            iVar83 = (int)lVar119;
                            iVar99 = (int)lVar112;
                            ppBVar86 = &local_398.d_bcrec_ptr + (long)iVar99 * 3;
                            lVar112 = 0;
                            do {
                              iVar124 = (int)lVar112 + -1;
                              if (((iVar83 == 0 && iVar101 == 0) && iVar124 == 0) ||
                                 ((1 << (cVar122 + (char)lVar112 & 0x1fU) & uVar13) == 0)) {
                                *ppBVar86 = (BCRec *)0x0;
                                ((Array4<const_double> *)(ppBVar86 + 1))->p = (double *)0x0;
                                ppBVar86[2] = (BCRec *)0x0;
                              }
                              else {
                                pdVar18 = local_8f8 +
                                          ((iVar78 - local_940) + iVar101) * lVar104 +
                                          ((iVar79 - local_974) + iVar83) * local_8a8 +
                                          (long)(iVar97 + (int)lVar112);
                                dVar172 = pdVar18[lVar126];
                                *ppBVar86 = (BCRec *)((*pdVar18 + (double)iVar124) - dVar202);
                                ((Array4<const_double> *)(ppBVar86 + 1))->p =
                                     (double *)((dVar172 + (double)iVar83) - dVar186);
                                ppBVar86[2] = (BCRec *)((pdVar18[lVar126 * 2] + (double)iVar101) -
                                                       dVar182);
                              }
                              lVar112 = lVar112 + 1;
                              ppBVar86 = ppBVar86 + 3;
                            } while (lVar112 != 3);
                            lVar119 = lVar119 + 1;
                            cVar122 = cVar122 + '\x03';
                            lVar112 = (long)iVar99 + 3;
                          } while (lVar119 != 2);
                          lVar113 = lVar113 + 1;
                          cVar139 = cVar139 + '\t';
                          lVar112 = (long)iVar99 + 3;
                        } while (lVar113 != 2);
                        dVar172 = dVar173 - dVar202;
                        lVar113 = -1;
                        cVar139 = '\x05';
                        lVar112 = 0;
                        do {
                          lVar119 = -1;
                          cVar122 = cVar139;
                          do {
                            iVar101 = (int)lVar112;
                            lVar112 = 0;
                            do {
                              dVar183 = 0.0;
                              if (((int)lVar112 != 1 || ((int)lVar119 != 0 || (int)lVar113 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar112 & 0x1fU) & uVar13) != 0)) {
                                dVar183 = local_790[lVar103 + (iVar80 + (int)lVar113) * local_9b8 +
                                                              (iVar76 + (int)lVar119) * local_9e8 +
                                                              (long)(iVar131 + (int)lVar112)] -
                                          dVar196;
                              }
                              adStack_108[iVar101 + lVar112] = dVar183;
                              lVar112 = lVar112 + 1;
                            } while (lVar112 != 3);
                            lVar119 = lVar119 + 1;
                            cVar122 = cVar122 + '\x03';
                            lVar112 = (long)iVar101 + 3;
                          } while (lVar119 != 2);
                          lVar113 = lVar113 + 1;
                          cVar139 = cVar139 + '\t';
                          lVar112 = (long)iVar101 + 3;
                        } while (lVar113 != 2);
                        dVar183 = dVar216;
                        if (dVar216 <= dVar196) {
                          dVar183 = dVar196;
                        }
                        dVar198 = 0.0;
                        dVar206 = 0.0;
                        dVar195 = 0.0;
                        pDVar87 = (Dim3 *)&local_398.q.jstride;
                        lVar112 = 0;
                        dVar211 = 0.0;
                        dVar214 = 0.0;
                        dVar223 = 0.0;
                        dVar180 = 0.0;
                        dVar209 = 0.0;
                        dVar210 = 0.0;
                        do {
                          dVar212 = *(double *)((long)(pDVar87 + -2) + 8);
                          dVar194 = *(double *)((long)(pDVar87 + -1) + 4);
                          dVar184 = *(double *)pDVar87;
                          dVar199 = adStack_108[lVar112];
                          dVar209 = dVar209 + dVar194 * *(double *)((long)(pDVar87 + -1) + 4);
                          dVar210 = dVar210 + dVar212 * *(double *)pDVar87;
                          dVar195 = dVar195 + dVar184 * dVar184;
                          dVar223 = dVar223 + dVar199 * dVar212;
                          dVar180 = dVar180 + dVar212 * dVar212;
                          dVar198 = dVar198 + dVar199 * dVar194;
                          dVar206 = dVar206 + dVar194 * dVar212;
                          dVar211 = dVar211 + dVar184 * *(double *)((long)(pDVar87 + -1) + 4);
                          dVar214 = dVar214 + dVar199 * *(double *)pDVar87;
                          lVar112 = lVar112 + 1;
                          pDVar87 = pDVar87 + 2;
                        } while (lVar112 != 0x1b);
                        dVar199 = dVar206 * dVar195 - dVar210 * dVar211;
                        dVar194 = dVar206 * dVar214 - dVar210 * dVar198;
                        dVar212 = dVar206 * dVar211 + dVar210 * -dVar209;
                        dVar184 = dVar195 * dVar209 - dVar211 * dVar211;
                        dVar195 = dVar195 * dVar198 - dVar211 * dVar214;
                        auVar197._0_8_ =
                             dVar210 * (dVar198 * dVar211 - dVar214 * dVar209) +
                             (dVar223 * dVar184 - dVar195 * dVar206);
                        auVar197._8_8_ = dVar210 * dVar194 + (dVar180 * dVar195 - dVar199 * dVar223)
                        ;
                        dVar210 = dVar212 * dVar210 + (dVar184 * dVar180 - dVar199 * dVar206);
                        auVar175._8_8_ = dVar210;
                        auVar175._0_8_ = dVar210;
                        auVar178 = divpd(auVar197,auVar175);
                        dVar210 = (dVar212 * dVar223 +
                                  ((dVar214 * dVar209 + -dVar198 * dVar211) * dVar180 -
                                  dVar194 * dVar206)) / dVar210;
                        iVar101 = iVar152 - local_984;
                        lVar112 = (long)iVar101;
                        dVar195 = local_808[lVar117 + lVar91 + lVar112];
                        dVar198 = auVar178._0_8_;
                        dVar206 = auVar178._8_8_;
                        if ((dVar195 == 1.0) && (!NAN(dVar195))) {
                          if (local_808[lVar117 + lVar91 + (int)((iVar152 + -1) - local_984)] == 1.0
                             ) {
                            if ((local_808[lVar117 + lVar91 + (int)((iVar152 + 1) - local_984)] ==
                                 1.0) && (!NAN(local_808[lVar117 + lVar91 + (int)((iVar152 + 1) -
                                                                                 local_984)]))) {
                              dVar214 = dVar196 - local_790[lVar93 + lVar92 + lVar103 + ((iVar152 +
                                                                                         -1) - 
                                                  iVar127)];
                              dVar223 = local_790[lVar93 + lVar92 + lVar103 + ((iVar152 + 1) -
                                                                              iVar127)] - dVar196;
                              dVar214 = dVar214 + dVar214;
                              dVar223 = dVar223 + dVar223;
                              dVar209 = (local_790[lVar93 + lVar92 + lVar103 + ((iVar152 + 1) -
                                                                               iVar127)] -
                                        local_790[lVar93 + lVar92 + lVar103 + ((iVar152 + -1) -
                                                                              iVar127)]) * 0.5;
                              dVar211 = ABS(dVar214);
                              uVar169 = -(ulong)(0.0 < dVar209);
                              dVar209 = ABS(dVar209);
                              dVar198 = ABS(dVar223);
                              if (dVar211 <= dVar209) {
                                dVar209 = dVar211;
                              }
                              if (dVar209 <= dVar198) {
                                dVar198 = dVar209;
                              }
                              uVar185 = -(ulong)(0.0 < dVar214 * dVar223) & (ulong)dVar198;
                              dVar198 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                                uVar169 & uVar185);
                            }
                          }
                          if (((local_808[lVar91 + lVar118 + lVar112] == 1.0) &&
                              (local_808[lVar91 + (int)((iVar79 + 1) - uVar143) * local_4b0 +
                                                  lVar112] == 1.0)) &&
                             (!NAN(local_808[lVar91 + (int)((iVar79 + 1) - uVar143) * local_4b0 +
                                                      lVar112]))) {
                            dVar214 = local_790[lVar103 + lVar92 + (int)((iVar79 + 1) - uVar12) *
                                                                   local_9e8 + lVar167] - dVar196;
                            dVar211 = (dVar196 - dVar216) + (dVar196 - dVar216);
                            dVar214 = dVar214 + dVar214;
                            dVar209 = (local_790[lVar103 + lVar92 + (int)((iVar79 + 1) - uVar12) *
                                                                    local_9e8 + lVar167] - dVar216)
                                      * 0.5;
                            dVar223 = ABS(dVar211);
                            uVar169 = -(ulong)(0.0 < dVar209);
                            dVar209 = ABS(dVar209);
                            dVar206 = ABS(dVar214);
                            if (dVar223 <= dVar209) {
                              dVar209 = dVar223;
                            }
                            if (dVar209 <= dVar206) {
                              dVar206 = dVar209;
                            }
                            uVar185 = -(ulong)(0.0 < dVar211 * dVar214) & (ulong)dVar206;
                            dVar206 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                          if (((local_808[lVar117 + lVar112 + lVar136] == 1.0) &&
                              (local_808[lVar117 + lVar112 + lVar137] == 1.0)) &&
                             (!NAN(local_808[lVar117 + lVar112 + lVar137]))) {
                            dVar214 = dVar196 - local_790[lVar93 + lVar167 + lVar107 + lVar103];
                            dVar223 = local_790[lVar93 + lVar167 + lVar108 + lVar103] - dVar196;
                            dVar214 = dVar214 + dVar214;
                            dVar223 = dVar223 + dVar223;
                            dVar209 = (local_790[lVar93 + lVar167 + lVar108 + lVar103] -
                                      local_790[lVar93 + lVar167 + lVar107 + lVar103]) * 0.5;
                            dVar211 = ABS(dVar214);
                            uVar169 = -(ulong)(0.0 < dVar209);
                            dVar209 = ABS(dVar209);
                            dVar210 = ABS(dVar223);
                            if (dVar211 <= dVar209) {
                              dVar209 = dVar211;
                            }
                            if (dVar209 <= dVar210) {
                              dVar210 = dVar209;
                            }
                            uVar185 = -(ulong)(0.0 < dVar214 * dVar223) & (ulong)dVar210;
                            dVar210 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                        }
                        dVar211 = dVar171 - dVar182;
                        dVar209 = dVar216;
                        if (dVar196 <= dVar216) {
                          dVar209 = dVar196;
                        }
                        iVar83 = 0;
                        iVar99 = 0;
                        iVar124 = 0;
                        iVar130 = 0;
                        uVar142 = 0xffffffff;
                        do {
                          uVar100 = uVar142 + 1;
                          uVar115 = 0xffffffff;
                          iVar159 = iVar83;
                          do {
                            uVar1 = uVar115 + 1;
                            iVar129 = 5;
                            do {
                              if (((uVar13 >> (iVar159 + iVar129 & 0x1fU) & 1) != 0) &&
                                 ((iVar129 != 6 || uVar115 != 0) || uVar142 != 0)) {
                                iVar99 = iVar99 + (uint)((iVar129 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar115 == 0 && uVar142 == 0));
                                iVar124 = iVar124 + (uint)((iVar129 == 6 && uVar142 == 0) &&
                                                          (uVar1 & 0xfffffffd) == 0);
                                iVar130 = iVar130 + (uint)((iVar129 == 6 && uVar115 == 0) &&
                                                          (uVar100 & 0xfffffffd) == 0);
                              }
                              iVar129 = iVar129 + 1;
                            } while (iVar129 != 8);
                            iVar159 = iVar159 + 3;
                            uVar115 = uVar1;
                          } while (uVar1 != 2);
                          iVar83 = iVar83 + 9;
                          uVar142 = uVar100;
                        } while (uVar100 != 2);
                        dVar214 = 2.0;
                        if ((uVar13 >> 0x15 & 1) != 0) {
                          lVar113 = -1;
                          cVar139 = '\b';
                          dVar214 = dVar196;
                          dVar223 = dVar196;
                          do {
                            iVar83 = 0;
                            bVar168 = true;
                            do {
                              bVar114 = bVar168;
                              lVar119 = 0;
                              do {
                                if (((int)lVar119 != 1 || (iVar83 != 0 || (int)lVar113 != 0)) &&
                                   ((1 << ((char)lVar119 + (char)iVar83 * '\x03' + cVar139 & 0x1fU)
                                    & uVar13) != 0)) {
                                  dVar180 = local_790[lVar103 + (iVar80 + (int)lVar113) * local_9b8
                                                                + (iVar76 + iVar83) * local_9e8 +
                                                                  (long)(iVar131 + (int)lVar119)];
                                  uVar200 = SUB84(dVar180,0);
                                  uVar201 = (undefined4)((ulong)dVar180 >> 0x20);
                                  if (dVar180 <= dVar214) {
                                    uVar200 = SUB84(dVar214,0);
                                    uVar201 = (undefined4)((ulong)dVar214 >> 0x20);
                                  }
                                  dVar214 = (double)CONCAT44(uVar201,uVar200);
                                  if (dVar180 < dVar223) {
                                    dVar223 = dVar180;
                                  }
                                }
                                lVar119 = lVar119 + 1;
                              } while (lVar119 != 3);
                              iVar83 = 1;
                              bVar168 = false;
                            } while (bVar114);
                            lVar113 = lVar113 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar113 != 2);
                          dVar180 = (((local_580 +
                                      lVar84 + ((iVar79 - local_8d4) + 1) * local_700 + lVar163)
                                      [local_900] - dVar182) * dVar210 +
                                    (0.5 - dVar186) * dVar206 +
                                    (local_580[lVar84 + ((iVar79 - local_8d4) + 1) * local_700 +
                                                        lVar163] - dVar202) * dVar198 + dVar196) -
                                    dVar196;
                          if (dVar180 <= 1e-13) {
                            dVar214 = 1.0;
                            if ((dVar180 < -1e-13) &&
                               (dVar214 = (dVar223 - dVar196) / dVar180, 1.0 <= dVar214)) {
                              dVar214 = 1.0;
                            }
                          }
                          else {
                            dVar214 = (dVar214 - dVar196) / dVar180;
                            if (1.0 <= dVar214) {
                              dVar214 = 1.0;
                            }
                          }
                          if (2.0 <= dVar214) {
                            dVar214 = 2.0;
                          }
                        }
                        lVar113 = -1;
                        cVar139 = '\x05';
                        auVar204._8_8_ = 0;
                        auVar204._0_8_ = (ulong)dVar196;
                        dVar223 = dVar196;
                        do {
                          lVar119 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar120 = 0;
                            do {
                              if (((int)lVar120 != 1 || ((int)lVar119 != 0 || (int)lVar113 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar120 & 0x1fU) & uVar13) != 0)) {
                                dVar180 = local_790[lVar103 + (iVar80 + (int)lVar113) * local_9b8 +
                                                              (iVar76 + (int)lVar119) * local_9e8 +
                                                              (long)(iVar131 + (int)lVar120)];
                                uVar200 = SUB84(dVar180,0);
                                uVar201 = (undefined4)((ulong)dVar180 >> 0x20);
                                if (dVar180 <= auVar204._0_8_) {
                                  uVar200 = auVar204._0_4_;
                                  uVar201 = auVar204._4_4_;
                                }
                                auVar204._4_4_ = uVar201;
                                auVar204._0_4_ = uVar200;
                                auVar204._8_8_ = 0;
                                if (dVar180 < dVar223) {
                                  dVar223 = dVar180;
                                }
                              }
                              lVar120 = lVar120 + 1;
                            } while (lVar120 != 3);
                            cVar122 = cVar122 + '\x03';
                            bVar168 = lVar119 != 0;
                            lVar119 = lVar119 + 1;
                          } while (bVar168);
                          lVar113 = lVar113 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar113 != 2);
                        dVar180 = (dVar211 * dVar210 +
                                  -(dVar186 + 0.5) * dVar206 + dVar172 * dVar198 + dVar196) -
                                  dVar196;
                        if (dVar180 <= 1e-13) {
                          dVar184 = 1.0;
                          if ((dVar180 < -1e-13) &&
                             (dVar184 = (dVar223 - dVar196) / dVar180, 1.0 <= dVar184)) {
                            dVar184 = 1.0;
                          }
                        }
                        else {
                          dVar184 = (auVar204._0_8_ - dVar196) / dVar180;
                          if (1.0 <= dVar184) {
                            dVar184 = 1.0;
                          }
                        }
                        if (dVar214 <= dVar184) {
                          dVar184 = dVar214;
                        }
                        dVar214 = dVar184;
                        if ((uVar13 >> 0x13 & 1) != 0) {
                          lVar113 = -1;
                          dVar223 = dVar196;
                          dVar214 = dVar196;
                          do {
                            lVar119 = -1;
                            do {
                              iVar83 = 0;
                              bVar168 = true;
                              do {
                                bVar114 = bVar168;
                                if ((((int)lVar119 != 0 || (int)lVar113 != 0) || iVar83 != 0) &&
                                   ((1 << ((char)lVar119 * '\x03' + (char)lVar113 * '\t' + '\x12' +
                                           (char)iVar83 & 0x1fU) & uVar13) != 0)) {
                                  dVar180 = local_790[lVar103 + (iVar80 + (int)lVar113) * local_9b8
                                                                + (iVar76 + (int)lVar119) *
                                                                  local_9e8 +
                                                                  (long)(iVar83 + iVar77)];
                                  dVar199 = dVar180;
                                  if (dVar180 <= dVar214) {
                                    dVar199 = dVar214;
                                  }
                                  dVar214 = dVar199;
                                  if (dVar180 < dVar223) {
                                    dVar223 = dVar180;
                                  }
                                }
                                iVar83 = 1;
                                bVar168 = false;
                              } while (bVar114);
                              lVar119 = lVar119 + 1;
                            } while (lVar119 != 2);
                            lVar113 = lVar113 + 1;
                          } while (lVar113 != 2);
                          dVar180 = (((local_578 + lVar116 + lVar138 + ((iVar152 - local_990) + 1))
                                      [local_918] - dVar182) * dVar210 +
                                    (local_578[lVar116 + lVar138 + ((iVar152 - local_990) + 1)] -
                                    dVar186) * dVar206 + (0.5 - dVar202) * dVar198 + dVar196) -
                                    dVar196;
                          if (dVar180 <= 1e-13) {
                            dVar214 = 1.0;
                            if ((dVar180 < -1e-13) &&
                               (dVar214 = (dVar223 - dVar196) / dVar180, 1.0 <= dVar214)) {
                              dVar214 = 1.0;
                            }
                          }
                          else {
                            dVar214 = (dVar214 - dVar196) / dVar180;
                            if (1.0 <= dVar214) {
                              dVar214 = 1.0;
                            }
                          }
                          if (dVar184 <= dVar214) {
                            dVar214 = dVar184;
                          }
                        }
                        dVar223 = dVar214;
                        if ((uVar13 >> 0x11 & 1) != 0) {
                          lVar113 = -1;
                          cVar139 = '\x05';
                          auVar188._8_8_ = 0;
                          auVar188._0_8_ = (ulong)dVar196;
                          dVar180 = dVar196;
                          do {
                            lVar119 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || ((int)lVar119 != 0 || (int)lVar113 != 0))
                                   && ((1 << (cVar122 + (char)lVar120 & 0x1fU) & uVar13) != 0)) {
                                  dVar223 = local_790[lVar103 + (iVar80 + (int)lVar113) * local_9b8
                                                                + (iVar76 + (int)lVar119) *
                                                                  local_9e8 +
                                                                  (long)(iVar131 + (int)lVar120)];
                                  uVar200 = SUB84(dVar223,0);
                                  uVar201 = (undefined4)((ulong)dVar223 >> 0x20);
                                  if (dVar223 <= auVar188._0_8_) {
                                    uVar200 = auVar188._0_4_;
                                    uVar201 = auVar188._4_4_;
                                  }
                                  if (dVar223 < dVar180) {
                                    dVar180 = dVar223;
                                  }
                                  auVar188._4_4_ = uVar201;
                                  auVar188._0_4_ = uVar200;
                                  auVar188._8_8_ = 0;
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 2);
                              lVar119 = lVar119 + 1;
                              cVar122 = cVar122 + '\x03';
                            } while (lVar119 != 2);
                            lVar113 = lVar113 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar113 != 2);
                          dVar184 = (((local_578 + lVar116 + lVar138 + (iVar152 - local_990))
                                      [local_918] - dVar182) * dVar210 +
                                    (local_578[lVar116 + lVar138 + (iVar152 - local_990)] - dVar186)
                                    * dVar206 + (dVar196 - (dVar202 + 0.5) * dVar198)) - dVar196;
                          if (dVar184 <= 1e-13) {
                            dVar223 = 1.0;
                            if ((dVar184 < -1e-13) &&
                               (dVar223 = (dVar180 - dVar196) / dVar184, 1.0 <= dVar223)) {
                              dVar223 = 1.0;
                            }
                          }
                          else {
                            dVar223 = (auVar188._0_8_ - dVar196) / dVar184;
                            if (1.0 <= dVar223) {
                              dVar223 = 1.0;
                            }
                          }
                          if (dVar214 <= dVar223) {
                            dVar223 = dVar214;
                          }
                        }
                        dVar214 = dVar223;
                        if ((uVar13 >> 0x1b & 1) != 0) {
                          iVar83 = 0;
                          dVar180 = dVar196;
                          dVar214 = dVar196;
                          bVar168 = true;
                          do {
                            bVar114 = bVar168;
                            iVar159 = iVar83 * 9 + 0xe;
                            lVar113 = -1;
                            do {
                              lVar119 = 0;
                              do {
                                if (((int)lVar119 != 1 || ((int)lVar113 != 0 || iVar83 != 0)) &&
                                   ((1 << ((char)iVar159 + (char)lVar119 & 0x1fU) & uVar13) != 0)) {
                                  dVar184 = local_790[lVar103 + (iVar80 + iVar83) * local_9b8 +
                                                                (iVar76 + (int)lVar113) * local_9e8
                                                                + (long)(iVar131 + (int)lVar119)];
                                  dVar199 = dVar184;
                                  if (dVar184 <= dVar214) {
                                    dVar199 = dVar214;
                                  }
                                  dVar214 = dVar199;
                                  if (dVar184 < dVar180) {
                                    dVar180 = dVar184;
                                  }
                                }
                                lVar119 = lVar119 + 1;
                              } while (lVar119 != 3);
                              lVar113 = lVar113 + 1;
                              iVar159 = iVar159 + 3;
                            } while (lVar113 != 2);
                            iVar83 = 1;
                            bVar168 = false;
                          } while (bVar114);
                          dVar184 = ((0.5 - dVar182) * dVar210 +
                                    ((local_4c0 + lVar89 + lVar140 + (iVar152 - local_98c))
                                     [local_950] - dVar186) * dVar206 +
                                    (local_4c0[lVar89 + lVar140 + (iVar152 - local_98c)] - dVar202)
                                    * dVar198 + dVar196) - dVar196;
                          if (dVar184 <= 1e-13) {
                            dVar214 = 1.0;
                            if ((dVar184 < -1e-13) &&
                               (dVar214 = (dVar180 - dVar196) / dVar184, 1.0 <= dVar214)) {
                              dVar214 = 1.0;
                            }
                          }
                          else {
                            dVar214 = (dVar214 - dVar196) / dVar184;
                            if (1.0 <= dVar214) {
                              dVar214 = 1.0;
                            }
                          }
                          if (dVar223 <= dVar214) {
                            dVar214 = dVar223;
                          }
                        }
                        dVar223 = dVar214;
                        if ((uVar13 >> 9 & 1) != 0) {
                          cVar139 = '\x05';
                          lVar113 = -1;
                          dVar223 = dVar196;
                          dVar180 = dVar196;
                          do {
                            lVar119 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar120 = 0;
                              do {
                                if (((int)lVar120 != 1 || ((int)lVar119 != 0 || (int)lVar113 != 0))
                                   && ((1 << (cVar122 + (char)lVar120 & 0x1fU) & uVar13) != 0)) {
                                  dVar184 = local_790[lVar103 + (iVar80 + (int)lVar113) * local_9b8
                                                                + (iVar76 + (int)lVar119) *
                                                                  local_9e8 +
                                                                  (long)(iVar131 + (int)lVar120)];
                                  dVar199 = dVar184;
                                  if (dVar184 <= dVar223) {
                                    dVar199 = dVar223;
                                  }
                                  dVar223 = dVar199;
                                  if (dVar184 < dVar180) {
                                    dVar180 = dVar184;
                                  }
                                }
                                lVar120 = lVar120 + 1;
                              } while (lVar120 != 3);
                              lVar119 = lVar119 + 1;
                              cVar122 = cVar122 + '\x03';
                            } while (lVar119 != 2);
                            cVar139 = cVar139 + '\t';
                            bVar168 = lVar113 != 0;
                            lVar113 = lVar113 + 1;
                          } while (bVar168);
                          dVar202 = ((((local_4c0 + lVar133 + lVar140 + (iVar152 - local_98c))
                                       [local_950] - dVar186) * dVar206 +
                                     (local_4c0[lVar133 + lVar140 + (iVar152 - local_98c)] - dVar202
                                     ) * dVar198 + dVar196) - (dVar182 + 0.5) * dVar210) - dVar196;
                          if (dVar202 <= 1e-13) {
                            dVar223 = 1.0;
                            if ((dVar202 < -1e-13) &&
                               (dVar223 = (dVar180 - dVar196) / dVar202, 1.0 <= dVar223)) {
                              dVar223 = 1.0;
                            }
                          }
                          else {
                            dVar223 = (dVar223 - dVar196) / dVar202;
                            if (1.0 <= dVar223) {
                              dVar223 = 1.0;
                            }
                          }
                          if (dVar214 <= dVar223) {
                            dVar223 = dVar214;
                          }
                        }
                        uVar200 = 0;
                        uVar201 = 0;
                        if (1 < iVar99) {
                          uVar200 = SUB84(dVar223,0);
                          uVar201 = (undefined4)((ulong)dVar223 >> 0x20);
                        }
                        dVar202 = 0.0;
                        if (1 < iVar124) {
                          dVar202 = dVar223;
                        }
                        dVar182 = 0.0;
                        if (1 < iVar130) {
                          dVar182 = dVar223;
                        }
                        if ((dVar195 == 1.0) && (!NAN(dVar195))) {
                          if ((local_808[lVar117 + lVar91 + (int)(~local_984 + iVar152)] == 1.0) &&
                             ((local_808[lVar117 + lVar91 + (iVar101 + 1)] == 1.0 &&
                              (!NAN(local_808[lVar117 + lVar91 + (iVar101 + 1)]))))) {
                            uVar200 = 0;
                            uVar201 = 0x3ff00000;
                          }
                          if (((local_808[lVar91 + lVar118 + lVar112] == 1.0) &&
                              (local_808[lVar91 + (iVar98 + 1) * local_4b0 + lVar112] == 1.0)) &&
                             (!NAN(local_808[lVar91 + (iVar98 + 1) * local_4b0 + lVar112]))) {
                            dVar202 = 1.0;
                          }
                          if (((local_808[lVar117 + lVar134 + lVar112] == 1.0) &&
                              (local_808[lVar117 + lVar105 + lVar112] == 1.0)) &&
                             (!NAN(local_808[lVar117 + lVar105 + lVar112]))) {
                            dVar182 = 1.0;
                          }
                        }
                        dVar186 = dVar211 * dVar210 * dVar182 +
                                  ((dVar172 * dVar198 * (double)CONCAT44(uVar201,uVar200) + dVar196)
                                  - (dVar186 + 0.5) * dVar206 * dVar202);
                        dVar202 = dVar183;
                        if (dVar186 <= dVar183) {
                          dVar202 = dVar186;
                        }
                        dVar186 = local_8f8[lVar102 + lVar144 + lVar146];
                        dVar182 = local_8f8[lVar102 + lVar144 + lVar146 + lVar126];
                        dVar172 = local_8f8[lVar102 + lVar144 + lVar146 + lVar126 * 2];
                        uVar13 = local_4c8[lVar88 + (iVar82 - local_8d8) * local_648 +
                                                    (long)(iVar152 - local_8cc)].flag;
                        lVar146 = -1;
                        cVar139 = '\x05';
                        lVar113 = 0;
                        do {
                          lVar145 = -1;
                          lVar119 = lVar154;
                          lVar120 = lVar95;
                          lVar155 = lVar151;
                          cVar122 = cVar139;
                          do {
                            iVar99 = (int)lVar113;
                            ppBVar86 = &local_398.d_bcrec_ptr + (long)iVar99 * 3;
                            lVar113 = 0;
                            do {
                              iVar83 = (int)lVar113 + -1;
                              if ((((int)lVar145 == 0 && (int)lVar146 == 0) && iVar83 == 0) ||
                                 ((1 << (cVar122 + (char)lVar113 & 0x1fU) & uVar13) == 0)) {
                                *ppBVar86 = (BCRec *)0x0;
                                ppBVar86[1] = (BCRec *)0x0;
                                ppBVar86[2] = (BCRec *)0x0;
                              }
                              else {
                                dVar198 = (*(double *)(lVar120 + lVar113 * 8) + (double)(int)lVar145
                                          ) - dVar182;
                                auVar24._8_4_ = SUB84(dVar198,0);
                                auVar24._0_8_ =
                                     (*(double *)(lVar119 + lVar113 * 8) + (double)iVar83) - dVar186
                                ;
                                auVar24._12_4_ = (int)((ulong)dVar198 >> 0x20);
                                *(undefined1 (*) [16])ppBVar86 = auVar24;
                                ppBVar86[2] = (BCRec *)((*(double *)(lVar155 + lVar113 * 8) +
                                                        (double)(int)lVar146) - dVar172);
                              }
                              lVar113 = lVar113 + 1;
                              ppBVar86 = ppBVar86 + 3;
                            } while (lVar113 != 3);
                            lVar145 = lVar145 + 1;
                            lVar119 = lVar119 + local_8a8 * 8;
                            lVar120 = lVar120 + lVar5;
                            lVar155 = lVar155 + lVar5;
                            cVar122 = cVar122 + '\x03';
                            lVar113 = (long)iVar99 + 3;
                          } while (lVar145 != 2);
                          lVar146 = lVar146 + 1;
                          lVar154 = lVar154 + lVar104 * 8;
                          lVar95 = lVar95 + lVar4;
                          lVar151 = lVar151 + lVar4;
                          cVar139 = cVar139 + '\t';
                          lVar113 = (long)iVar99 + 3;
                        } while (lVar146 != 2);
                        lVar154 = -1;
                        cVar139 = '\x05';
                        lVar95 = 0;
                        do {
                          lVar151 = -1;
                          cVar122 = cVar139;
                          do {
                            iVar99 = (int)lVar95;
                            lVar95 = 0;
                            do {
                              dVar198 = 0.0;
                              if (((int)lVar95 != 1 || ((int)lVar151 != 0 || (int)lVar154 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar95 & 0x1fU) & uVar13) != 0)) {
                                dVar198 = local_790[lVar103 + (iVar80 + (int)lVar154) * local_9b8 +
                                                              (iVar81 + (int)lVar151) * local_9e8 +
                                                              (long)(iVar131 + (int)lVar95)] -
                                          dVar216;
                              }
                              adStack_108[iVar99 + lVar95] = dVar198;
                              lVar95 = lVar95 + 1;
                            } while (lVar95 != 3);
                            lVar151 = lVar151 + 1;
                            cVar122 = cVar122 + '\x03';
                            lVar95 = (long)iVar99 + 3;
                          } while (lVar151 != 2);
                          lVar154 = lVar154 + 1;
                          cVar139 = cVar139 + '\t';
                          lVar95 = (long)iVar99 + 3;
                        } while (lVar154 != 2);
                        dVar198 = dVar209;
                        if (dVar209 <= dVar202) {
                          dVar198 = dVar202;
                        }
                        dVar202 = 0.0;
                        dVar206 = 0.0;
                        dVar210 = 0.0;
                        pDVar87 = (Dim3 *)&local_398.q.jstride;
                        lVar154 = 0;
                        dVar211 = 0.0;
                        dVar214 = 0.0;
                        dVar184 = 0.0;
                        dVar199 = 0.0;
                        dVar223 = 0.0;
                        dVar180 = 0.0;
                        do {
                          dVar215 = *(double *)((long)(pDVar87 + -2) + 8);
                          dVar213 = *(double *)((long)(pDVar87 + -1) + 4);
                          dVar212 = *(double *)pDVar87;
                          dVar194 = adStack_108[lVar154];
                          dVar223 = dVar223 + dVar215 * dVar212;
                          dVar180 = dVar180 + dVar213 * dVar213;
                          dVar210 = dVar210 + dVar212 * dVar212;
                          dVar184 = dVar184 + dVar215 * dVar215;
                          dVar199 = dVar199 + dVar194 * dVar215;
                          dVar202 = dVar202 + dVar213 * dVar215;
                          dVar206 = dVar206 + dVar194 * dVar213;
                          dVar211 = dVar211 + dVar194 * dVar212;
                          dVar214 = dVar214 + dVar212 * dVar213;
                          lVar154 = lVar154 + 1;
                          pDVar87 = pDVar87 + 2;
                        } while (lVar154 != 0x1b);
                        dVar212 = dVar202 * dVar210 - dVar223 * dVar214;
                        dVar194 = dVar202 * dVar214 + -dVar180 * dVar223;
                        dVar215 = dVar210 * dVar206 - dVar211 * dVar214;
                        dVar213 = dVar210 * dVar180 - dVar214 * dVar214;
                        dVar210 = dVar202 * dVar211 - dVar223 * dVar206;
                        auVar192._0_8_ = dVar223 * dVar210 + (dVar184 * dVar215 - dVar212 * dVar199)
                        ;
                        auVar192._8_8_ =
                             dVar223 * (dVar206 * dVar214 - dVar211 * dVar180) +
                             (dVar199 * dVar213 - dVar215 * dVar202);
                        dVar223 = dVar194 * dVar223 + (dVar213 * dVar184 - dVar202 * dVar212);
                        auVar176._8_8_ = dVar223;
                        auVar176._0_8_ = dVar223;
                        auVar193 = divpd(auVar192,auVar176);
                        uVar169 = auVar193._0_8_;
                        dVar223 = (dVar194 * dVar199 +
                                  ((dVar180 * dVar211 + -dVar206 * dVar214) * dVar184 -
                                  dVar202 * dVar210)) / dVar223;
                        dVar202 = local_808[lVar118 + lVar91 + lVar112];
                        if ((dVar202 == 1.0) && (!NAN(dVar202))) {
                          uVar185 = auVar193._8_8_;
                          if (local_808[lVar118 + lVar91 + (int)((iVar152 + -1) - local_984)] == 1.0
                             ) {
                            if ((local_808[lVar118 + lVar91 + (int)((iVar152 + 1) - local_984)] ==
                                 1.0) && (!NAN(local_808[lVar118 + lVar91 + (int)((iVar152 + 1) -
                                                                                 local_984)]))) {
                              dVar206 = dVar216 - local_790[lVar94 + lVar92 + lVar103 + ((iVar152 +
                                                                                         -1) - 
                                                  iVar127)];
                              dVar210 = local_790[lVar94 + lVar92 + lVar103 + ((iVar152 + 1) -
                                                                              iVar127)] - dVar216;
                              dVar206 = dVar206 + dVar206;
                              dVar210 = dVar210 + dVar210;
                              dVar211 = (local_790[lVar94 + lVar92 + lVar103 + ((iVar152 + 1) -
                                                                               iVar127)] -
                                        local_790[lVar94 + lVar92 + lVar103 + ((iVar152 + -1) -
                                                                              iVar127)]) * 0.5;
                              dVar180 = ABS(dVar206);
                              uVar185 = -(ulong)(0.0 < dVar211);
                              dVar211 = ABS(dVar211);
                              dVar214 = ABS(dVar210);
                              if (dVar180 <= dVar211) {
                                dVar211 = dVar180;
                              }
                              if (dVar211 <= dVar214) {
                                dVar214 = dVar211;
                              }
                              uVar170 = -(ulong)(0.0 < dVar206 * dVar210) & (ulong)dVar214;
                              uVar185 = ~uVar185 & (uVar170 ^ 0x8000000000000000) |
                                        uVar185 & uVar170;
                            }
                          }
                          if (((local_808[lVar91 + (int)((iVar79 + -2) - uVar143) * local_4b0 +
                                                   lVar112] == 1.0) && (dVar195 == 1.0)) &&
                             (!NAN(dVar195))) {
                            dVar210 = dVar216 - local_790[lVar103 + lVar92 + (int)((iVar79 + -2) -
                                                                                  uVar12) *
                                                                             local_9e8 + lVar167];
                            dVar210 = dVar210 + dVar210;
                            dVar211 = (dVar196 - dVar216) + (dVar196 - dVar216);
                            dVar195 = (dVar196 -
                                      local_790[lVar103 + lVar92 + (int)((iVar79 + -2) - uVar12) *
                                                                   local_9e8 + lVar167]) * 0.5;
                            dVar206 = ABS(dVar210);
                            uVar169 = -(ulong)(0.0 < dVar195);
                            dVar195 = ABS(dVar195);
                            dVar196 = ABS(dVar211);
                            if (dVar206 <= dVar195) {
                              dVar195 = dVar206;
                            }
                            if (dVar195 <= dVar196) {
                              dVar196 = dVar195;
                            }
                            uVar170 = -(ulong)(0.0 < dVar210 * dVar211) & (ulong)dVar196;
                            uVar169 = ~uVar169 & (uVar170 ^ 0x8000000000000000) | uVar169 & uVar170;
                          }
                          auVar193._8_8_ = uVar185;
                          auVar193._0_8_ = uVar169;
                          if (((local_808[lVar118 + lVar112 + lVar136] == 1.0) &&
                              (local_808[lVar118 + lVar112 + lVar137] == 1.0)) &&
                             (!NAN(local_808[lVar118 + lVar112 + lVar137]))) {
                            dVar210 = dVar216 - local_790[lVar94 + lVar167 + lVar107 + lVar103];
                            dVar211 = local_790[lVar94 + lVar167 + lVar108 + lVar103] - dVar216;
                            dVar210 = dVar210 + dVar210;
                            dVar211 = dVar211 + dVar211;
                            dVar195 = (local_790[lVar94 + lVar167 + lVar108 + lVar103] -
                                      local_790[lVar94 + lVar167 + lVar107 + lVar103]) * 0.5;
                            dVar206 = ABS(dVar210);
                            uVar169 = -(ulong)(0.0 < dVar195);
                            dVar195 = ABS(dVar195);
                            dVar196 = ABS(dVar211);
                            if (dVar206 <= dVar195) {
                              dVar195 = dVar206;
                            }
                            if (dVar195 <= dVar196) {
                              dVar196 = dVar195;
                            }
                            uVar185 = -(ulong)(0.0 < dVar210 * dVar211) & (ulong)dVar196;
                            dVar223 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                        }
                        dVar173 = dVar173 - dVar186;
                        dVar171 = dVar171 - dVar172;
                        iVar124 = 0;
                        iVar130 = 0;
                        iVar99 = 0;
                        iVar83 = 0;
                        uVar142 = 0xffffffff;
                        do {
                          uVar100 = uVar142 + 1;
                          uVar115 = 0xffffffff;
                          iVar159 = iVar124;
                          do {
                            uVar1 = uVar115 + 1;
                            iVar129 = 5;
                            do {
                              if (((uVar13 >> (iVar159 + iVar129 & 0x1fU) & 1) != 0) &&
                                 ((iVar129 != 6 || uVar115 != 0) || uVar142 != 0)) {
                                iVar130 = iVar130 + (uint)((iVar129 - 5U & 0xfffffffd) == 0 &&
                                                          (uVar115 == 0 && uVar142 == 0));
                                iVar99 = iVar99 + (uint)((iVar129 == 6 && uVar142 == 0) &&
                                                        (uVar1 & 0xfffffffd) == 0);
                                iVar83 = iVar83 + (uint)((iVar129 == 6 && uVar115 == 0) &&
                                                        (uVar100 & 0xfffffffd) == 0);
                              }
                              iVar129 = iVar129 + 1;
                            } while (iVar129 != 8);
                            iVar159 = iVar159 + 3;
                            uVar115 = uVar1;
                          } while (uVar1 != 2);
                          iVar124 = iVar124 + 9;
                          uVar142 = uVar100;
                        } while (uVar100 != 2);
                        dVar195 = auVar193._0_8_;
                        dVar206 = auVar193._8_8_;
                        dVar196 = 2.0;
                        if ((uVar13 >> 0x15 & 1) != 0) {
                          lVar154 = -1;
                          cVar139 = '\b';
                          auVar218._8_8_ = 0;
                          auVar218._0_8_ = (ulong)dVar216;
                          dVar210 = dVar216;
                          do {
                            iVar124 = 0;
                            bVar168 = true;
                            do {
                              bVar114 = bVar168;
                              lVar95 = 0;
                              do {
                                if (((int)lVar95 != 1 || (iVar124 != 0 || (int)lVar154 != 0)) &&
                                   ((1 << ((char)lVar95 + (char)iVar124 * '\x03' + cVar139 & 0x1fU)
                                    & uVar13) != 0)) {
                                  dVar196 = local_790[lVar103 + (iVar80 + (int)lVar154) * local_9b8
                                                                + (iVar81 + iVar124) * local_9e8 +
                                                                  (long)(iVar131 + (int)lVar95)];
                                  uVar200 = SUB84(dVar196,0);
                                  uVar201 = (undefined4)((ulong)dVar196 >> 0x20);
                                  if (dVar196 <= auVar218._0_8_) {
                                    uVar200 = auVar218._0_4_;
                                    uVar201 = auVar218._4_4_;
                                  }
                                  auVar218._4_4_ = uVar201;
                                  auVar218._0_4_ = uVar200;
                                  auVar218._8_8_ = 0;
                                  if (dVar196 < dVar210) {
                                    dVar210 = dVar196;
                                  }
                                }
                                lVar95 = lVar95 + 1;
                              } while (lVar95 != 3);
                              iVar124 = 1;
                              bVar168 = false;
                            } while (bVar114);
                            lVar154 = lVar154 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar154 != 2);
                          dVar211 = (dVar171 * dVar223 +
                                    (0.5 - dVar182) * dVar195 + dVar173 * dVar206 + dVar216) -
                                    dVar216;
                          if (dVar211 <= 1e-13) {
                            dVar196 = 1.0;
                            if ((dVar211 < -1e-13) &&
                               (dVar196 = (dVar210 - dVar216) / dVar211, 1.0 <= dVar196)) {
                              dVar196 = 1.0;
                            }
                          }
                          else {
                            dVar196 = (auVar218._0_8_ - dVar216) / dVar211;
                            if (1.0 <= dVar196) {
                              dVar196 = 1.0;
                            }
                          }
                          if (2.0 <= dVar196) {
                            dVar196 = 2.0;
                          }
                        }
                        dVar210 = dVar196;
                        if ((short)uVar13 < 0) {
                          lVar154 = -1;
                          cVar139 = '\x05';
                          auVar189._8_8_ = 0;
                          auVar189._0_8_ = (ulong)dVar216;
                          dVar211 = dVar216;
                          do {
                            lVar95 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar151 = 0;
                              do {
                                if (((int)lVar151 != 1 || ((int)lVar95 != 0 || (int)lVar154 != 0))
                                   && ((1 << (cVar122 + (char)lVar151 & 0x1fU) & uVar13) != 0)) {
                                  dVar210 = local_790[lVar103 + (iVar80 + (int)lVar154) * local_9b8
                                                                + (iVar81 + (int)lVar95) * local_9e8
                                                                  + (long)(iVar131 + (int)lVar151)];
                                  uVar200 = SUB84(dVar210,0);
                                  uVar201 = (undefined4)((ulong)dVar210 >> 0x20);
                                  if (dVar210 <= auVar189._0_8_) {
                                    uVar200 = auVar189._0_4_;
                                    uVar201 = auVar189._4_4_;
                                  }
                                  auVar189._4_4_ = uVar201;
                                  auVar189._0_4_ = uVar200;
                                  auVar189._8_8_ = 0;
                                  if (dVar210 < dVar211) {
                                    dVar211 = dVar210;
                                  }
                                }
                                lVar151 = lVar151 + 1;
                              } while (lVar151 != 3);
                              cVar122 = cVar122 + '\x03';
                              bVar168 = lVar95 != 0;
                              lVar95 = lVar95 + 1;
                            } while (bVar168);
                            lVar154 = lVar154 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar154 != 2);
                          dVar214 = (((local_580 +
                                      lVar84 + (iVar82 - local_8d4) * local_700 + lVar163)
                                      [local_900] - dVar172) * dVar223 +
                                    -(dVar182 + 0.5) * dVar195 +
                                    (local_580[lVar84 + (iVar82 - local_8d4) * local_700 + lVar163]
                                    - dVar186) * dVar206 + dVar216) - dVar216;
                          if (dVar214 <= 1e-13) {
                            dVar210 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar210 = (dVar211 - dVar216) / dVar214, 1.0 <= dVar210)) {
                              dVar210 = 1.0;
                            }
                          }
                          else {
                            dVar210 = (auVar189._0_8_ - dVar216) / dVar214;
                            if (1.0 <= dVar210) {
                              dVar210 = 1.0;
                            }
                          }
                          if (dVar196 <= dVar210) {
                            dVar210 = dVar196;
                          }
                        }
                        dVar196 = dVar210;
                        if ((uVar13 >> 0x13 & 1) != 0) {
                          dVar216 = local_790[lVar94 + lVar167 + lVar92 + lVar103];
                          lVar154 = -1;
                          dVar196 = dVar216;
                          dVar211 = dVar216;
                          do {
                            lVar95 = -1;
                            do {
                              iVar124 = 0;
                              bVar168 = true;
                              do {
                                bVar114 = bVar168;
                                if ((((int)lVar95 != 0 || (int)lVar154 != 0) || iVar124 != 0) &&
                                   ((1 << ((char)lVar95 * '\x03' + (char)lVar154 * '\t' + '\x12' +
                                           (char)iVar124 & 0x1fU) & uVar13) != 0)) {
                                  dVar214 = local_790[lVar103 + (iVar80 + (int)lVar154) * local_9b8
                                                                + (iVar81 + (int)lVar95) * local_9e8
                                                                  + (long)(iVar124 + iVar77)];
                                  dVar180 = dVar214;
                                  if (dVar214 <= dVar196) {
                                    dVar180 = dVar196;
                                  }
                                  dVar196 = dVar180;
                                  if (dVar214 < dVar211) {
                                    dVar211 = dVar214;
                                  }
                                }
                                iVar124 = 1;
                                bVar168 = false;
                              } while (bVar114);
                              lVar95 = lVar95 + 1;
                            } while (lVar95 != 2);
                            lVar154 = lVar154 + 1;
                          } while (lVar154 != 2);
                          dVar214 = (((local_578 + lVar116 + lVar109 + ((iVar152 - local_990) + 1))
                                      [local_918] - dVar172) * dVar223 +
                                    (local_578[lVar116 + lVar109 + ((iVar152 - local_990) + 1)] -
                                    dVar182) * dVar195 + (0.5 - dVar186) * dVar206 + dVar216) -
                                    dVar216;
                          if (dVar214 <= 1e-13) {
                            dVar196 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar196 = (dVar211 - dVar216) / dVar214, 1.0 <= dVar196)) {
                              dVar196 = 1.0;
                            }
                          }
                          else {
                            dVar196 = (dVar196 - dVar216) / dVar214;
                            if (1.0 <= dVar196) {
                              dVar196 = 1.0;
                            }
                          }
                          if (dVar210 <= dVar196) {
                            dVar196 = dVar210;
                          }
                        }
                        dVar216 = dVar196;
                        if ((uVar13 >> 0x11 & 1) != 0) {
                          dVar210 = local_790[lVar94 + lVar167 + lVar92 + lVar103];
                          lVar154 = -1;
                          cVar139 = '\x05';
                          dVar211 = dVar210;
                          dVar216 = dVar210;
                          do {
                            lVar95 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar151 = 0;
                              dVar214 = dVar216;
                              do {
                                dVar216 = dVar214;
                                if (((int)lVar151 != 1 || ((int)lVar95 != 0 || (int)lVar154 != 0))
                                   && ((1 << (cVar122 + (char)lVar151 & 0x1fU) & uVar13) != 0)) {
                                  dVar180 = local_790[lVar103 + (iVar80 + (int)lVar154) * local_9b8
                                                                + (iVar81 + (int)lVar95) * local_9e8
                                                                  + (long)(iVar131 + (int)lVar151)];
                                  dVar216 = dVar180;
                                  if (dVar180 <= dVar214) {
                                    dVar216 = dVar214;
                                  }
                                  if (dVar180 < dVar211) {
                                    dVar211 = dVar180;
                                  }
                                }
                                lVar151 = lVar151 + 1;
                                dVar214 = dVar216;
                              } while (lVar151 != 2);
                              lVar95 = lVar95 + 1;
                              cVar122 = cVar122 + '\x03';
                            } while (lVar95 != 2);
                            lVar154 = lVar154 + 1;
                            cVar139 = cVar139 + '\t';
                          } while (lVar154 != 2);
                          dVar214 = (((local_578 + lVar116 + lVar109 + (iVar152 - local_990))
                                      [local_918] - dVar172) * dVar223 +
                                    (local_578[lVar116 + lVar109 + (iVar152 - local_990)] - dVar182)
                                    * dVar195 + (dVar210 - (dVar186 + 0.5) * dVar206)) - dVar210;
                          if (dVar214 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar216 = (dVar211 - dVar210) / dVar214, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = (dVar216 - dVar210) / dVar214;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar196 <= dVar216) {
                            dVar216 = dVar196;
                          }
                        }
                        dVar196 = dVar216;
                        if ((uVar13 >> 0x1b & 1) != 0) {
                          dVar210 = local_790[lVar94 + lVar167 + lVar92 + lVar103];
                          iVar77 = 0;
                          dVar196 = dVar210;
                          dVar211 = dVar210;
                          bVar168 = true;
                          do {
                            bVar114 = bVar168;
                            iVar124 = iVar77 * 9 + 0xe;
                            lVar154 = -1;
                            do {
                              lVar95 = 0;
                              do {
                                if (((int)lVar95 != 1 || ((int)lVar154 != 0 || iVar77 != 0)) &&
                                   ((1 << ((char)iVar124 + (char)lVar95 & 0x1fU) & uVar13) != 0)) {
                                  dVar214 = local_790[lVar103 + (iVar80 + iVar77) * local_9b8 +
                                                                (iVar81 + (int)lVar154) * local_9e8
                                                                + (long)(iVar131 + (int)lVar95)];
                                  dVar180 = dVar214;
                                  if (dVar214 <= dVar196) {
                                    dVar180 = dVar196;
                                  }
                                  dVar196 = dVar180;
                                  if (dVar214 < dVar211) {
                                    dVar211 = dVar214;
                                  }
                                }
                                lVar95 = lVar95 + 1;
                              } while (lVar95 != 3);
                              lVar154 = lVar154 + 1;
                              iVar124 = iVar124 + 3;
                            } while (lVar154 != 2);
                            iVar77 = 1;
                            bVar168 = false;
                          } while (bVar114);
                          dVar214 = ((0.5 - dVar172) * dVar223 +
                                    ((local_4c0 + lVar89 + lVar110 + (iVar152 - local_98c))
                                     [local_950] - dVar182) * dVar195 +
                                    (local_4c0[lVar89 + lVar110 + (iVar152 - local_98c)] - dVar186)
                                    * dVar206 + dVar210) - dVar210;
                          if (dVar214 <= 1e-13) {
                            dVar196 = 1.0;
                            if ((dVar214 < -1e-13) &&
                               (dVar196 = (dVar211 - dVar210) / dVar214, 1.0 <= dVar196)) {
                              dVar196 = 1.0;
                            }
                          }
                          else {
                            dVar196 = (dVar196 - dVar210) / dVar214;
                            if (1.0 <= dVar196) {
                              dVar196 = 1.0;
                            }
                          }
                          if (dVar216 <= dVar196) {
                            dVar196 = dVar216;
                          }
                        }
                        dVar216 = dVar196;
                        if ((uVar13 >> 9 & 1) != 0) {
                          dVar210 = local_790[lVar94 + lVar167 + lVar92 + lVar103];
                          cVar139 = '\x05';
                          uVar200 = SUB84(dVar210,0);
                          uVar201 = (undefined4)((ulong)dVar210 >> 0x20);
                          lVar154 = -1;
                          dVar211 = dVar210;
                          do {
                            lVar95 = -1;
                            cVar122 = cVar139;
                            do {
                              lVar151 = 0;
                              do {
                                if (((int)lVar151 != 1 || ((int)lVar95 != 0 || (int)lVar154 != 0))
                                   && ((1 << (cVar122 + (char)lVar151 & 0x1fU) & uVar13) != 0)) {
                                  dVar216 = local_790[lVar103 + (iVar80 + (int)lVar154) * local_9b8
                                                                + (iVar81 + (int)lVar95) * local_9e8
                                                                  + (long)(iVar131 + (int)lVar151)];
                                  dVar214 = dVar216;
                                  if (dVar216 <= (double)CONCAT44(uVar201,uVar200)) {
                                    dVar214 = (double)CONCAT44(uVar201,uVar200);
                                  }
                                  if (dVar216 < dVar211) {
                                    dVar211 = dVar216;
                                  }
                                  uVar200 = SUB84(dVar214,0);
                                  uVar201 = (undefined4)((ulong)dVar214 >> 0x20);
                                }
                                lVar151 = lVar151 + 1;
                              } while (lVar151 != 3);
                              lVar95 = lVar95 + 1;
                              cVar122 = cVar122 + '\x03';
                            } while (lVar95 != 2);
                            cVar139 = cVar139 + '\t';
                            bVar168 = lVar154 != 0;
                            lVar154 = lVar154 + 1;
                          } while (bVar168);
                          dVar186 = ((((local_4c0 + lVar133 + lVar110 + (iVar152 - local_98c))
                                       [local_950] - dVar182) * dVar195 +
                                     (local_4c0[lVar133 + lVar110 + (iVar152 - local_98c)] - dVar186
                                     ) * dVar206 + dVar210) - (dVar172 + 0.5) * dVar223) - dVar210;
                          if (dVar186 <= 1e-13) {
                            dVar216 = 1.0;
                            if ((dVar186 < -1e-13) &&
                               (dVar216 = (dVar211 - dVar210) / dVar186, 1.0 <= dVar216)) {
                              dVar216 = 1.0;
                            }
                          }
                          else {
                            dVar216 = ((double)CONCAT44(uVar201,uVar200) - dVar210) / dVar186;
                            if (1.0 <= dVar216) {
                              dVar216 = 1.0;
                            }
                          }
                          if (dVar196 <= dVar216) {
                            dVar216 = dVar196;
                          }
                        }
                        dVar186 = 0.0;
                        if (1 < iVar130) {
                          dVar186 = dVar216;
                        }
                        uVar200 = 0;
                        uVar201 = 0;
                        if (1 < iVar99) {
                          uVar200 = SUB84(dVar216,0);
                          uVar201 = (undefined4)((ulong)dVar216 >> 0x20);
                        }
                        dVar196 = 0.0;
                        if (1 < iVar83) {
                          dVar196 = dVar216;
                        }
                        if ((dVar202 == 1.0) && (!NAN(dVar202))) {
                          if ((local_808[lVar118 + lVar91 + (int)(~local_984 + iVar152)] == 1.0) &&
                             ((local_808[lVar118 + lVar91 + (iVar101 + 1)] == 1.0 &&
                              (!NAN(local_808[lVar118 + lVar91 + (iVar101 + 1)]))))) {
                            dVar186 = 1.0;
                          }
                          if (((local_808[lVar91 + (iVar98 + -2) * local_4b0 + lVar112] == 1.0) &&
                              (local_808[lVar91 + lVar117 + lVar112] == 1.0)) &&
                             (!NAN(local_808[lVar91 + lVar117 + lVar112]))) {
                            uVar200 = 0;
                            uVar201 = 0x3ff00000;
                          }
                          if (((local_808[lVar118 + lVar134 + lVar112] == 1.0) &&
                              (local_808[lVar118 + lVar105 + lVar112] == 1.0)) &&
                             (!NAN(local_808[lVar118 + lVar105 + lVar112]))) {
                            dVar196 = 1.0;
                          }
                        }
                        dVar173 = dVar171 * dVar223 * dVar196 +
                                  (0.5 - dVar182) * dVar195 * (double)CONCAT44(uVar201,uVar200) +
                                  dVar173 * dVar206 * dVar186 +
                                  local_790[lVar94 + lVar167 + lVar92 + lVar103];
                        if (dVar173 <= dVar183) {
                          dVar183 = dVar173;
                        }
                        if (dVar209 <= dVar183) {
                          dVar209 = dVar183;
                        }
                        iVar77 = d_bcrec_ptr[local_7f8].bc[4];
                        if (iVar162 == iVar79) {
                          switch(d_bcrec_ptr[local_7f8].bc[1]) {
                          case 1:
switchD_0048509f_caseD_1:
                            dVar209 = dVar198;
                            break;
                          case 2:
                          case 4:
                            if ((local_7f8 != 1 || !is_velocity) ||
                                pdVar14[lVar135 + lVar111 + (iVar152 - iVar156)] < 0.0)
                            goto switchD_0048509f_caseD_1;
                            dVar209 = 0.0;
                            if (dVar198 <= 0.0) {
                              dVar209 = dVar198;
                            }
LAB_00485153:
                            dVar198 = dVar209;
                            break;
                          case 3:
                            dVar209 = local_790[lVar103 + lVar92 + (int)(~uVar12 + iVar79) *
                                                                   local_9e8 + lVar167];
                            if (local_7f8 == 1 && is_velocity) goto LAB_00485153;
                            break;
                          case -1:
                            dVar198 = 0.0;
                            dVar209 = 0.0;
                          }
                          if (iVar75 == iVar79) {
LAB_0048516a:
                            if (((iVar77 == 4) || (iVar77 == 2)) &&
                               (dVar198 = dVar209,
                               (local_7f8 == 1 && is_velocity) &&
                               pdVar14[lVar135 + lVar111 + (iVar152 - iVar156)] <= 0.0)) {
                              dVar198 = 0.0;
                              if (0.0 <= dVar209) {
                                dVar198 = dVar209;
                              }
LAB_004851b6:
                              dVar209 = dVar198;
                            }
                          }
                        }
                        else if (iVar75 == iVar79) {
                          switch(iVar77) {
                          case 1:
                          case 2:
                          case 4:
                            dVar198 = dVar209;
                          default:
                            goto LAB_0048516a;
                          case 3:
                            dVar198 = local_790[lVar93 + lVar167 + lVar92 + lVar103];
                            if (local_7f8 != 1 || !is_velocity) break;
                            goto LAB_004851b6;
                          case -1:
                            dVar209 = 0.0;
                            dVar198 = 0.0;
                          }
                        }
                        dVar173 = dVar209;
                        if ((pdVar14[lVar135 + lVar111 + (iVar152 - iVar156)] <= 1e-08) &&
                           (dVar173 = dVar198,
                           -1e-08 <= pdVar14[lVar135 + lVar111 + (iVar152 - iVar156)])) {
                          dVar173 = (dVar198 + dVar209) * 0.5;
                        }
                      }
                      pdVar15[lVar21 * local_7f8 +
                              (lVar106 - iVar147) * lVar20 +
                              ((long)iVar79 - (long)iVar11) * lVar19 + (lVar153 - iVar123)] =
                           dVar173;
                      iVar97 = iVar97 + 1;
                      iVar131 = iVar131 + 1;
                      bVar168 = iVar152 != iVar9;
                      iVar152 = iVar152 + 1;
                    } while (bVar168);
                  }
                  bVar168 = iVar79 != iVar141;
                  iVar79 = iVar79 + 1;
                } while (bVar168);
              }
              bVar168 = iVar78 != iVar128;
              iVar78 = iVar78 + 1;
            } while (bVar168);
          }
          local_7f8 = local_7f8 + 1;
        } while (local_7f8 != uVar132);
        local_790 = q->p;
        local_9e8 = q->jstride;
        local_9b8 = q->kstride;
        local_3d8 = q->nstride;
        iVar127 = (q->begin).x;
        uVar12 = (q->begin).y;
        local_8e8 = (q->begin).z;
        local_8f8 = ccc->p;
        local_8a8 = ccc->jstride;
        lVar104 = ccc->kstride;
        lVar126 = ccc->nstride;
        local_954 = (ccc->begin).x;
        local_974 = (ccc->begin).y;
        local_940 = (ccc->begin).z;
        local_578 = fcx->p;
        local_640 = fcx->jstride;
        local_688 = fcx->kstride;
        local_918 = fcx->nstride;
        local_990 = (fcx->begin).x;
        local_87c = (fcx->begin).y;
        local_8dc = (fcx->begin).z;
        local_580 = fcy->p;
        local_700 = fcy->jstride;
        local_690 = fcy->kstride;
        local_900 = fcy->nstride;
        local_988 = (fcy->begin).x;
        local_8d4 = (fcy->begin).y;
        local_888 = (fcy->begin).z;
        local_4c0 = fcz->p;
        local_4a8 = fcz->jstride;
        local_718 = fcz->kstride;
        local_950 = fcz->nstride;
        local_98c = (fcz->begin).x;
        local_880 = (fcz->begin).y;
        local_8e0 = (fcz->begin).z;
        local_4c8 = flag->p;
        local_648 = flag->jstride;
        local_698 = flag->kstride;
        local_8cc = (flag->begin).x;
        local_8d8 = (flag->begin).y;
        local_8e4 = (flag->begin).z;
        local_808 = vfrac->p;
        local_4b0 = vfrac->jstride;
        local_588 = vfrac->kstride;
        local_984 = (vfrac->begin).x;
        uVar143 = (vfrac->begin).y;
        local_944 = (vfrac->begin).z;
      }
      if (ncomp < 1) {
        return;
      }
      pdVar14 = wmac->p;
      lVar16 = wmac->jstride;
      lVar17 = wmac->kstride;
      iVar128 = (wmac->begin).x;
      iVar156 = (wmac->begin).y;
      iVar161 = (wmac->begin).z;
      pdVar15 = zedge->p;
      lVar85 = (long)local_954;
      lVar19 = zedge->jstride;
      lVar20 = zedge->kstride;
      lVar21 = zedge->nstride;
      iVar165 = (zedge->begin).x;
      iVar123 = (zedge->begin).y;
      iVar141 = (zedge->begin).z;
      iVar11 = (domain->smallend).vect[2];
      iVar147 = (domain->bigend).vect[2] + 1;
      lVar4 = lVar104 * 8;
      lVar5 = local_8a8 * 8;
      local_800 = 0;
      do {
        if (iVar8 <= iVar96) {
          lVar103 = local_3d8 * local_800;
          iVar162 = iVar8;
          do {
            if (iVar7 <= iVar10) {
              lVar88 = (iVar162 - local_8e4) * local_698;
              iVar78 = iVar162 - local_8e8;
              lVar84 = iVar78 * local_9b8;
              iVar97 = iVar162 + -1;
              iVar79 = iVar97 - local_8e8;
              lVar102 = iVar79 * local_9b8;
              iVar80 = iVar162 - local_944;
              lVar133 = local_588 * iVar80;
              lVar134 = (int)(iVar97 - local_944) * local_588;
              lVar135 = (iVar162 - local_888) * local_690;
              lVar136 = (iVar162 - local_8dc) * local_688;
              lVar116 = (iVar97 - local_940) * lVar104;
              lVar105 = (iVar97 - local_8e4) * local_698;
              lVar106 = (iVar97 - local_888) * local_690;
              lVar107 = (iVar97 - local_8dc) * local_688;
              lVar108 = ((long)iVar162 - (long)iVar161) * lVar17;
              lVar137 = ((long)iVar97 + ~(long)local_940) * lVar4;
              iVar75 = iVar7;
              do {
                if (iVar6 <= iVar9) {
                  lVar89 = (iVar75 - local_8d8) * local_648;
                  lVar90 = (iVar75 - local_880) * local_4a8;
                  lVar91 = (iVar75 - local_974) * local_8a8;
                  iVar81 = iVar75 - uVar12;
                  lVar92 = iVar81 * local_9e8;
                  lVar109 = local_4b0 * (int)(iVar75 - uVar143);
                  lVar110 = (int)((iVar75 + -1) - uVar143) * local_4b0;
                  lVar117 = (int)((iVar75 + 1) - uVar143) * local_4b0;
                  lVar138 = (int)((iVar75 + -1) - uVar12) * local_9e8;
                  lVar140 = (int)((iVar75 + 1) - uVar12) * local_9e8;
                  lVar144 = ((iVar75 - local_8d4) + 1) * local_700;
                  lVar150 = (iVar75 - local_8d4) * local_700;
                  lVar153 = (iVar75 - local_87c) * local_640;
                  lVar154 = (int)(~uVar143 + iVar75) * local_4b0;
                  lVar93 = (int)((iVar75 - uVar143) + 1) * local_4b0;
                  lVar94 = (long)iVar75;
                  lVar111 = (lVar94 - iVar156) * lVar16;
                  lVar118 = (~(long)local_974 + lVar94) * lVar5;
                  iVar131 = iVar74 - local_954;
                  iVar152 = iVar74 - iVar127;
                  iVar76 = iVar6;
                  do {
                    lVar151 = (long)iVar76;
                    lVar95 = (long)(iVar76 - local_8cc);
                    uVar13 = local_4c8[lVar89 + lVar95 + lVar88].flag;
                    dVar173 = 0.0;
                    if ((uVar13 >> 9 & 1) != 0) {
                      lVar163 = (long)local_8f8 + lVar151 * 8 + lVar118 + lVar137 + lVar85 * -8 + -8
                      ;
                      lVar146 = (long)local_8f8 +
                                lVar151 * 8 + lVar118 + lVar137 + lVar126 * 8 + lVar85 * -8 + -8;
                      lVar167 = (long)local_8f8 +
                                lVar151 * 8 + lVar118 + lVar137 + lVar126 * 0x10 + lVar85 * -8 + -8;
                      lVar112 = (long)(iVar76 - local_98c);
                      pdVar18 = local_4c0 + lVar90 + lVar112 + local_718 * (iVar162 - local_8e0);
                      dVar173 = *pdVar18;
                      dVar171 = pdVar18[local_950];
                      lVar113 = (long)(iVar76 - local_954);
                      pdVar22 = local_8f8 + lVar91 + lVar113 + (iVar162 - local_940) * lVar104;
                      dVar202 = *pdVar22;
                      dVar186 = pdVar22[lVar126];
                      dVar182 = pdVar22[lVar126 * 2];
                      iVar98 = iVar76 - iVar127;
                      lVar119 = (long)iVar98;
                      dVar196 = local_790[lVar92 + lVar119 + lVar84 + lVar103];
                      dVar216 = local_790[lVar92 + lVar119 + lVar102 + lVar103];
                      lVar155 = -1;
                      cVar139 = '\x05';
                      lVar120 = 0;
                      do {
                        iVar82 = (int)lVar155;
                        lVar145 = -1;
                        cVar122 = cVar139;
                        do {
                          iVar77 = (int)lVar145;
                          iVar101 = (int)lVar120;
                          ppBVar86 = &local_398.d_bcrec_ptr + (long)iVar101 * 3;
                          lVar120 = 0;
                          do {
                            iVar99 = (int)lVar120 + -1;
                            if (((iVar77 == 0 && iVar82 == 0) && iVar99 == 0) ||
                               ((1 << (cVar122 + (char)lVar120 & 0x1fU) & uVar13) == 0)) {
                              *ppBVar86 = (BCRec *)0x0;
                              ppBVar86[1] = (BCRec *)0x0;
                              ppBVar86[2] = (BCRec *)0x0;
                            }
                            else {
                              pdVar22 = local_8f8 +
                                        ((iVar162 - local_940) + iVar82) * lVar104 +
                                        ((iVar75 - local_974) + iVar77) * local_8a8 +
                                        (long)(iVar131 + (int)lVar120);
                              dVar172 = (pdVar22[lVar126] + (double)iVar77) - dVar186;
                              auVar23._8_4_ = SUB84(dVar172,0);
                              auVar23._0_8_ = (*pdVar22 + (double)iVar99) - dVar202;
                              auVar23._12_4_ = (int)((ulong)dVar172 >> 0x20);
                              *(undefined1 (*) [16])ppBVar86 = auVar23;
                              ppBVar86[2] = (BCRec *)((pdVar22[lVar126 * 2] + (double)iVar82) -
                                                     dVar182);
                            }
                            lVar120 = lVar120 + 1;
                            ppBVar86 = ppBVar86 + 3;
                          } while (lVar120 != 3);
                          lVar145 = lVar145 + 1;
                          cVar122 = cVar122 + '\x03';
                          lVar120 = (long)iVar101 + 3;
                        } while (lVar145 != 2);
                        lVar155 = lVar155 + 1;
                        cVar139 = cVar139 + '\t';
                        lVar120 = (long)iVar101 + 3;
                      } while (lVar155 != 2);
                      lVar155 = -1;
                      cVar139 = '\x05';
                      lVar120 = 0;
                      do {
                        lVar145 = -1;
                        cVar122 = cVar139;
                        do {
                          iVar82 = (int)lVar120;
                          lVar120 = 0;
                          do {
                            dVar172 = 0.0;
                            if (((int)lVar120 != 1 || ((int)lVar145 != 0 || (int)lVar155 != 0)) &&
                               ((1 << (cVar122 + (char)lVar120 & 0x1fU) & uVar13) != 0)) {
                              dVar172 = local_790[lVar103 + (iVar78 + (int)lVar155) * local_9b8 +
                                                            (iVar81 + (int)lVar145) * local_9e8 +
                                                            (long)(iVar152 + (int)lVar120)] -
                                        dVar196;
                            }
                            adStack_108[iVar82 + lVar120] = dVar172;
                            lVar120 = lVar120 + 1;
                          } while (lVar120 != 3);
                          lVar145 = lVar145 + 1;
                          cVar122 = cVar122 + '\x03';
                          lVar120 = (long)iVar82 + 3;
                        } while (lVar145 != 2);
                        lVar155 = lVar155 + 1;
                        cVar139 = cVar139 + '\t';
                        lVar120 = (long)iVar82 + 3;
                      } while (lVar155 != 2);
                      dVar172 = dVar216;
                      if (dVar216 <= dVar196) {
                        dVar172 = dVar196;
                      }
                      dVar195 = 0.0;
                      dVar198 = 0.0;
                      dVar183 = 0.0;
                      pDVar87 = (Dim3 *)&local_398.q.jstride;
                      lVar120 = 0;
                      dVar214 = 0.0;
                      dVar223 = 0.0;
                      dVar206 = 0.0;
                      dVar209 = 0.0;
                      dVar210 = 0.0;
                      dVar211 = 0.0;
                      do {
                        dVar199 = *(double *)((long)(pDVar87 + -2) + 8);
                        dVar212 = *(double *)((long)(pDVar87 + -1) + 4);
                        dVar180 = *(double *)pDVar87;
                        dVar184 = adStack_108[lVar120];
                        dVar210 = dVar210 + dVar212 * *(double *)((long)(pDVar87 + -1) + 4);
                        dVar211 = dVar211 + dVar199 * *(double *)pDVar87;
                        dVar183 = dVar183 + dVar180 * dVar180;
                        dVar206 = dVar206 + dVar184 * dVar199;
                        dVar209 = dVar209 + dVar199 * dVar199;
                        dVar195 = dVar195 + dVar184 * dVar212;
                        dVar198 = dVar198 + dVar212 * dVar199;
                        dVar214 = dVar214 + dVar180 * *(double *)((long)(pDVar87 + -1) + 4);
                        dVar223 = dVar223 + dVar184 * *(double *)pDVar87;
                        lVar120 = lVar120 + 1;
                        pDVar87 = pDVar87 + 2;
                      } while (lVar120 != 0x1b);
                      dVar212 = dVar198 * dVar183 - dVar211 * dVar214;
                      dVar199 = dVar198 * dVar223 - dVar211 * dVar195;
                      dVar180 = dVar198 * dVar214 + dVar211 * -dVar210;
                      dVar184 = dVar183 * dVar210 - dVar214 * dVar214;
                      dVar183 = dVar183 * dVar195 - dVar214 * dVar223;
                      auVar177._0_8_ =
                           dVar211 * (dVar195 * dVar214 - dVar223 * dVar210) +
                           (dVar206 * dVar184 - dVar183 * dVar198);
                      auVar177._8_8_ = dVar211 * dVar199 + (dVar209 * dVar183 - dVar212 * dVar206);
                      dVar211 = dVar180 * dVar211 + (dVar184 * dVar209 - dVar212 * dVar198);
                      auVar190._8_8_ = dVar211;
                      auVar190._0_8_ = dVar211;
                      auVar178 = divpd(auVar177,auVar190);
                      dVar211 = (dVar180 * dVar206 +
                                ((dVar223 * dVar210 + -dVar195 * dVar214) * dVar209 -
                                dVar199 * dVar198)) / dVar211;
                      iVar82 = iVar76 - local_984;
                      lVar120 = (long)iVar82;
                      dVar183 = auVar178._0_8_;
                      dVar195 = auVar178._8_8_;
                      if ((local_808[lVar109 + lVar133 + lVar120] == 1.0) &&
                         (!NAN(local_808[lVar109 + lVar133 + lVar120]))) {
                        if ((local_808[lVar109 + lVar133 + (int)((iVar76 + -1) - local_984)] == 1.0)
                           && (!NAN(local_808[lVar109 + lVar133 + (int)((iVar76 + -1) - local_984)])
                              )) {
                          if ((local_808[lVar109 + lVar133 + (int)((iVar76 + 1) - local_984)] == 1.0
                              ) && (!NAN(local_808[lVar109 + lVar133 + (int)((iVar76 + 1) -
                                                                            local_984)]))) {
                            dVar183 = dVar196 - local_790[lVar92 + lVar84 + lVar103 + ((iVar76 + -1)
                                                                                      - iVar127)];
                            dVar198 = local_790[lVar92 + lVar84 + lVar103 + ((iVar76 + 1) - iVar127)
                                               ] - dVar196;
                            dVar183 = dVar183 + dVar183;
                            dVar198 = dVar198 + dVar198;
                            dVar209 = (local_790[lVar92 + lVar84 + lVar103 + ((iVar76 + 1) - iVar127
                                                                             )] -
                                      local_790[lVar92 + lVar84 + lVar103 + ((iVar76 + -1) - iVar127
                                                                            )]) * 0.5;
                            dVar210 = ABS(dVar183);
                            uVar169 = -(ulong)(0.0 < dVar209);
                            dVar209 = ABS(dVar209);
                            dVar206 = ABS(dVar198);
                            if (dVar210 <= dVar209) {
                              dVar209 = dVar210;
                            }
                            if (dVar209 <= dVar206) {
                              dVar206 = dVar209;
                            }
                            uVar185 = -(ulong)(0.0 < dVar183 * dVar198) & (ulong)dVar206;
                            dVar183 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                        }
                        if ((((local_808[lVar133 + lVar110 + lVar120] == 1.0) &&
                             (!NAN(local_808[lVar133 + lVar110 + lVar120]))) &&
                            (local_808[lVar133 + lVar117 + lVar120] == 1.0)) &&
                           (!NAN(local_808[lVar133 + lVar117 + lVar120]))) {
                          dVar209 = dVar196 - local_790[lVar103 + lVar84 + lVar138 + lVar119];
                          dVar210 = local_790[lVar103 + lVar84 + lVar140 + lVar119] - dVar196;
                          dVar209 = dVar209 + dVar209;
                          dVar210 = dVar210 + dVar210;
                          dVar206 = (local_790[lVar103 + lVar84 + lVar140 + lVar119] -
                                    local_790[lVar103 + lVar84 + lVar138 + lVar119]) * 0.5;
                          dVar195 = ABS(dVar209);
                          uVar169 = -(ulong)(0.0 < dVar206);
                          dVar206 = ABS(dVar206);
                          dVar198 = ABS(dVar210);
                          if (dVar195 <= dVar206) {
                            dVar206 = dVar195;
                          }
                          if (dVar206 <= dVar198) {
                            dVar198 = dVar206;
                          }
                          uVar185 = -(ulong)(0.0 < dVar209 * dVar210) & (ulong)dVar198;
                          dVar195 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                            uVar169 & uVar185);
                        }
                        if (((local_808[lVar109 + lVar120 + lVar134] == 1.0) &&
                            (!NAN(local_808[lVar109 + lVar120 + lVar134]))) &&
                           ((local_808[lVar109 + lVar120 + (int)((iVar162 + 1) - local_944) *
                                                           local_588] == 1.0 &&
                            (!NAN(local_808[lVar109 + lVar120 + (int)((iVar162 + 1) - local_944) *
                                                                local_588]))))) {
                          dVar210 = local_790[lVar92 + lVar119 + (int)((iVar162 + 1) - local_8e8) *
                                                                 local_9b8 + lVar103] - dVar196;
                          dVar209 = (dVar196 - dVar216) + (dVar196 - dVar216);
                          dVar210 = dVar210 + dVar210;
                          dVar206 = (local_790[lVar92 + lVar119 + (int)((iVar162 + 1) - local_8e8) *
                                                                  local_9b8 + lVar103] - dVar216) *
                                    0.5;
                          dVar211 = ABS(dVar209);
                          uVar169 = -(ulong)(0.0 < dVar206);
                          dVar206 = ABS(dVar206);
                          dVar198 = ABS(dVar210);
                          if (dVar211 <= dVar206) {
                            dVar206 = dVar211;
                          }
                          if (dVar206 <= dVar198) {
                            dVar198 = dVar206;
                          }
                          uVar185 = -(ulong)(0.0 < dVar209 * dVar210) & (ulong)dVar198;
                          dVar211 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                            uVar169 & uVar185);
                        }
                      }
                      dVar198 = dVar216;
                      if (dVar196 <= dVar216) {
                        dVar198 = dVar196;
                      }
                      uVar13 = local_4c8[lVar89 + lVar95 + lVar88].flag;
                      iVar99 = 0;
                      iVar77 = 0;
                      iVar101 = 0;
                      iVar83 = 0;
                      uVar142 = 0xffffffff;
                      do {
                        uVar100 = uVar142 + 1;
                        uVar115 = 0xffffffff;
                        iVar124 = iVar99;
                        do {
                          uVar1 = uVar115 + 1;
                          iVar130 = 5;
                          do {
                            if (((uVar13 >> (iVar124 + iVar130 & 0x1fU) & 1) != 0) &&
                               ((iVar130 != 6 || uVar115 != 0) || uVar142 != 0)) {
                              iVar77 = iVar77 + (uint)((iVar130 - 5U & 0xfffffffd) == 0 &&
                                                      (uVar115 == 0 && uVar142 == 0));
                              iVar101 = iVar101 + (uint)((iVar130 == 6 && uVar142 == 0) &&
                                                        (uVar1 & 0xfffffffd) == 0);
                              iVar83 = iVar83 + (uint)((iVar130 == 6 && uVar115 == 0) &&
                                                      (uVar100 & 0xfffffffd) == 0);
                            }
                            iVar130 = iVar130 + 1;
                          } while (iVar130 != 8);
                          iVar124 = iVar124 + 3;
                          uVar115 = uVar1;
                        } while (uVar1 != 2);
                        iVar99 = iVar99 + 9;
                        uVar142 = uVar100;
                      } while (uVar100 != 2);
                      dVar206 = 2.0;
                      if ((uVar13 >> 0x15 & 1) != 0) {
                        lVar155 = -1;
                        cVar139 = '\b';
                        dVar209 = dVar196;
                        dVar206 = dVar196;
                        do {
                          iVar99 = 0;
                          bVar168 = true;
                          do {
                            bVar114 = bVar168;
                            lVar145 = 0;
                            dVar210 = dVar206;
                            do {
                              dVar206 = dVar210;
                              if (((int)lVar145 != 1 || (iVar99 != 0 || (int)lVar155 != 0)) &&
                                 ((1 << ((char)lVar145 + (char)iVar99 * '\x03' + cVar139 & 0x1fU) &
                                  uVar13) != 0)) {
                                dVar214 = local_790[lVar103 + (iVar78 + (int)lVar155) * local_9b8 +
                                                              (iVar81 + iVar99) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar145)];
                                dVar206 = dVar214;
                                if (dVar214 <= dVar210) {
                                  dVar206 = dVar210;
                                }
                                if (dVar214 < dVar209) {
                                  dVar209 = dVar214;
                                }
                              }
                              lVar145 = lVar145 + 1;
                              dVar210 = dVar206;
                            } while (lVar145 != 3);
                            iVar99 = 1;
                            bVar168 = false;
                          } while (bVar114);
                          lVar155 = lVar155 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar155 != 2);
                        dVar210 = (((local_580 + lVar135 + lVar144 + (iVar76 - local_988))
                                    [local_900] - dVar182) * dVar211 +
                                  (0.5 - dVar186) * dVar195 +
                                  (local_580[lVar135 + lVar144 + (iVar76 - local_988)] - dVar202) *
                                  dVar183 + dVar196) - dVar196;
                        if (dVar210 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar210 < -1e-13) &&
                             (dVar206 = (dVar209 - dVar196) / dVar210, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar196) / dVar210;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (2.0 <= dVar206) {
                          dVar206 = 2.0;
                        }
                      }
                      dVar209 = dVar206;
                      if ((short)uVar13 < 0) {
                        lVar155 = -1;
                        cVar139 = '\x05';
                        auVar219._8_8_ = 0;
                        auVar219._0_8_ = (ulong)dVar196;
                        dVar210 = dVar196;
                        do {
                          lVar145 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar158 = 0;
                            do {
                              if (((int)lVar158 != 1 || ((int)lVar145 != 0 || (int)lVar155 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar158 & 0x1fU) & uVar13) != 0)) {
                                dVar209 = local_790[lVar103 + (iVar78 + (int)lVar155) * local_9b8 +
                                                              (iVar81 + (int)lVar145) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar158)];
                                uVar200 = SUB84(dVar209,0);
                                uVar201 = (undefined4)((ulong)dVar209 >> 0x20);
                                if (dVar209 <= auVar219._0_8_) {
                                  uVar200 = auVar219._0_4_;
                                  uVar201 = auVar219._4_4_;
                                }
                                auVar219._4_4_ = uVar201;
                                auVar219._0_4_ = uVar200;
                                auVar219._8_8_ = 0;
                                if (dVar209 < dVar210) {
                                  dVar210 = dVar209;
                                }
                              }
                              lVar158 = lVar158 + 1;
                            } while (lVar158 != 3);
                            cVar122 = cVar122 + '\x03';
                            bVar168 = lVar145 != 0;
                            lVar145 = lVar145 + 1;
                          } while (bVar168);
                          lVar155 = lVar155 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar155 != 2);
                        dVar214 = (((local_580 + lVar135 + lVar150 + (iVar76 - local_988))
                                    [local_900] - dVar182) * dVar211 +
                                  -(dVar186 + 0.5) * dVar195 +
                                  (local_580[lVar135 + lVar150 + (iVar76 - local_988)] - dVar202) *
                                  dVar183 + dVar196) - dVar196;
                        if (dVar214 <= 1e-13) {
                          dVar209 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar209 = (dVar210 - dVar196) / dVar214, 1.0 <= dVar209)) {
                            dVar209 = 1.0;
                          }
                        }
                        else {
                          dVar209 = (auVar219._0_8_ - dVar196) / dVar214;
                          if (1.0 <= dVar209) {
                            dVar209 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar209) {
                          dVar209 = dVar206;
                        }
                      }
                      dVar206 = dVar209;
                      if ((uVar13 >> 0x13 & 1) != 0) {
                        lVar155 = -1;
                        dVar206 = dVar196;
                        dVar210 = dVar196;
                        do {
                          lVar145 = -1;
                          do {
                            iVar99 = 0;
                            bVar168 = true;
                            do {
                              bVar114 = bVar168;
                              if ((((int)lVar145 != 0 || (int)lVar155 != 0) || iVar99 != 0) &&
                                 ((1 << ((char)lVar145 * '\x03' + (char)lVar155 * '\t' + '\x12' +
                                         (char)iVar99 & 0x1fU) & uVar13) != 0)) {
                                dVar214 = local_790[lVar103 + (iVar78 + (int)lVar155) * local_9b8 +
                                                              (iVar81 + (int)lVar145) * local_9e8 +
                                                              (long)(iVar99 + iVar98)];
                                dVar223 = dVar214;
                                if (dVar214 <= dVar206) {
                                  dVar223 = dVar206;
                                }
                                dVar206 = dVar223;
                                if (dVar214 < dVar210) {
                                  dVar210 = dVar214;
                                }
                              }
                              iVar99 = 1;
                              bVar168 = false;
                            } while (bVar114);
                            lVar145 = lVar145 + 1;
                          } while (lVar145 != 2);
                          lVar155 = lVar155 + 1;
                        } while (lVar155 != 2);
                        dVar214 = (((local_578 + lVar136 + lVar153 + ((iVar76 - local_990) + 1))
                                    [local_918] - dVar182) * dVar211 +
                                  (local_578[lVar136 + lVar153 + ((iVar76 - local_990) + 1)] -
                                  dVar186) * dVar195 + (0.5 - dVar202) * dVar183 + dVar196) -
                                  dVar196;
                        if (dVar214 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar206 = (dVar210 - dVar196) / dVar214, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar196) / dVar214;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (dVar209 <= dVar206) {
                          dVar206 = dVar209;
                        }
                      }
                      dVar209 = dVar206;
                      if ((uVar13 >> 0x11 & 1) != 0) {
                        lVar155 = -1;
                        cVar139 = '\x05';
                        auVar220._8_8_ = 0;
                        auVar220._0_8_ = (ulong)dVar196;
                        dVar210 = dVar196;
                        do {
                          lVar145 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar158 = 0;
                            do {
                              if (((int)lVar158 != 1 || ((int)lVar145 != 0 || (int)lVar155 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar158 & 0x1fU) & uVar13) != 0)) {
                                dVar209 = local_790[lVar103 + (iVar78 + (int)lVar155) * local_9b8 +
                                                              (iVar81 + (int)lVar145) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar158)];
                                uVar200 = SUB84(dVar209,0);
                                uVar201 = (undefined4)((ulong)dVar209 >> 0x20);
                                if (dVar209 <= auVar220._0_8_) {
                                  uVar200 = auVar220._0_4_;
                                  uVar201 = auVar220._4_4_;
                                }
                                if (dVar209 < dVar210) {
                                  dVar210 = dVar209;
                                }
                                auVar220._4_4_ = uVar201;
                                auVar220._0_4_ = uVar200;
                                auVar220._8_8_ = 0;
                              }
                              lVar158 = lVar158 + 1;
                            } while (lVar158 != 2);
                            lVar145 = lVar145 + 1;
                            cVar122 = cVar122 + '\x03';
                          } while (lVar145 != 2);
                          lVar155 = lVar155 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar155 != 2);
                        dVar214 = (((local_578 + lVar136 + lVar153 + (iVar76 - local_990))
                                    [local_918] - dVar182) * dVar211 +
                                  (local_578[lVar136 + lVar153 + (iVar76 - local_990)] - dVar186) *
                                  dVar195 + (dVar196 - (dVar202 + 0.5) * dVar183)) - dVar196;
                        if (dVar214 <= 1e-13) {
                          dVar209 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar209 = (dVar210 - dVar196) / dVar214, 1.0 <= dVar209)) {
                            dVar209 = 1.0;
                          }
                        }
                        else {
                          dVar209 = (auVar220._0_8_ - dVar196) / dVar214;
                          if (1.0 <= dVar209) {
                            dVar209 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar209) {
                          dVar209 = dVar206;
                        }
                      }
                      dVar206 = dVar209;
                      if ((uVar13 >> 0x1b & 1) != 0) {
                        iVar99 = 0;
                        dVar206 = dVar196;
                        dVar210 = dVar196;
                        bVar168 = true;
                        do {
                          bVar114 = bVar168;
                          iVar124 = iVar99 * 9 + 0xe;
                          lVar155 = -1;
                          do {
                            lVar145 = 0;
                            do {
                              if (((int)lVar145 != 1 || ((int)lVar155 != 0 || iVar99 != 0)) &&
                                 ((1 << ((char)iVar124 + (char)lVar145 & 0x1fU) & uVar13) != 0)) {
                                dVar214 = local_790[lVar103 + (iVar78 + iVar99) * local_9b8 +
                                                              (iVar81 + (int)lVar155) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar145)];
                                uVar200 = SUB84(dVar214,0);
                                uVar201 = (undefined4)((ulong)dVar214 >> 0x20);
                                if (dVar214 <= dVar206) {
                                  uVar200 = SUB84(dVar206,0);
                                  uVar201 = (undefined4)((ulong)dVar206 >> 0x20);
                                }
                                if (dVar214 < dVar210) {
                                  dVar210 = dVar214;
                                }
                                dVar206 = (double)CONCAT44(uVar201,uVar200);
                              }
                              lVar145 = lVar145 + 1;
                            } while (lVar145 != 3);
                            lVar155 = lVar155 + 1;
                            iVar124 = iVar124 + 3;
                          } while (lVar155 != 2);
                          iVar99 = 1;
                          bVar168 = false;
                        } while (bVar114);
                        dVar214 = ((0.5 - dVar182) * dVar211 +
                                  ((local_4c0 +
                                   lVar90 + lVar112 + ((iVar162 - local_8e0) + 1) * local_718)
                                   [local_950] - dVar186) * dVar195 +
                                  (local_4c0[lVar90 + lVar112 + ((iVar162 - local_8e0) + 1) *
                                                                local_718] - dVar202) * dVar183 +
                                  dVar196) - dVar196;
                        if (dVar214 <= 1e-13) {
                          dVar206 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar206 = (dVar210 - dVar196) / dVar214, 1.0 <= dVar206)) {
                            dVar206 = 1.0;
                          }
                        }
                        else {
                          dVar206 = (dVar206 - dVar196) / dVar214;
                          if (1.0 <= dVar206) {
                            dVar206 = 1.0;
                          }
                        }
                        if (dVar209 <= dVar206) {
                          dVar206 = dVar209;
                        }
                      }
                      dVar209 = dVar206;
                      if ((uVar13 >> 9 & 1) != 0) {
                        cVar139 = '\x05';
                        uVar200 = SUB84(dVar196,0);
                        uVar201 = (undefined4)((ulong)dVar196 >> 0x20);
                        lVar155 = -1;
                        dVar210 = dVar196;
                        do {
                          lVar145 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar158 = 0;
                            do {
                              if (((int)lVar158 != 1 || ((int)lVar145 != 0 || (int)lVar155 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar158 & 0x1fU) & uVar13) != 0)) {
                                dVar209 = local_790[lVar103 + (iVar78 + (int)lVar155) * local_9b8 +
                                                              (iVar81 + (int)lVar145) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar158)];
                                dVar214 = dVar209;
                                if (dVar209 <= (double)CONCAT44(uVar201,uVar200)) {
                                  dVar214 = (double)CONCAT44(uVar201,uVar200);
                                }
                                if (dVar209 < dVar210) {
                                  dVar210 = dVar209;
                                }
                                uVar200 = SUB84(dVar214,0);
                                uVar201 = (undefined4)((ulong)dVar214 >> 0x20);
                              }
                              lVar158 = lVar158 + 1;
                            } while (lVar158 != 3);
                            lVar145 = lVar145 + 1;
                            cVar122 = cVar122 + '\x03';
                          } while (lVar145 != 2);
                          cVar139 = cVar139 + '\t';
                          bVar168 = lVar155 != 0;
                          lVar155 = lVar155 + 1;
                        } while (bVar168);
                        dVar214 = (((pdVar18[local_950] - dVar186) * dVar195 +
                                   (*pdVar18 - dVar202) * dVar183 + dVar196) -
                                  (dVar182 + 0.5) * dVar211) - dVar196;
                        if (dVar214 <= 1e-13) {
                          dVar209 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar209 = (dVar210 - dVar196) / dVar214, 1.0 <= dVar209)) {
                            dVar209 = 1.0;
                          }
                        }
                        else {
                          dVar209 = ((double)CONCAT44(uVar201,uVar200) - dVar196) / dVar214;
                          if (1.0 <= dVar209) {
                            dVar209 = 1.0;
                          }
                        }
                        if (dVar206 <= dVar209) {
                          dVar209 = dVar206;
                        }
                      }
                      dVar206 = 0.0;
                      if (1 < iVar77) {
                        dVar206 = dVar209;
                      }
                      uVar200 = 0;
                      uVar201 = 0;
                      if (1 < iVar101) {
                        uVar200 = SUB84(dVar209,0);
                        uVar201 = (undefined4)((ulong)dVar209 >> 0x20);
                      }
                      dVar210 = 0.0;
                      if (1 < iVar83) {
                        dVar210 = dVar209;
                      }
                      if ((local_808[lVar109 + lVar133 + lVar120] == 1.0) &&
                         (!NAN(local_808[lVar109 + lVar133 + lVar120]))) {
                        if ((local_808[lVar109 + lVar133 + (int)(~local_984 + iVar76)] == 1.0) &&
                           (((!NAN(local_808[lVar109 + lVar133 + (int)(~local_984 + iVar76)]) &&
                             (local_808[lVar109 + lVar133 + (iVar82 + 1)] == 1.0)) &&
                            (!NAN(local_808[lVar109 + lVar133 + (iVar82 + 1)]))))) {
                          dVar206 = 1.0;
                        }
                        if (((local_808[lVar133 + lVar154 + lVar120] == 1.0) &&
                            (!NAN(local_808[lVar133 + lVar154 + lVar120]))) &&
                           ((local_808[lVar133 + lVar93 + lVar120] == 1.0 &&
                            (!NAN(local_808[lVar133 + lVar93 + lVar120]))))) {
                          uVar200 = 0;
                          uVar201 = 0x3ff00000;
                        }
                        if (((local_808[lVar109 + lVar134 + lVar120] == 1.0) &&
                            (!NAN(local_808[lVar109 + lVar134 + lVar120]))) &&
                           ((local_808[lVar109 + (iVar80 + 1) * local_588 + lVar120] == 1.0 &&
                            (!NAN(local_808[lVar109 + (iVar80 + 1) * local_588 + lVar120]))))) {
                          dVar210 = 1.0;
                        }
                      }
                      dVar202 = ((dVar173 - dVar202) * dVar183 * dVar206 + dVar196 +
                                (dVar171 - dVar186) * dVar195 * (double)CONCAT44(uVar201,uVar200)) -
                                (dVar182 + 0.5) * dVar211 * dVar210;
                      dVar186 = dVar172;
                      if (dVar202 <= dVar172) {
                        dVar186 = dVar202;
                      }
                      dVar202 = local_8f8[lVar91 + lVar113 + lVar116];
                      dVar182 = local_8f8[lVar91 + lVar113 + lVar116 + lVar126];
                      dVar183 = local_8f8[lVar91 + lVar113 + lVar116 + lVar126 * 2];
                      uVar13 = local_4c8[lVar89 + lVar95 + lVar105].flag;
                      lVar155 = -1;
                      cVar139 = '\x05';
                      lVar113 = 0;
                      do {
                        lVar121 = -1;
                        lVar145 = lVar146;
                        lVar158 = lVar163;
                        lVar166 = lVar167;
                        cVar122 = cVar139;
                        do {
                          iVar77 = (int)lVar113;
                          ppBVar86 = &local_398.d_bcrec_ptr + (long)iVar77 * 3;
                          lVar113 = 0;
                          do {
                            iVar101 = (int)lVar113 + -1;
                            if ((((int)lVar121 == 0 && (int)lVar155 == 0) && iVar101 == 0) ||
                               ((1 << (cVar122 + (char)lVar113 & 0x1fU) & uVar13) == 0)) {
                              *ppBVar86 = (BCRec *)0x0;
                              ppBVar86[1] = (BCRec *)0x0;
                              ppBVar86[2] = (BCRec *)0x0;
                            }
                            else {
                              dVar195 = (*(double *)(lVar145 + lVar113 * 8) + (double)(int)lVar121)
                                        - dVar182;
                              auVar25._8_4_ = SUB84(dVar195,0);
                              auVar25._0_8_ =
                                   (*(double *)(lVar158 + lVar113 * 8) + (double)iVar101) - dVar202;
                              auVar25._12_4_ = (int)((ulong)dVar195 >> 0x20);
                              *(undefined1 (*) [16])ppBVar86 = auVar25;
                              ppBVar86[2] = (BCRec *)((*(double *)(lVar166 + lVar113 * 8) +
                                                      (double)(int)lVar155) - dVar183);
                            }
                            lVar113 = lVar113 + 1;
                            ppBVar86 = ppBVar86 + 3;
                          } while (lVar113 != 3);
                          lVar121 = lVar121 + 1;
                          lVar158 = lVar158 + local_8a8 * 8;
                          lVar145 = lVar145 + lVar5;
                          lVar166 = lVar166 + lVar5;
                          cVar122 = cVar122 + '\x03';
                          lVar113 = (long)iVar77 + 3;
                        } while (lVar121 != 2);
                        lVar155 = lVar155 + 1;
                        lVar163 = lVar163 + lVar104 * 8;
                        lVar146 = lVar146 + lVar4;
                        lVar167 = lVar167 + lVar4;
                        cVar139 = cVar139 + '\t';
                        lVar113 = (long)iVar77 + 3;
                      } while (lVar155 != 2);
                      lVar146 = -1;
                      cVar139 = '\x05';
                      lVar163 = 0;
                      do {
                        lVar167 = -1;
                        cVar122 = cVar139;
                        do {
                          iVar77 = (int)lVar163;
                          lVar163 = 0;
                          do {
                            dVar195 = 0.0;
                            if (((int)lVar163 != 1 || ((int)lVar167 != 0 || (int)lVar146 != 0)) &&
                               ((1 << (cVar122 + (char)lVar163 & 0x1fU) & uVar13) != 0)) {
                              dVar195 = local_790[lVar103 + (iVar79 + (int)lVar146) * local_9b8 +
                                                            (iVar81 + (int)lVar167) * local_9e8 +
                                                            (long)(iVar152 + (int)lVar163)] -
                                        dVar216;
                            }
                            adStack_108[iVar77 + lVar163] = dVar195;
                            lVar163 = lVar163 + 1;
                          } while (lVar163 != 3);
                          lVar167 = lVar167 + 1;
                          cVar122 = cVar122 + '\x03';
                          lVar163 = (long)iVar77 + 3;
                        } while (lVar167 != 2);
                        lVar146 = lVar146 + 1;
                        cVar139 = cVar139 + '\t';
                        lVar163 = (long)iVar77 + 3;
                      } while (lVar146 != 2);
                      dVar195 = dVar198;
                      if (dVar198 <= dVar186) {
                        dVar195 = dVar186;
                      }
                      dVar206 = 0.0;
                      dVar209 = 0.0;
                      dVar186 = 0.0;
                      pDVar87 = (Dim3 *)&local_398.q.jstride;
                      lVar163 = 0;
                      dVar214 = 0.0;
                      dVar223 = 0.0;
                      dVar180 = 0.0;
                      dVar184 = 0.0;
                      dVar210 = 0.0;
                      dVar211 = 0.0;
                      do {
                        dVar194 = *(double *)((long)(pDVar87 + -2) + 8);
                        dVar215 = *(double *)((long)(pDVar87 + -1) + 4);
                        dVar199 = *(double *)pDVar87;
                        dVar212 = adStack_108[lVar163];
                        dVar210 = dVar210 + dVar215 * *(double *)((long)(pDVar87 + -1) + 4);
                        dVar211 = dVar211 + dVar194 * *(double *)pDVar87;
                        dVar186 = dVar186 + dVar199 * dVar199;
                        dVar180 = dVar180 + dVar212 * dVar194;
                        dVar184 = dVar184 + dVar194 * dVar194;
                        dVar206 = dVar206 + dVar212 * dVar215;
                        dVar209 = dVar209 + dVar215 * dVar194;
                        dVar214 = dVar214 + dVar199 * *(double *)((long)(pDVar87 + -1) + 4);
                        dVar223 = dVar223 + dVar212 * *(double *)pDVar87;
                        lVar163 = lVar163 + 1;
                        pDVar87 = pDVar87 + 2;
                      } while (lVar163 != 0x1b);
                      dVar215 = dVar209 * dVar186 - dVar211 * dVar214;
                      dVar194 = dVar209 * dVar223 - dVar211 * dVar206;
                      dVar199 = dVar209 * dVar214 + dVar211 * -dVar210;
                      dVar212 = dVar186 * dVar210 - dVar214 * dVar214;
                      dVar186 = dVar186 * dVar206 - dVar214 * dVar223;
                      auVar179._0_8_ =
                           dVar211 * (dVar206 * dVar214 - dVar223 * dVar210) +
                           (dVar180 * dVar212 - dVar186 * dVar209);
                      auVar179._8_8_ = dVar211 * dVar194 + (dVar184 * dVar186 - dVar215 * dVar180);
                      dVar211 = dVar199 * dVar211 + (dVar212 * dVar184 - dVar215 * dVar209);
                      auVar191._8_8_ = dVar211;
                      auVar191._0_8_ = dVar211;
                      auVar178 = divpd(auVar179,auVar191);
                      dVar211 = (dVar199 * dVar180 +
                                ((dVar223 * dVar210 + -dVar206 * dVar214) * dVar184 -
                                dVar194 * dVar209)) / dVar211;
                      dVar186 = auVar178._0_8_;
                      dVar206 = auVar178._8_8_;
                      if ((local_808[lVar109 + lVar134 + lVar120] == 1.0) &&
                         (!NAN(local_808[lVar109 + lVar134 + lVar120]))) {
                        if ((local_808[lVar109 + lVar134 + (int)((iVar76 + -1) - local_984)] == 1.0)
                           && (!NAN(local_808[lVar109 + lVar134 + (int)((iVar76 + -1) - local_984)])
                              )) {
                          if ((local_808[lVar109 + lVar134 + (int)((iVar76 + 1) - local_984)] == 1.0
                              ) && (!NAN(local_808[lVar109 + lVar134 + (int)((iVar76 + 1) -
                                                                            local_984)]))) {
                            dVar186 = dVar216 - local_790[lVar92 + lVar102 + lVar103 + ((iVar76 + -1
                                                                                        ) - iVar127)
                                                         ];
                            dVar209 = local_790[lVar92 + lVar102 + lVar103 + ((iVar76 + 1) - iVar127
                                                                             )] - dVar216;
                            dVar186 = dVar186 + dVar186;
                            dVar209 = dVar209 + dVar209;
                            dVar214 = (local_790[lVar92 + lVar102 + lVar103 + ((iVar76 + 1) -
                                                                              iVar127)] -
                                      local_790[lVar92 + lVar102 + lVar103 + ((iVar76 + -1) -
                                                                             iVar127)]) * 0.5;
                            dVar223 = ABS(dVar186);
                            uVar169 = -(ulong)(0.0 < dVar214);
                            dVar214 = ABS(dVar214);
                            dVar210 = ABS(dVar209);
                            if (dVar223 <= dVar214) {
                              dVar214 = dVar223;
                            }
                            if (dVar214 <= dVar210) {
                              dVar210 = dVar214;
                            }
                            uVar185 = -(ulong)(0.0 < dVar186 * dVar209) & (ulong)dVar210;
                            dVar186 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                              uVar169 & uVar185);
                          }
                        }
                        if ((((local_808[lVar134 + lVar110 + lVar120] == 1.0) &&
                             (!NAN(local_808[lVar134 + lVar110 + lVar120]))) &&
                            (local_808[lVar134 + lVar117 + lVar120] == 1.0)) &&
                           (!NAN(local_808[lVar134 + lVar117 + lVar120]))) {
                          dVar214 = dVar216 - local_790[lVar103 + lVar102 + lVar138 + lVar119];
                          dVar223 = local_790[lVar103 + lVar102 + lVar140 + lVar119] - dVar216;
                          dVar214 = dVar214 + dVar214;
                          dVar223 = dVar223 + dVar223;
                          dVar210 = (local_790[lVar103 + lVar102 + lVar140 + lVar119] -
                                    local_790[lVar103 + lVar102 + lVar138 + lVar119]) * 0.5;
                          dVar206 = ABS(dVar214);
                          uVar169 = -(ulong)(0.0 < dVar210);
                          dVar210 = ABS(dVar210);
                          dVar209 = ABS(dVar223);
                          if (dVar206 <= dVar210) {
                            dVar210 = dVar206;
                          }
                          if (dVar210 <= dVar209) {
                            dVar209 = dVar210;
                          }
                          uVar185 = -(ulong)(0.0 < dVar214 * dVar223) & (ulong)dVar209;
                          dVar206 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                            uVar169 & uVar185);
                        }
                        if (((local_808[lVar109 + (int)((iVar162 + -2) - local_944) * local_588 +
                                                  lVar120] == 1.0) &&
                            (!NAN(local_808[lVar109 + (int)((iVar162 + -2) - local_944) * local_588
                                                      + lVar120]))) &&
                           ((local_808[lVar109 + lVar133 + lVar120] == 1.0 &&
                            (!NAN(local_808[lVar109 + lVar133 + lVar120]))))) {
                          dVar211 = dVar216 - local_790[lVar92 + lVar119 + (int)((iVar162 + -2) -
                                                                                local_8e8) *
                                                                           local_9b8 + lVar103];
                          dVar211 = dVar211 + dVar211;
                          dVar214 = (dVar196 - dVar216) + (dVar196 - dVar216);
                          dVar209 = (dVar196 -
                                    local_790[lVar92 + lVar119 + (int)((iVar162 + -2) - local_8e8) *
                                                                 local_9b8 + lVar103]) * 0.5;
                          dVar210 = ABS(dVar211);
                          uVar169 = -(ulong)(0.0 < dVar209);
                          dVar209 = ABS(dVar209);
                          dVar196 = ABS(dVar214);
                          if (dVar210 <= dVar209) {
                            dVar209 = dVar210;
                          }
                          if (dVar209 <= dVar196) {
                            dVar196 = dVar209;
                          }
                          uVar185 = -(ulong)(0.0 < dVar211 * dVar214) & (ulong)dVar196;
                          dVar211 = (double)(~uVar169 & (uVar185 ^ 0x8000000000000000) |
                                            uVar169 & uVar185);
                        }
                      }
                      uVar13 = local_4c8[lVar89 + lVar95 + lVar105].flag;
                      iVar83 = 0;
                      iVar99 = 0;
                      iVar77 = 0;
                      iVar101 = 0;
                      uVar142 = 0xffffffff;
                      do {
                        uVar100 = uVar142 + 1;
                        uVar115 = 0xffffffff;
                        iVar124 = iVar83;
                        do {
                          uVar1 = uVar115 + 1;
                          iVar130 = 5;
                          do {
                            if (((uVar13 >> (iVar124 + iVar130 & 0x1fU) & 1) != 0) &&
                               ((iVar130 != 6 || uVar115 != 0) || uVar142 != 0)) {
                              iVar99 = iVar99 + (uint)((iVar130 - 5U & 0xfffffffd) == 0 &&
                                                      (uVar115 == 0 && uVar142 == 0));
                              iVar77 = iVar77 + (uint)((iVar130 == 6 && uVar142 == 0) &&
                                                      (uVar1 & 0xfffffffd) == 0);
                              iVar101 = iVar101 + (uint)((iVar130 == 6 && uVar115 == 0) &&
                                                        (uVar100 & 0xfffffffd) == 0);
                            }
                            iVar130 = iVar130 + 1;
                          } while (iVar130 != 8);
                          iVar124 = iVar124 + 3;
                          uVar115 = uVar1;
                        } while (uVar1 != 2);
                        iVar83 = iVar83 + 9;
                        uVar142 = uVar100;
                      } while (uVar100 != 2);
                      dVar196 = 2.0;
                      if ((uVar13 >> 0x15 & 1) != 0) {
                        lVar95 = -1;
                        cVar139 = '\b';
                        auVar205._8_8_ = 0;
                        auVar205._0_8_ = dVar216;
                        dVar209 = dVar216;
                        do {
                          iVar83 = 0;
                          bVar168 = true;
                          do {
                            bVar114 = bVar168;
                            lVar163 = 0;
                            do {
                              if (((int)lVar163 != 1 || (iVar83 != 0 || (int)lVar95 != 0)) &&
                                 ((1 << ((char)lVar163 + (char)iVar83 * '\x03' + cVar139 & 0x1fU) &
                                  uVar13) != 0)) {
                                dVar196 = local_790[lVar103 + (iVar79 + (int)lVar95) * local_9b8 +
                                                              (iVar81 + iVar83) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar163)];
                                dVar210 = dVar196;
                                if (dVar196 <= auVar205._0_8_) {
                                  dVar210 = auVar205._0_8_;
                                }
                                auVar205._8_8_ = 0;
                                auVar205._0_8_ = dVar210;
                                if (dVar196 < dVar209) {
                                  dVar209 = dVar196;
                                }
                              }
                              lVar163 = lVar163 + 1;
                            } while (lVar163 != 3);
                            iVar83 = 1;
                            bVar168 = false;
                          } while (bVar114);
                          lVar95 = lVar95 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar95 != 2);
                        dVar210 = (((local_580 + lVar106 + lVar144 + (iVar76 - local_988))
                                    [local_900] - dVar183) * dVar211 +
                                  (0.5 - dVar182) * dVar206 +
                                  (local_580[lVar106 + lVar144 + (iVar76 - local_988)] - dVar202) *
                                  dVar186 + dVar216) - dVar216;
                        if (dVar210 <= 1e-13) {
                          dVar196 = 1.0;
                          if ((dVar210 < -1e-13) &&
                             (dVar196 = (dVar209 - dVar216) / dVar210, 1.0 <= dVar196)) {
                            dVar196 = 1.0;
                          }
                        }
                        else {
                          dVar196 = (auVar205._0_8_ - dVar216) / dVar210;
                          if (1.0 <= dVar196) {
                            dVar196 = 1.0;
                          }
                        }
                        if (2.0 <= dVar196) {
                          dVar196 = 2.0;
                        }
                      }
                      dVar209 = dVar196;
                      if ((short)uVar13 < 0) {
                        lVar95 = -1;
                        cVar139 = '\x05';
                        auVar208._8_8_ = 0;
                        auVar208._0_8_ = (ulong)dVar216;
                        dVar210 = dVar216;
                        do {
                          lVar163 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar146 = 0;
                            do {
                              if (((int)lVar146 != 1 || ((int)lVar163 != 0 || (int)lVar95 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar146 & 0x1fU) & uVar13) != 0)) {
                                dVar209 = local_790[lVar103 + (iVar79 + (int)lVar95) * local_9b8 +
                                                              (iVar81 + (int)lVar163) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar146)];
                                uVar200 = SUB84(dVar209,0);
                                uVar201 = (undefined4)((ulong)dVar209 >> 0x20);
                                if (dVar209 <= auVar208._0_8_) {
                                  uVar200 = auVar208._0_4_;
                                  uVar201 = auVar208._4_4_;
                                }
                                auVar208._4_4_ = uVar201;
                                auVar208._0_4_ = uVar200;
                                auVar208._8_8_ = 0;
                                if (dVar209 < dVar210) {
                                  dVar210 = dVar209;
                                }
                              }
                              lVar146 = lVar146 + 1;
                            } while (lVar146 != 3);
                            cVar122 = cVar122 + '\x03';
                            bVar168 = lVar163 != 0;
                            lVar163 = lVar163 + 1;
                          } while (bVar168);
                          lVar95 = lVar95 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar95 != 2);
                        dVar214 = (((local_580 + lVar106 + lVar150 + (iVar76 - local_988))
                                    [local_900] - dVar183) * dVar211 +
                                  -(dVar182 + 0.5) * dVar206 +
                                  (local_580[lVar106 + lVar150 + (iVar76 - local_988)] - dVar202) *
                                  dVar186 + dVar216) - dVar216;
                        if (dVar214 <= 1e-13) {
                          dVar209 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar209 = (dVar210 - dVar216) / dVar214, 1.0 <= dVar209)) {
                            dVar209 = 1.0;
                          }
                        }
                        else {
                          dVar209 = (auVar208._0_8_ - dVar216) / dVar214;
                          if (1.0 <= dVar209) {
                            dVar209 = 1.0;
                          }
                        }
                        if (dVar196 <= dVar209) {
                          dVar209 = dVar196;
                        }
                      }
                      dVar196 = dVar209;
                      if ((uVar13 >> 0x13 & 1) != 0) {
                        dVar216 = local_790[lVar92 + lVar119 + lVar102 + lVar103];
                        lVar95 = -1;
                        auVar221._8_8_ = 0;
                        auVar221._0_8_ = (ulong)dVar216;
                        dVar210 = dVar216;
                        do {
                          lVar163 = -1;
                          do {
                            iVar83 = 0;
                            bVar168 = true;
                            do {
                              bVar114 = bVar168;
                              if ((((int)lVar163 != 0 || (int)lVar95 != 0) || iVar83 != 0) &&
                                 ((1 << ((char)lVar163 * '\x03' + (char)lVar95 * '\t' + '\x12' +
                                         (char)iVar83 & 0x1fU) & uVar13) != 0)) {
                                dVar196 = local_790[lVar103 + (iVar79 + (int)lVar95) * local_9b8 +
                                                              (iVar81 + (int)lVar163) * local_9e8 +
                                                              (long)(iVar83 + iVar98)];
                                uVar200 = SUB84(dVar196,0);
                                uVar201 = (undefined4)((ulong)dVar196 >> 0x20);
                                if (dVar196 <= auVar221._0_8_) {
                                  uVar200 = auVar221._0_4_;
                                  uVar201 = auVar221._4_4_;
                                }
                                if (dVar196 < dVar210) {
                                  dVar210 = dVar196;
                                }
                                auVar221._4_4_ = uVar201;
                                auVar221._0_4_ = uVar200;
                                auVar221._8_8_ = 0;
                              }
                              iVar83 = 1;
                              bVar168 = false;
                            } while (bVar114);
                            lVar163 = lVar163 + 1;
                          } while (lVar163 != 2);
                          lVar95 = lVar95 + 1;
                        } while (lVar95 != 2);
                        dVar214 = (((local_578 + lVar107 + lVar153 + ((iVar76 - local_990) + 1))
                                    [local_918] - dVar183) * dVar211 +
                                  (local_578[lVar107 + lVar153 + ((iVar76 - local_990) + 1)] -
                                  dVar182) * dVar206 + (0.5 - dVar202) * dVar186 + dVar216) -
                                  dVar216;
                        if (dVar214 <= 1e-13) {
                          dVar196 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar196 = (dVar210 - dVar216) / dVar214, 1.0 <= dVar196)) {
                            dVar196 = 1.0;
                          }
                        }
                        else {
                          dVar196 = (auVar221._0_8_ - dVar216) / dVar214;
                          if (1.0 <= dVar196) {
                            dVar196 = 1.0;
                          }
                        }
                        if (dVar209 <= dVar196) {
                          dVar196 = dVar209;
                        }
                      }
                      dVar216 = dVar196;
                      if ((uVar13 >> 0x11 & 1) != 0) {
                        dVar209 = local_790[lVar92 + lVar119 + lVar102 + lVar103];
                        lVar95 = -1;
                        cVar139 = '\x05';
                        auVar222._8_8_ = 0;
                        auVar222._0_8_ = (ulong)dVar209;
                        dVar210 = dVar209;
                        do {
                          lVar163 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar146 = 0;
                            do {
                              if (((int)lVar146 != 1 || ((int)lVar163 != 0 || (int)lVar95 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar146 & 0x1fU) & uVar13) != 0)) {
                                dVar216 = local_790[lVar103 + (iVar79 + (int)lVar95) * local_9b8 +
                                                              (iVar81 + (int)lVar163) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar146)];
                                uVar200 = SUB84(dVar216,0);
                                uVar201 = (undefined4)((ulong)dVar216 >> 0x20);
                                if (dVar216 <= auVar222._0_8_) {
                                  uVar200 = auVar222._0_4_;
                                  uVar201 = auVar222._4_4_;
                                }
                                if (dVar216 < dVar210) {
                                  dVar210 = dVar216;
                                }
                                auVar222._4_4_ = uVar201;
                                auVar222._0_4_ = uVar200;
                                auVar222._8_8_ = 0;
                              }
                              lVar146 = lVar146 + 1;
                            } while (lVar146 != 2);
                            lVar163 = lVar163 + 1;
                            cVar122 = cVar122 + '\x03';
                          } while (lVar163 != 2);
                          lVar95 = lVar95 + 1;
                          cVar139 = cVar139 + '\t';
                        } while (lVar95 != 2);
                        dVar214 = (((local_578 + lVar107 + lVar153 + (iVar76 - local_990))
                                    [local_918] - dVar183) * dVar211 +
                                  (local_578[lVar107 + lVar153 + (iVar76 - local_990)] - dVar182) *
                                  dVar206 + (dVar209 - (dVar202 + 0.5) * dVar186)) - dVar209;
                        if (dVar214 <= 1e-13) {
                          dVar216 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar216 = (dVar210 - dVar209) / dVar214, 1.0 <= dVar216)) {
                            dVar216 = 1.0;
                          }
                        }
                        else {
                          dVar216 = (auVar222._0_8_ - dVar209) / dVar214;
                          if (1.0 <= dVar216) {
                            dVar216 = 1.0;
                          }
                        }
                        if (dVar196 <= dVar216) {
                          dVar216 = dVar196;
                        }
                      }
                      dVar196 = dVar216;
                      if ((uVar13 >> 0x1b & 1) != 0) {
                        dVar209 = local_790[lVar92 + lVar119 + lVar102 + lVar103];
                        iVar98 = 0;
                        dVar196 = dVar209;
                        dVar210 = dVar209;
                        bVar168 = true;
                        do {
                          bVar114 = bVar168;
                          iVar83 = iVar98 * 9 + 0xe;
                          lVar95 = -1;
                          do {
                            lVar163 = 0;
                            do {
                              if (((int)lVar163 != 1 || ((int)lVar95 != 0 || iVar98 != 0)) &&
                                 ((1 << ((char)iVar83 + (char)lVar163 & 0x1fU) & uVar13) != 0)) {
                                dVar214 = local_790[lVar103 + (iVar79 + iVar98) * local_9b8 +
                                                              (iVar81 + (int)lVar95) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar163)];
                                uVar200 = SUB84(dVar214,0);
                                uVar201 = (undefined4)((ulong)dVar214 >> 0x20);
                                if (dVar214 <= dVar196) {
                                  uVar200 = SUB84(dVar196,0);
                                  uVar201 = (undefined4)((ulong)dVar196 >> 0x20);
                                }
                                if (dVar214 < dVar210) {
                                  dVar210 = dVar214;
                                }
                                dVar196 = (double)CONCAT44(uVar201,uVar200);
                              }
                              lVar163 = lVar163 + 1;
                            } while (lVar163 != 3);
                            lVar95 = lVar95 + 1;
                            iVar83 = iVar83 + 3;
                          } while (lVar95 != 2);
                          iVar98 = 1;
                          bVar168 = false;
                        } while (bVar114);
                        dVar214 = ((0.5 - dVar183) * dVar211 +
                                  (pdVar18[local_950] - dVar182) * dVar206 +
                                  (*pdVar18 - dVar202) * dVar186 + dVar209) - dVar209;
                        if (dVar214 <= 1e-13) {
                          dVar196 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar196 = (dVar210 - dVar209) / dVar214, 1.0 <= dVar196)) {
                            dVar196 = 1.0;
                          }
                        }
                        else {
                          dVar196 = (dVar196 - dVar209) / dVar214;
                          if (1.0 <= dVar196) {
                            dVar196 = 1.0;
                          }
                        }
                        if (dVar216 <= dVar196) {
                          dVar196 = dVar216;
                        }
                      }
                      dVar216 = dVar196;
                      if ((uVar13 >> 9 & 1) != 0) {
                        dVar209 = local_790[lVar92 + lVar119 + lVar102 + lVar103];
                        cVar139 = '\x05';
                        lVar95 = -1;
                        dVar216 = dVar209;
                        dVar210 = dVar209;
                        do {
                          lVar163 = -1;
                          cVar122 = cVar139;
                          do {
                            lVar146 = 0;
                            do {
                              if (((int)lVar146 != 1 || ((int)lVar163 != 0 || (int)lVar95 != 0)) &&
                                 ((1 << (cVar122 + (char)lVar146 & 0x1fU) & uVar13) != 0)) {
                                dVar214 = local_790[lVar103 + (iVar79 + (int)lVar95) * local_9b8 +
                                                              (iVar81 + (int)lVar163) * local_9e8 +
                                                              (long)(iVar152 + (int)lVar146)];
                                uVar200 = SUB84(dVar214,0);
                                uVar201 = (undefined4)((ulong)dVar214 >> 0x20);
                                if (dVar214 <= dVar216) {
                                  uVar200 = SUB84(dVar216,0);
                                  uVar201 = (undefined4)((ulong)dVar216 >> 0x20);
                                }
                                if (dVar214 < dVar210) {
                                  dVar210 = dVar214;
                                }
                                dVar216 = (double)CONCAT44(uVar201,uVar200);
                              }
                              lVar146 = lVar146 + 1;
                            } while (lVar146 != 3);
                            lVar163 = lVar163 + 1;
                            cVar122 = cVar122 + '\x03';
                          } while (lVar163 != 2);
                          cVar139 = cVar139 + '\t';
                          bVar168 = lVar95 != 0;
                          lVar95 = lVar95 + 1;
                        } while (bVar168);
                        dVar214 = ((((local_4c0 +
                                     lVar90 + lVar112 + (iVar97 - local_8e0) * local_718)[local_950]
                                    - dVar182) * dVar206 +
                                   (local_4c0[lVar90 + lVar112 + (iVar97 - local_8e0) * local_718] -
                                   dVar202) * dVar186 + dVar209) - (dVar183 + 0.5) * dVar211) -
                                  dVar209;
                        if (dVar214 <= 1e-13) {
                          dVar216 = 1.0;
                          if ((dVar214 < -1e-13) &&
                             (dVar216 = (dVar210 - dVar209) / dVar214, 1.0 <= dVar216)) {
                            dVar216 = 1.0;
                          }
                        }
                        else {
                          dVar216 = (dVar216 - dVar209) / dVar214;
                          if (1.0 <= dVar216) {
                            dVar216 = 1.0;
                          }
                        }
                        if (dVar196 <= dVar216) {
                          dVar216 = dVar196;
                        }
                      }
                      uVar200 = 0;
                      uVar201 = 0;
                      if (1 < iVar99) {
                        uVar200 = SUB84(dVar216,0);
                        uVar201 = (undefined4)((ulong)dVar216 >> 0x20);
                      }
                      dVar196 = 0.0;
                      if (1 < iVar77) {
                        dVar196 = dVar216;
                      }
                      dVar209 = 0.0;
                      if (1 < iVar101) {
                        dVar209 = dVar216;
                      }
                      if ((local_808[lVar109 + lVar134 + lVar120] == 1.0) &&
                         (!NAN(local_808[lVar109 + lVar134 + lVar120]))) {
                        if ((local_808[lVar109 + lVar134 + (int)(~local_984 + iVar76)] == 1.0) &&
                           (((!NAN(local_808[lVar109 + lVar134 + (int)(~local_984 + iVar76)]) &&
                             (local_808[lVar109 + lVar134 + (iVar82 + 1)] == 1.0)) &&
                            (!NAN(local_808[lVar109 + lVar134 + (iVar82 + 1)]))))) {
                          uVar200 = 0;
                          uVar201 = 0x3ff00000;
                        }
                        if (((local_808[lVar134 + lVar154 + lVar120] == 1.0) &&
                            (!NAN(local_808[lVar134 + lVar154 + lVar120]))) &&
                           ((local_808[lVar134 + lVar93 + lVar120] == 1.0 &&
                            (!NAN(local_808[lVar134 + lVar93 + lVar120]))))) {
                          dVar196 = 1.0;
                        }
                        if (((local_808[lVar109 + (iVar80 + -2) * local_588 + lVar120] == 1.0) &&
                            (!NAN(local_808[lVar109 + (iVar80 + -2) * local_588 + lVar120]))) &&
                           ((local_808[lVar109 + lVar133 + lVar120] == 1.0 &&
                            (!NAN(local_808[lVar109 + lVar133 + lVar120]))))) {
                          dVar209 = 1.0;
                        }
                      }
                      dVar173 = (0.5 - dVar183) * dVar211 * dVar209 +
                                (dVar173 - dVar202) * dVar186 * (double)CONCAT44(uVar201,uVar200) +
                                local_790[lVar92 + lVar119 + lVar102 + lVar103] +
                                (dVar171 - dVar182) * dVar206 * dVar196;
                      if (dVar173 <= dVar172) {
                        dVar172 = dVar173;
                      }
                      if (dVar198 <= dVar172) {
                        dVar198 = dVar172;
                      }
                      iVar98 = d_bcrec_ptr[local_800].bc[5];
                      if (iVar11 == iVar162) {
                        switch(d_bcrec_ptr[local_800].bc[2]) {
                        case 1:
switchD_00488830_caseD_1:
                          dVar198 = dVar195;
                          break;
                        case 2:
                        case 4:
                          if ((local_800 != 2 || !is_velocity) ||
                              pdVar14[lVar108 + lVar111 + (iVar76 - iVar128)] < 0.0)
                          goto switchD_00488830_caseD_1;
                          dVar198 = 0.0;
                          if (dVar195 <= 0.0) {
                            dVar198 = dVar195;
                          }
LAB_00488903:
                          dVar195 = dVar198;
                          dVar198 = dVar195;
                          break;
                        case 3:
                          dVar198 = local_790[lVar92 + lVar119 + (int)(~local_8e8 + iVar162) *
                                                                 local_9b8 + lVar103];
                          if (local_800 == 2 && is_velocity) goto LAB_00488903;
                          break;
                        case -1:
                          dVar195 = 0.0;
                          dVar198 = 0.0;
                        }
                        if (iVar147 == iVar162) goto switchD_004888b3_caseD_0;
                      }
                      else {
                        if (iVar147 != iVar162) goto LAB_0048899d;
                        switch(iVar98) {
                        case 1:
                        case 2:
                        case 4:
                          dVar195 = dVar198;
                          break;
                        case 3:
                          dVar173 = local_790[lVar92 + lVar119 + lVar84 + lVar103];
                          dVar195 = local_790[lVar92 + lVar119 + lVar84 + lVar103];
                          if (local_800 != 2 || !is_velocity) goto LAB_0048899d;
                          goto LAB_00488968;
                        case -1:
                          dVar198 = 0.0;
                          dVar195 = 0.0;
                          goto LAB_0048899d;
                        }
switchD_004888b3_caseD_0:
                        if (((iVar98 == 4) || (iVar98 == 2)) &&
                           (dVar195 = dVar198,
                           (local_800 == 2 && is_velocity) &&
                           pdVar14[lVar108 + lVar111 + (iVar76 - iVar128)] <= 0.0)) {
                          dVar173 = 0.0;
                          if (0.0 <= dVar198) {
                            dVar173 = dVar198;
                          }
LAB_00488968:
                          dVar198 = dVar173;
                          dVar195 = dVar198;
                        }
                      }
LAB_0048899d:
                      dVar173 = dVar198;
                      if ((pdVar14[lVar108 + lVar111 + (iVar76 - iVar128)] <= 1e-08) &&
                         (dVar173 = dVar195,
                         -1e-08 <= pdVar14[lVar108 + lVar111 + (iVar76 - iVar128)])) {
                        dVar173 = (dVar195 + dVar198) * 0.5;
                      }
                    }
                    pdVar15[lVar21 * local_800 +
                            ((long)iVar162 - (long)iVar141) * lVar20 +
                            (lVar94 - iVar123) * lVar19 + (lVar151 - iVar165)] = dVar173;
                    iVar131 = iVar131 + 1;
                    iVar152 = iVar152 + 1;
                    bVar168 = iVar76 != iVar9;
                    iVar76 = iVar76 + 1;
                  } while (bVar168);
                }
                bVar168 = iVar75 != iVar10;
                iVar75 = iVar75 + 1;
              } while (bVar168);
            }
            bVar168 = iVar162 != iVar96;
            iVar162 = iVar162 + 1;
          } while (bVar168);
        }
        local_800 = local_800 + 1;
        if (local_800 == uVar132) {
          return;
        }
      } while( true );
    }
  }
  local_398.d_bcrec_ptr = d_bcrec_ptr;
  local_398.q.p = q->p;
  local_398.q.jstride = q->jstride;
  local_398.q.kstride = q->kstride;
  local_398.q.nstride = q->nstride;
  local_398.q.begin.x = (q->begin).x;
  local_398.q.begin.y = (q->begin).y;
  uVar26 = *(undefined8 *)&(q->begin).z;
  uVar27 = (q->end).y;
  local_398.q._52_8_ = *(undefined8 *)&(q->end).z;
  local_398.q.begin.z = (int)uVar26;
  local_398.q.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.ccc.p = ccc->p;
  local_398.ccc.jstride = ccc->jstride;
  local_398.ccc.kstride = ccc->kstride;
  local_398.ccc.nstride = ccc->nstride;
  local_398.ccc.begin.x = (ccc->begin).x;
  local_398.ccc.begin.y = (ccc->begin).y;
  uVar26 = *(undefined8 *)&(ccc->begin).z;
  uVar28 = (ccc->end).y;
  local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
  local_398.ccc.begin.z = (int)uVar26;
  local_398.ccc.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.fcx.p = fcx->p;
  local_398.fcx.jstride = fcx->jstride;
  local_398.fcx.kstride = fcx->kstride;
  local_398.fcx.nstride = fcx->nstride;
  local_398.fcx.begin.x = (fcx->begin).x;
  local_398.fcx.begin.y = (fcx->begin).y;
  uVar29 = (fcx->end).x;
  uVar30 = (fcx->end).y;
  local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
  local_398.fcx.begin.z = (int)*(undefined8 *)&(fcx->begin).z;
  local_398.fcy.p = fcy->p;
  local_398.fcy.jstride = fcy->jstride;
  local_398.fcy.kstride = fcy->kstride;
  local_398.fcy.nstride = fcy->nstride;
  local_398.fcy.begin.x = (fcy->begin).x;
  local_398.fcy.begin.y = (fcy->begin).y;
  uVar31 = (fcy->end).x;
  uVar32 = (fcy->end).y;
  local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
  local_398.fcy.begin.z = (int)*(undefined8 *)&(fcy->begin).z;
  local_398.fcz.p = fcz->p;
  local_398.fcz.jstride = fcz->jstride;
  local_398.fcz.kstride = fcz->kstride;
  local_398.fcz.nstride = fcz->nstride;
  local_398.fcz.begin.x = (fcz->begin).x;
  local_398.fcz.begin.y = (fcz->begin).y;
  uVar33 = (fcz->end).x;
  uVar34 = (fcz->end).y;
  local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
  local_398.fcz.begin.z = (int)*(undefined8 *)&(fcz->begin).z;
  local_398.flag.p = flag->p;
  local_398.flag.jstride = flag->jstride;
  local_398.flag.kstride = flag->kstride;
  local_398.flag.nstride = flag->nstride;
  local_398.flag.begin.x = (flag->begin).x;
  local_398.flag.begin.y = (flag->begin).y;
  uVar35 = (flag->end).x;
  uVar36 = (flag->end).y;
  local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
  local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
  local_398.umac.p = umac->p;
  local_398.umac.jstride = umac->jstride;
  local_398.umac.kstride = umac->kstride;
  local_398.umac.nstride = umac->nstride;
  local_398.umac.begin.x = (umac->begin).x;
  local_398.umac.begin.y = (umac->begin).y;
  uVar26 = *(undefined8 *)&(umac->begin).z;
  uVar37 = (umac->end).y;
  local_398.umac._52_8_ = *(undefined8 *)&(umac->end).z;
  local_398.umac.begin.z = (int)uVar26;
  local_398.umac.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.xedge.p = xedge->p;
  local_398.xedge.jstride = xedge->jstride;
  local_398.xedge.kstride = xedge->kstride;
  local_398.xedge.nstride = xedge->nstride;
  local_398.xedge.begin.x = (xedge->begin).x;
  local_398.xedge.begin.y = (xedge->begin).y;
  uVar38 = (xedge->end).x;
  uVar39 = (xedge->end).y;
  local_398.xedge._52_8_ = *(undefined8 *)&(xedge->end).z;
  local_398.xedge.begin.z = (int)*(undefined8 *)&(xedge->begin).z;
  local_398.domain.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar26 = *(undefined8 *)(domain->bigend).vect;
  local_398.domain._20_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  local_398.domain.smallend.vect[2] = (int)*(undefined8 *)((domain->smallend).vect + 2);
  local_398.domain.bigend.vect[0] = (int)uVar26;
  local_398.domain.bigend.vect[1] = (int)((ulong)uVar26 >> 0x20);
  local_398.vfrac.p = vfrac->p;
  local_398.vfrac.jstride = vfrac->jstride;
  local_398.vfrac.kstride = vfrac->kstride;
  local_398.vfrac.nstride = vfrac->nstride;
  local_398.vfrac.begin.x = (vfrac->begin).x;
  local_398.vfrac.begin.y = (vfrac->begin).y;
  uVar40 = (vfrac->end).x;
  uVar41 = (vfrac->end).y;
  local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
  local_398.order = 2;
  local_398.is_velocity = is_velocity;
  if (0 < ncomp) {
    iVar127 = 0;
    local_398.q.end.y = uVar27;
    local_398.ccc.end.y = uVar28;
    local_398.fcx.end.x = uVar29;
    local_398.fcx.end.y = uVar30;
    local_398.fcy.end.x = uVar31;
    local_398.fcy.end.y = uVar32;
    local_398.fcz.end.x = uVar33;
    local_398.fcz.end.y = uVar34;
    local_398.flag.end.x = uVar35;
    local_398.flag.end.y = uVar36;
    local_398.umac.end.y = uVar37;
    local_398.xedge.end.x = uVar38;
    local_398.xedge.end.y = uVar39;
    local_398.vfrac.end.x = uVar40;
    local_398.vfrac.end.y = uVar41;
    do {
      iVar156 = iVar8;
      if (iVar8 <= iVar128) {
        do {
          iVar161 = iVar7;
          if (iVar7 <= iVar10) {
            do {
              iVar165 = iVar6;
              if (iVar6 <= iVar123) {
                do {
                  ComputeEdgeState::anon_class_624_13_64a6b87d::operator()
                            (&local_398,iVar165,iVar161,iVar156,iVar127);
                  iVar165 = iVar165 + 1;
                } while (iVar9 + (~uVar143 & 1) + 1 != iVar165);
              }
              bVar168 = iVar161 != iVar10;
              iVar161 = iVar161 + 1;
            } while (bVar168);
          }
          bVar168 = iVar156 != iVar128;
          iVar156 = iVar156 + 1;
        } while (bVar168);
      }
      iVar127 = iVar127 + 1;
    } while (iVar127 != ncomp);
  }
  local_398.d_bcrec_ptr = d_bcrec_ptr;
  local_398.q.p = q->p;
  local_398.q.jstride = q->jstride;
  local_398.q.kstride = q->kstride;
  local_398.q.nstride = q->nstride;
  local_398.q.begin.x = (q->begin).x;
  local_398.q.begin.y = (q->begin).y;
  uVar26 = *(undefined8 *)&(q->begin).z;
  uVar42 = (q->end).y;
  local_398.q._52_8_ = *(undefined8 *)&(q->end).z;
  local_398.q.begin.z = (int)uVar26;
  local_398.q.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.ccc.p = ccc->p;
  local_398.ccc.jstride = ccc->jstride;
  local_398.ccc.kstride = ccc->kstride;
  local_398.ccc.nstride = ccc->nstride;
  local_398.ccc.begin.x = (ccc->begin).x;
  local_398.ccc.begin.y = (ccc->begin).y;
  uVar26 = *(undefined8 *)&(ccc->begin).z;
  uVar43 = (ccc->end).y;
  local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
  local_398.ccc.begin.z = (int)uVar26;
  local_398.ccc.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.fcx.p = fcx->p;
  local_398.fcx.jstride = fcx->jstride;
  local_398.fcx.kstride = fcx->kstride;
  local_398.fcx.nstride = fcx->nstride;
  local_398.fcx.begin.x = (fcx->begin).x;
  local_398.fcx.begin.y = (fcx->begin).y;
  uVar44 = (fcx->end).x;
  uVar45 = (fcx->end).y;
  local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
  local_398.fcx.begin.z = (int)*(undefined8 *)&(fcx->begin).z;
  local_398.fcy.p = fcy->p;
  local_398.fcy.jstride = fcy->jstride;
  local_398.fcy.kstride = fcy->kstride;
  local_398.fcy.nstride = fcy->nstride;
  local_398.fcy.begin.x = (fcy->begin).x;
  local_398.fcy.begin.y = (fcy->begin).y;
  uVar46 = (fcy->end).x;
  uVar47 = (fcy->end).y;
  local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
  local_398.fcy.begin.z = (int)*(undefined8 *)&(fcy->begin).z;
  local_398.fcz.p = fcz->p;
  local_398.fcz.jstride = fcz->jstride;
  local_398.fcz.kstride = fcz->kstride;
  local_398.fcz.nstride = fcz->nstride;
  local_398.fcz.begin.x = (fcz->begin).x;
  local_398.fcz.begin.y = (fcz->begin).y;
  uVar48 = (fcz->end).x;
  uVar49 = (fcz->end).y;
  local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
  local_398.fcz.begin.z = (int)*(undefined8 *)&(fcz->begin).z;
  local_398.flag.p = flag->p;
  local_398.flag.jstride = flag->jstride;
  local_398.flag.kstride = flag->kstride;
  local_398.flag.nstride = flag->nstride;
  local_398.flag.begin.x = (flag->begin).x;
  local_398.flag.begin.y = (flag->begin).y;
  uVar50 = (flag->end).x;
  uVar51 = (flag->end).y;
  local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
  local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
  local_398.umac.p = vmac->p;
  local_398.umac.jstride = vmac->jstride;
  local_398.umac.kstride = vmac->kstride;
  local_398.umac.nstride = vmac->nstride;
  local_398.umac.begin.x = (vmac->begin).x;
  local_398.umac.begin.y = (vmac->begin).y;
  uVar26 = *(undefined8 *)&(vmac->begin).z;
  uVar52 = (vmac->end).y;
  local_398.umac._52_8_ = *(undefined8 *)&(vmac->end).z;
  local_398.umac.begin.z = (int)uVar26;
  local_398.umac.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.xedge.p = yedge->p;
  local_398.xedge.jstride = yedge->jstride;
  local_398.xedge.kstride = yedge->kstride;
  local_398.xedge.nstride = yedge->nstride;
  local_398.xedge.begin.x = (yedge->begin).x;
  local_398.xedge.begin.y = (yedge->begin).y;
  uVar53 = (yedge->end).x;
  uVar54 = (yedge->end).y;
  local_398.xedge._52_8_ = *(undefined8 *)&(yedge->end).z;
  local_398.xedge.begin.z = (int)*(undefined8 *)&(yedge->begin).z;
  local_398.domain.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar26 = *(undefined8 *)(domain->bigend).vect;
  local_398.domain._20_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  local_398.domain.smallend.vect[2] = (int)*(undefined8 *)((domain->smallend).vect + 2);
  local_398.domain.bigend.vect[0] = (int)uVar26;
  local_398.domain.bigend.vect[1] = (int)((ulong)uVar26 >> 0x20);
  local_398.vfrac.p = vfrac->p;
  local_398.vfrac.jstride = vfrac->jstride;
  local_398.vfrac.kstride = vfrac->kstride;
  local_398.vfrac.nstride = vfrac->nstride;
  local_398.vfrac.begin.x = (vfrac->begin).x;
  local_398.vfrac.begin.y = (vfrac->begin).y;
  uVar55 = (vfrac->end).x;
  uVar56 = (vfrac->end).y;
  local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
  local_398.order = 2;
  local_398.is_velocity = is_velocity;
  if (0 < ncomp) {
    iVar127 = 0;
    local_398.q.end.y = uVar42;
    local_398.ccc.end.y = uVar43;
    local_398.fcx.end.x = uVar44;
    local_398.fcx.end.y = uVar45;
    local_398.fcy.end.x = uVar46;
    local_398.fcy.end.y = uVar47;
    local_398.fcz.end.x = uVar48;
    local_398.fcz.end.y = uVar49;
    local_398.flag.end.x = uVar50;
    local_398.flag.end.y = uVar51;
    local_398.umac.end.y = uVar52;
    local_398.xedge.end.x = uVar53;
    local_398.xedge.end.y = uVar54;
    local_398.vfrac.end.x = uVar55;
    local_398.vfrac.end.y = uVar56;
    do {
      iVar156 = iVar8;
      if (iVar8 <= iVar128) {
        do {
          iVar161 = iVar7;
          if (iVar7 <= iVar141) {
            do {
              iVar165 = iVar6;
              if (iVar6 <= iVar9) {
                do {
                  ComputeEdgeState::anon_class_624_13_8d2f967f::operator()
                            ((anon_class_624_13_8d2f967f *)&local_398,iVar165,iVar161,iVar156,
                             iVar127);
                  iVar165 = iVar165 + 1;
                } while (iVar9 + 1 != iVar165);
              }
              bVar168 = iVar161 != iVar141;
              iVar161 = iVar161 + 1;
            } while (bVar168);
          }
          bVar168 = iVar156 != iVar128;
          iVar156 = iVar156 + 1;
        } while (bVar168);
      }
      iVar127 = iVar127 + 1;
    } while (iVar127 != ncomp);
  }
  local_398.d_bcrec_ptr = d_bcrec_ptr;
  local_398.q.p = q->p;
  local_398.q.jstride = q->jstride;
  local_398.q.kstride = q->kstride;
  local_398.q.nstride = q->nstride;
  local_398.q.begin.x = (q->begin).x;
  local_398.q.begin.y = (q->begin).y;
  uVar26 = *(undefined8 *)&(q->begin).z;
  uVar57 = (q->end).y;
  local_398.q._52_8_ = *(undefined8 *)&(q->end).z;
  local_398.q.begin.z = (int)uVar26;
  local_398.q.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.ccc.p = ccc->p;
  local_398.ccc.jstride = ccc->jstride;
  local_398.ccc.kstride = ccc->kstride;
  local_398.ccc.nstride = ccc->nstride;
  local_398.ccc.begin.x = (ccc->begin).x;
  local_398.ccc.begin.y = (ccc->begin).y;
  uVar26 = *(undefined8 *)&(ccc->begin).z;
  uVar58 = (ccc->end).y;
  local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
  local_398.ccc.begin.z = (int)uVar26;
  local_398.ccc.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.fcx.p = fcx->p;
  local_398.fcx.jstride = fcx->jstride;
  local_398.fcx.kstride = fcx->kstride;
  local_398.fcx.nstride = fcx->nstride;
  local_398.fcx.begin.x = (fcx->begin).x;
  local_398.fcx.begin.y = (fcx->begin).y;
  uVar59 = (fcx->end).x;
  uVar60 = (fcx->end).y;
  local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
  local_398.fcx.begin.z = (int)*(undefined8 *)&(fcx->begin).z;
  local_398.fcy.p = fcy->p;
  local_398.fcy.jstride = fcy->jstride;
  local_398.fcy.kstride = fcy->kstride;
  local_398.fcy.nstride = fcy->nstride;
  local_398.fcy.begin.x = (fcy->begin).x;
  local_398.fcy.begin.y = (fcy->begin).y;
  uVar61 = (fcy->end).x;
  uVar62 = (fcy->end).y;
  local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
  local_398.fcy.begin.z = (int)*(undefined8 *)&(fcy->begin).z;
  local_398.fcz.p = fcz->p;
  local_398.fcz.jstride = fcz->jstride;
  local_398.fcz.kstride = fcz->kstride;
  local_398.fcz.nstride = fcz->nstride;
  local_398.fcz.begin.x = (fcz->begin).x;
  local_398.fcz.begin.y = (fcz->begin).y;
  uVar63 = (fcz->end).x;
  uVar64 = (fcz->end).y;
  local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
  local_398.fcz.begin.z = (int)*(undefined8 *)&(fcz->begin).z;
  local_398.flag.p = flag->p;
  local_398.flag.jstride = flag->jstride;
  local_398.flag.kstride = flag->kstride;
  local_398.flag.nstride = flag->nstride;
  local_398.flag.begin.x = (flag->begin).x;
  local_398.flag.begin.y = (flag->begin).y;
  uVar65 = (flag->end).x;
  uVar66 = (flag->end).y;
  local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
  local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
  local_398.umac.p = wmac->p;
  local_398.umac.jstride = wmac->jstride;
  local_398.umac.kstride = wmac->kstride;
  local_398.umac.nstride = wmac->nstride;
  local_398.umac.begin.x = (wmac->begin).x;
  local_398.umac.begin.y = (wmac->begin).y;
  uVar26 = *(undefined8 *)&(wmac->begin).z;
  uVar67 = (wmac->end).y;
  local_398.umac._52_8_ = *(undefined8 *)&(wmac->end).z;
  local_398.umac.begin.z = (int)uVar26;
  local_398.umac.end.x = (int)((ulong)uVar26 >> 0x20);
  local_398.xedge.p = zedge->p;
  local_398.xedge.jstride = zedge->jstride;
  local_398.xedge.kstride = zedge->kstride;
  local_398.xedge.nstride = zedge->nstride;
  local_398.xedge.begin.x = (zedge->begin).x;
  local_398.xedge.begin.y = (zedge->begin).y;
  uVar68 = (zedge->end).x;
  uVar69 = (zedge->end).y;
  local_398.xedge._52_8_ = *(undefined8 *)&(zedge->end).z;
  local_398.xedge.begin.z = (int)*(undefined8 *)&(zedge->begin).z;
  local_398.domain.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar26 = *(undefined8 *)(domain->bigend).vect;
  local_398.domain._20_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  local_398.domain.smallend.vect[2] = (int)*(undefined8 *)((domain->smallend).vect + 2);
  local_398.domain.bigend.vect[0] = (int)uVar26;
  local_398.domain.bigend.vect[1] = (int)((ulong)uVar26 >> 0x20);
  local_398.vfrac.p = vfrac->p;
  local_398.vfrac.jstride = vfrac->jstride;
  local_398.vfrac.kstride = vfrac->kstride;
  local_398.vfrac.nstride = vfrac->nstride;
  local_398.vfrac.begin.x = (vfrac->begin).x;
  local_398.vfrac.begin.y = (vfrac->begin).y;
  uVar70 = (vfrac->end).x;
  uVar71 = (vfrac->end).y;
  local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
  local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
  local_398.order = 2;
  local_398.is_velocity = is_velocity;
  if (0 < ncomp) {
    iVar128 = 0;
    local_398.q.end.y = uVar57;
    local_398.ccc.end.y = uVar58;
    local_398.fcx.end.x = uVar59;
    local_398.fcx.end.y = uVar60;
    local_398.fcy.end.x = uVar61;
    local_398.fcy.end.y = uVar62;
    local_398.fcz.end.x = uVar63;
    local_398.fcz.end.y = uVar64;
    local_398.flag.end.x = uVar65;
    local_398.flag.end.y = uVar66;
    local_398.umac.end.y = uVar67;
    local_398.xedge.end.x = uVar68;
    local_398.xedge.end.y = uVar69;
    local_398.vfrac.end.x = uVar70;
    local_398.vfrac.end.y = uVar71;
    do {
      iVar127 = iVar8;
      if (iVar8 <= iVar96) {
        do {
          iVar156 = iVar7;
          if (iVar7 <= iVar10) {
            do {
              iVar161 = iVar6;
              if (iVar6 <= iVar9) {
                do {
                  ComputeEdgeState::anon_class_624_13_b5b87481::operator()
                            ((anon_class_624_13_b5b87481 *)&local_398,iVar161,iVar156,iVar127,
                             iVar128);
                  iVar161 = iVar161 + 1;
                } while (iVar9 + 1 != iVar161);
              }
              bVar168 = iVar156 != iVar10;
              iVar156 = iVar156 + 1;
            } while (bVar168);
          }
          bVar168 = iVar127 != iVar96;
          iVar127 = iVar127 + 1;
        } while (bVar168);
      }
      iVar128 = iVar128 + 1;
    } while (iVar128 != ncomp);
  }
  return;
}

Assistant:

void
EBMOL::ComputeEdgeState ( Box const& bx,
                          AMREX_D_DECL( Array4<Real> const& xedge,
                                        Array4<Real> const& yedge,
                                        Array4<Real> const& zedge),
                          Array4<Real const> const& q,
                          const int ncomp,
                          AMREX_D_DECL( Array4<Real const> const& umac,
                                        Array4<Real const> const& vmac,
                                        Array4<Real const> const& wmac),
                          const Box&       domain,
                          const Vector<BCRec>& bcs,
                          const        BCRec * d_bcrec_ptr,
                          AMREX_D_DECL( Array4<Real const> const& fcx,
                                        Array4<Real const> const& fcy,
                                        Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Array4<Real const> const& vfrac,
                          Array4<EBCellFlag const> const& flag,
                          const bool is_velocity)
{

    int order = 2;

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    AMREX_D_TERM(
        const int domain_ilo = domain.smallEnd(0);
        const int domain_ihi = domain.bigEnd(0);,
        const int domain_jlo = domain.smallEnd(1);
        const int domain_jhi = domain.bigEnd(1);,
        const int domain_klo = domain.smallEnd(2);
        const int domain_khi = domain.bigEnd(2););

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************

    auto extdir_lohi_x = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;

    auto extdir_lohi_y = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif


    if ((has_extdir_or_ho_lo_x && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {

        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,umac, xedge, domain, vfrac, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
               xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                       AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                       flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
               xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,vmac,yedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, vmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,wmac,zedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state_extdir( i, j, k, n, q, wmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }
    else // We assume below that the stencil does not need to use hoextrap or extdir boundaries
    {
        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, umac, xedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
                xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
                xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, vmac, yedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state( AMREX_D_DECL(i, j, k), n, q, vmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, wmac, zedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state( AMREX_D_DECL(i, j, k), n, q, wmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }

}